

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx2.cpp
# Opt level: O0

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Mat *hidden_state,Mat *cell_state,Option *opt)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined8 uVar60;
  undefined8 uVar61;
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined8 uVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [24];
  bool bVar145;
  Mat *in_RCX;
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  Mat *in_R8;
  Mat *in_R9;
  float fVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  Mat *in_stack_00000008;
  float H_1;
  float cell2_1;
  float G_1;
  float O_1;
  float F_1;
  float I_1;
  __m256 H;
  __m256 cell2;
  __m256 G;
  __m256 O;
  __m256 F;
  __m256 I;
  int remain_activations;
  int nn_activation;
  float *gates_data_G;
  float *gates_data_O;
  float *gates_data_F;
  float *gates_data_I;
  float *hidden_ptr;
  float *cell_ptr;
  float *output_data;
  float h_cont_3;
  float xi_3;
  float sums_1 [4];
  __m256 h_cont_2;
  int remain_num_output_1;
  int nn_num_output_1;
  __m256 xi_2;
  int remain_size_1;
  int nn_num_size_1;
  __m256 _sumG;
  __m256 _sumO;
  __m256 _sumF;
  __m256 _sumI;
  float *weight_hc_G;
  float *weight_hc_O;
  float *weight_hc_F;
  float *weight_hc_I;
  float *weight_xc_G;
  float *weight_xc_O;
  float *weight_xc_F;
  float *weight_xc_I;
  float *gates_data_G_2;
  float *gates_data_O_2;
  float *gates_data_F_2;
  float *gates_data_I_2;
  float *bias_c_G_1;
  float *bias_c_O_1;
  float *bias_c_F_1;
  float *bias_c_I_1;
  float *hidden_ptr_r_1;
  float *x_1;
  int q_1;
  float h_cont_1;
  float xi_1;
  float sums [8];
  __m256 h_cont;
  int remain_num_output;
  int nn_num_output;
  __m256 xi;
  int remain_size;
  int nn_num_size;
  __m256 _sumG_1;
  __m256 _sumO_1;
  __m256 _sumF_1;
  __m256 _sumI_1;
  __m256 _sumG_0;
  __m256 _sumO_0;
  __m256 _sumF_0;
  __m256 _sumI_0;
  float *weight_hc_G_1;
  float *weight_hc_O_1;
  float *weight_hc_F_1;
  float *weight_hc_I_1;
  float *weight_hc_G_0;
  float *weight_hc_O_0;
  float *weight_hc_F_0;
  float *weight_hc_I_0;
  float *weight_xc_G_1;
  float *weight_xc_O_1;
  float *weight_xc_F_1;
  float *weight_xc_I_1;
  float *weight_xc_G_0;
  float *weight_xc_O_0;
  float *weight_xc_F_0;
  float *weight_xc_I_0;
  float *gates_data_G_1;
  float *gates_data_O_1;
  float *gates_data_F_1;
  float *gates_data_I_1;
  float *bias_c_G;
  float *bias_c_O;
  float *bias_c_F;
  float *bias_c_I;
  float *hidden_ptr_r;
  float *x;
  int q;
  int remain_output;
  int ti;
  int t;
  Mat gates;
  int num_output;
  int T;
  int size;
  __m256 vb1;
  __m256 vb0;
  __m256 s4556;
  __m256 s0123;
  __m256 s67;
  __m256 s45;
  __m256 s23;
  __m256 s01;
  __m256 s0123_1;
  __m256 s23_1;
  __m256 s01_1;
  __m256 one_4;
  __m256 one_2;
  __m256 one;
  __m256 two_1;
  __m256 one_9;
  __m256 one_10;
  __m256 two;
  __m256 one_6;
  __m256 one_7;
  __m256 pow2n_3;
  __m256 y_3;
  __m256 z_3;
  __m256 mask_3;
  __m256 one_8;
  __m256i imm0_3;
  __m256 fx_3;
  __m256 tmp_3;
  __m256 pow2n_4;
  __m256 y_4;
  __m256 z_4;
  __m256 mask_4;
  __m256 one_11;
  __m256i imm0_4;
  __m256 fx_4;
  __m256 tmp_4;
  __m256 pow2n;
  __m256 y;
  __m256 z;
  __m256 mask;
  __m256 one_1;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  __m256 pow2n_1;
  __m256 y_1;
  __m256 z_1;
  __m256 mask_1;
  __m256 one_3;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  __m256 pow2n_2;
  __m256 y_2;
  __m256 z_2;
  __m256 mask_2;
  __m256 one_5;
  __m256i imm0_2;
  __m256 fx_2;
  __m256 tmp_2;
  imm_xmm_union u_12;
  imm_xmm_union u_11;
  imm_xmm_union u_10;
  __m256i ret_4;
  __m128i y2_2;
  __m128i y1_2;
  __m128i x2_4;
  __m128i x1_4;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_22;
  imm_xmm_union u_21;
  imm_xmm_union u_20;
  __m256i ret_8;
  __m128i y2_4;
  __m128i y1_4;
  __m128i x2_8;
  __m128i x1_8;
  imm_xmm_union u_17;
  imm_xmm_union u_16;
  imm_xmm_union u_15;
  __m256i ret_6;
  __m128i y2_3;
  __m128i y1_3;
  __m128i x2_6;
  __m128i x1_6;
  imm_xmm_union u_14;
  imm_xmm_union u_13;
  __m256i ret_5;
  __m128i x2_5;
  __m128i x1_5;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  imm_xmm_union u_24;
  imm_xmm_union u_23;
  __m256i ret_9;
  __m128i x2_9;
  __m128i x1_9;
  imm_xmm_union u_19;
  imm_xmm_union u_18;
  __m256i ret_7;
  __m128i x2_7;
  __m128i x1_7;
  Allocator *in_stack_ffffffffffff8da0;
  undefined4 in_stack_ffffffffffff8da8;
  undefined4 in_stack_ffffffffffff8dac;
  int in_stack_ffffffffffff8db0;
  int in_stack_ffffffffffff8db4;
  undefined4 in_stack_ffffffffffff8db8;
  undefined4 in_stack_ffffffffffff8dbc;
  undefined8 local_7220;
  undefined8 uStack_7218;
  undefined8 uStack_7210;
  undefined8 uStack_7208;
  undefined8 local_6fe0;
  undefined8 uStack_6fd8;
  undefined8 uStack_6fd0;
  undefined8 uStack_6fc8;
  undefined8 local_6d20;
  undefined8 uStack_6d18;
  undefined8 uStack_6d10;
  undefined8 uStack_6d08;
  undefined8 local_6c00;
  undefined8 uStack_6bf8;
  undefined8 uStack_6bf0;
  undefined8 uStack_6be8;
  int local_60ec;
  uint local_5ff8;
  int local_5ff4;
  float *local_5ff0;
  undefined1 (*local_5fe8) [32];
  undefined1 (*local_5fe0) [32];
  undefined1 (*local_5fd8) [32];
  float *local_5fd0;
  float *local_5fc8;
  undefined1 (*local_5fc0) [32];
  float local_5fb0;
  float fStack_5fac;
  float fStack_5fa8;
  float fStack_5fa4;
  undefined8 local_5fa0;
  undefined8 uStack_5f98;
  undefined8 uStack_5f90;
  undefined8 uStack_5f88;
  uint local_5f68;
  int local_5f64;
  undefined8 local_5f60;
  undefined8 uStack_5f58;
  undefined8 uStack_5f50;
  undefined8 uStack_5f48;
  uint local_5f28;
  int local_5f24;
  undefined8 local_5f20;
  undefined8 uStack_5f18;
  undefined8 uStack_5f10;
  undefined8 uStack_5f08;
  undefined8 local_5f00;
  undefined8 uStack_5ef8;
  undefined8 uStack_5ef0;
  undefined8 uStack_5ee8;
  undefined8 local_5ee0;
  undefined8 uStack_5ed8;
  undefined8 uStack_5ed0;
  undefined8 uStack_5ec8;
  undefined8 local_5ec0;
  undefined8 uStack_5eb8;
  undefined8 uStack_5eb0;
  undefined8 uStack_5ea8;
  float *local_5ea0;
  float *local_5e98;
  float *local_5e90;
  float *local_5e88;
  float *local_5e80;
  float *local_5e78;
  float *local_5e70;
  float *local_5e68;
  float *local_5e60;
  float *local_5e58;
  float *local_5e50;
  float *local_5e48;
  float *local_5e40;
  float *local_5e38;
  float *local_5e30;
  float *local_5e28;
  float *local_5e20;
  float *local_5e18;
  int local_5e0c;
  float local_5e08;
  float local_5e04;
  float local_5e00;
  float fStack_5dfc;
  float fStack_5df8;
  float fStack_5df4;
  float fStack_5df0;
  float fStack_5dec;
  float fStack_5de8;
  float fStack_5de4;
  undefined8 local_5de0;
  undefined8 uStack_5dd8;
  undefined8 uStack_5dd0;
  undefined8 uStack_5dc8;
  uint local_5da8;
  int local_5da4;
  undefined8 local_5da0;
  undefined8 uStack_5d98;
  undefined8 uStack_5d90;
  undefined8 uStack_5d88;
  uint local_5d68;
  int local_5d64;
  undefined8 local_5d60;
  undefined8 uStack_5d58;
  undefined8 uStack_5d50;
  undefined8 uStack_5d48;
  undefined8 local_5d40;
  undefined8 uStack_5d38;
  undefined8 uStack_5d30;
  undefined8 uStack_5d28;
  undefined8 local_5d20;
  undefined8 uStack_5d18;
  undefined8 uStack_5d10;
  undefined8 uStack_5d08;
  undefined8 local_5d00;
  undefined8 uStack_5cf8;
  undefined8 uStack_5cf0;
  undefined8 uStack_5ce8;
  undefined8 local_5ce0;
  undefined8 uStack_5cd8;
  undefined8 uStack_5cd0;
  undefined8 uStack_5cc8;
  undefined8 local_5cc0;
  undefined8 uStack_5cb8;
  undefined8 uStack_5cb0;
  undefined8 uStack_5ca8;
  undefined8 local_5ca0;
  undefined8 uStack_5c98;
  undefined8 uStack_5c90;
  undefined8 uStack_5c88;
  undefined8 local_5c80;
  undefined8 uStack_5c78;
  undefined8 uStack_5c70;
  undefined8 uStack_5c68;
  float *local_5c60;
  float *local_5c58;
  float *local_5c50;
  float *local_5c48;
  float *local_5c40;
  float *local_5c38;
  float *local_5c30;
  float *local_5c28;
  float *local_5c20;
  float *local_5c18;
  float *local_5c10;
  float *local_5c08;
  float *local_5c00;
  float *local_5bf8;
  float *local_5bf0;
  float *local_5be8;
  float *local_5be0;
  float *local_5bd8;
  float *local_5bd0;
  float *local_5bc8;
  float *local_5bc0;
  float *local_5bb8;
  float *local_5bb0;
  float *local_5ba8;
  float *local_5ba0;
  float *local_5b98;
  int local_5b90;
  int local_5b8c;
  int local_5b88;
  int local_5b84;
  undefined4 local_5b80;
  Mat local_5b70;
  uint local_5b24;
  int local_5b20;
  uint local_5b1c;
  Mat *local_5b18;
  Mat *local_5b10;
  Mat *local_5b08;
  int local_5afc;
  Mat *local_5af8;
  Mat *local_5af0;
  int local_5ae4;
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined8 local_5a80;
  undefined8 uStack_5a78;
  undefined8 uStack_5a70;
  undefined8 uStack_5a68;
  undefined1 local_5a60 [32];
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 uStack_5970;
  undefined8 uStack_5968;
  float *local_5948;
  float *local_5940;
  undefined1 (*local_5938) [32];
  undefined1 (*local_5930) [32];
  undefined1 (*local_5928) [32];
  float *local_5920;
  float *local_5918;
  float *local_5910;
  float *local_5908;
  float *local_5900;
  float *local_58f8;
  float *local_58f0;
  float *local_58e8;
  float *local_58e0;
  float *local_58d8;
  float *local_58d0;
  float *local_58c8;
  float *local_58c0;
  float *local_58b8;
  float *local_58b0;
  float *local_58a8;
  float *local_58a0;
  float *local_5898;
  float *local_5890;
  float *local_5888;
  float *local_5880;
  float *local_5878;
  float *local_5870;
  float *local_5868;
  float *local_5860;
  float *local_5858;
  float *local_5850;
  float *local_5848;
  undefined8 local_5840;
  undefined8 uStack_5838;
  undefined8 uStack_5830;
  undefined8 uStack_5828;
  undefined8 local_5820;
  undefined8 uStack_5818;
  undefined8 uStack_5810;
  undefined8 uStack_5808;
  undefined8 local_5800;
  undefined8 uStack_57f8;
  undefined8 uStack_57f0;
  undefined8 uStack_57e8;
  undefined8 local_57e0;
  undefined8 uStack_57d8;
  undefined8 uStack_57d0;
  undefined8 uStack_57c8;
  undefined8 local_57c0;
  undefined8 uStack_57b8;
  undefined8 uStack_57b0;
  undefined8 uStack_57a8;
  undefined8 local_57a0;
  undefined8 uStack_5798;
  undefined8 uStack_5790;
  undefined8 uStack_5788;
  undefined8 local_5780;
  undefined8 uStack_5778;
  undefined8 uStack_5770;
  undefined8 uStack_5768;
  undefined8 local_5760;
  undefined8 uStack_5758;
  undefined8 uStack_5750;
  undefined8 uStack_5748;
  undefined8 local_5740;
  undefined8 uStack_5738;
  undefined8 uStack_5730;
  undefined8 uStack_5728;
  undefined8 local_5720;
  undefined8 uStack_5718;
  undefined8 uStack_5710;
  undefined8 uStack_5708;
  undefined8 local_5700;
  undefined8 uStack_56f8;
  undefined8 uStack_56f0;
  undefined8 uStack_56e8;
  undefined8 local_56e0;
  undefined8 uStack_56d8;
  undefined8 uStack_56d0;
  undefined8 uStack_56c8;
  undefined8 local_56c0;
  undefined8 uStack_56b8;
  undefined8 uStack_56b0;
  undefined8 uStack_56a8;
  undefined8 local_56a0;
  undefined8 uStack_5698;
  undefined8 uStack_5690;
  undefined8 uStack_5688;
  undefined8 local_5680;
  undefined8 uStack_5678;
  undefined8 uStack_5670;
  undefined8 uStack_5668;
  undefined8 local_5660;
  undefined8 uStack_5658;
  undefined8 uStack_5650;
  undefined8 uStack_5648;
  undefined8 local_5640;
  undefined8 uStack_5638;
  undefined8 uStack_5630;
  undefined8 uStack_5628;
  undefined8 local_5620;
  undefined8 uStack_5618;
  undefined8 uStack_5610;
  undefined8 uStack_5608;
  undefined8 local_5600;
  undefined8 uStack_55f8;
  undefined8 uStack_55f0;
  undefined8 uStack_55e8;
  undefined8 local_55e0;
  undefined8 uStack_55d8;
  undefined8 uStack_55d0;
  undefined8 uStack_55c8;
  undefined8 local_55c0;
  undefined8 uStack_55b8;
  undefined8 uStack_55b0;
  undefined8 uStack_55a8;
  undefined8 local_55a0;
  undefined8 uStack_5598;
  undefined8 uStack_5590;
  undefined8 uStack_5588;
  undefined8 local_5580;
  undefined8 uStack_5578;
  undefined8 uStack_5570;
  undefined8 uStack_5568;
  undefined8 local_5560;
  undefined8 uStack_5558;
  undefined8 uStack_5550;
  undefined8 uStack_5548;
  undefined8 local_5540;
  undefined8 uStack_5538;
  undefined8 uStack_5530;
  undefined8 uStack_5528;
  undefined8 local_5520;
  undefined8 uStack_5518;
  undefined8 uStack_5510;
  undefined8 uStack_5508;
  undefined8 local_5500;
  undefined8 uStack_54f8;
  undefined8 uStack_54f0;
  undefined8 uStack_54e8;
  undefined8 local_54e0;
  undefined8 uStack_54d8;
  undefined8 uStack_54d0;
  undefined8 uStack_54c8;
  undefined8 local_54c0;
  undefined8 uStack_54b8;
  undefined8 uStack_54b0;
  undefined8 uStack_54a8;
  undefined8 local_54a0;
  undefined8 uStack_5498;
  undefined8 uStack_5490;
  undefined8 uStack_5488;
  undefined8 local_5480;
  undefined8 uStack_5478;
  undefined8 uStack_5470;
  undefined8 uStack_5468;
  undefined8 local_5460;
  undefined8 uStack_5458;
  undefined8 uStack_5450;
  undefined8 uStack_5448;
  undefined8 local_5440;
  undefined8 uStack_5438;
  undefined8 uStack_5430;
  undefined8 uStack_5428;
  undefined8 local_5420;
  undefined8 uStack_5418;
  undefined8 uStack_5410;
  undefined8 uStack_5408;
  undefined8 local_5400;
  undefined8 uStack_53f8;
  undefined8 uStack_53f0;
  undefined8 uStack_53e8;
  undefined8 local_53e0;
  undefined8 uStack_53d8;
  undefined8 uStack_53d0;
  undefined8 uStack_53c8;
  undefined8 local_53c0;
  undefined8 uStack_53b8;
  undefined8 uStack_53b0;
  undefined8 uStack_53a8;
  undefined8 local_53a0;
  undefined8 uStack_5398;
  undefined8 uStack_5390;
  undefined8 uStack_5388;
  undefined8 local_5380;
  undefined8 uStack_5378;
  undefined8 uStack_5370;
  undefined8 uStack_5368;
  undefined8 local_5360;
  undefined8 uStack_5358;
  undefined8 uStack_5350;
  undefined8 uStack_5348;
  undefined8 local_5340;
  undefined8 uStack_5338;
  undefined8 uStack_5330;
  undefined8 uStack_5328;
  undefined8 local_5320;
  undefined8 uStack_5318;
  undefined8 uStack_5310;
  undefined8 uStack_5308;
  undefined8 local_5300;
  undefined8 uStack_52f8;
  undefined8 uStack_52f0;
  undefined8 uStack_52e8;
  undefined8 local_52e0;
  undefined8 uStack_52d8;
  undefined8 uStack_52d0;
  undefined8 uStack_52c8;
  undefined8 local_52c0;
  undefined8 uStack_52b8;
  undefined8 uStack_52b0;
  undefined8 uStack_52a8;
  undefined8 local_52a0;
  undefined8 uStack_5298;
  undefined8 uStack_5290;
  undefined8 uStack_5288;
  undefined8 local_5280;
  undefined8 uStack_5278;
  undefined8 uStack_5270;
  undefined8 uStack_5268;
  undefined8 local_5260;
  undefined8 uStack_5258;
  undefined8 uStack_5250;
  undefined8 uStack_5248;
  undefined8 local_5240;
  undefined8 uStack_5238;
  undefined8 uStack_5230;
  undefined8 uStack_5228;
  undefined8 local_5220;
  undefined8 uStack_5218;
  undefined8 uStack_5210;
  undefined8 uStack_5208;
  undefined8 local_5200;
  undefined8 uStack_51f8;
  undefined8 uStack_51f0;
  undefined8 uStack_51e8;
  undefined8 local_51e0;
  undefined8 uStack_51d8;
  undefined8 uStack_51d0;
  undefined8 uStack_51c8;
  undefined8 local_51c0;
  undefined8 uStack_51b8;
  undefined8 uStack_51b0;
  undefined8 uStack_51a8;
  undefined8 local_51a0;
  undefined8 uStack_5198;
  undefined8 uStack_5190;
  undefined8 uStack_5188;
  undefined8 local_5180;
  undefined8 uStack_5178;
  undefined8 uStack_5170;
  undefined8 uStack_5168;
  undefined8 local_5160;
  undefined8 uStack_5158;
  undefined8 uStack_5150;
  undefined8 uStack_5148;
  undefined8 local_5140;
  undefined8 uStack_5138;
  undefined8 uStack_5130;
  undefined8 uStack_5128;
  undefined8 local_5120;
  undefined8 uStack_5118;
  undefined8 uStack_5110;
  undefined8 uStack_5108;
  undefined8 local_5100;
  undefined8 uStack_50f8;
  undefined8 uStack_50f0;
  undefined8 uStack_50e8;
  undefined8 local_50e0;
  undefined8 uStack_50d8;
  undefined8 uStack_50d0;
  undefined8 uStack_50c8;
  undefined8 local_50c0;
  undefined8 uStack_50b8;
  undefined8 uStack_50b0;
  undefined8 uStack_50a8;
  undefined8 local_50a0;
  undefined8 uStack_5098;
  undefined8 uStack_5090;
  undefined8 uStack_5088;
  undefined8 local_5080;
  undefined8 uStack_5078;
  undefined8 uStack_5070;
  undefined8 uStack_5068;
  undefined8 local_5060;
  undefined8 uStack_5058;
  undefined8 uStack_5050;
  undefined8 uStack_5048;
  undefined8 local_5040;
  undefined8 uStack_5038;
  undefined8 uStack_5030;
  undefined8 uStack_5028;
  undefined8 local_5020;
  undefined8 uStack_5018;
  undefined8 uStack_5010;
  undefined8 uStack_5008;
  undefined8 local_5000;
  undefined8 uStack_4ff8;
  undefined8 uStack_4ff0;
  undefined8 uStack_4fe8;
  undefined8 local_4fe0;
  undefined8 uStack_4fd8;
  undefined8 uStack_4fd0;
  undefined8 uStack_4fc8;
  undefined8 local_4fc0;
  undefined8 uStack_4fb8;
  undefined8 uStack_4fb0;
  undefined8 uStack_4fa8;
  undefined8 local_4fa0;
  undefined8 uStack_4f98;
  undefined8 uStack_4f90;
  undefined8 uStack_4f88;
  undefined8 local_4f80;
  undefined8 uStack_4f78;
  undefined8 uStack_4f70;
  undefined8 uStack_4f68;
  undefined8 local_4f60;
  undefined8 uStack_4f58;
  undefined8 uStack_4f50;
  undefined8 uStack_4f48;
  undefined8 local_4f40;
  undefined8 uStack_4f38;
  undefined8 uStack_4f30;
  undefined8 uStack_4f28;
  undefined1 (*local_4f08) [32];
  undefined8 local_4f00;
  undefined8 uStack_4ef8;
  undefined8 uStack_4ef0;
  undefined8 uStack_4ee8;
  float *local_4ec8;
  undefined8 local_4ec0;
  undefined8 uStack_4eb8;
  undefined8 uStack_4eb0;
  undefined8 uStack_4ea8;
  float *local_4e88;
  undefined8 local_4e80;
  undefined8 uStack_4e78;
  undefined8 uStack_4e70;
  undefined8 uStack_4e68;
  float *local_4e48;
  undefined1 local_4e40 [32];
  undefined1 local_4e20 [32];
  undefined1 local_4e00 [32];
  undefined1 local_4de0 [32];
  undefined1 local_4dc0 [32];
  undefined1 local_4da0 [32];
  undefined1 local_4d80 [32];
  undefined1 local_4d60 [32];
  undefined8 *local_4d40;
  undefined8 *local_4d38;
  undefined8 *local_4d30;
  undefined8 *local_4d28;
  undefined8 *local_4d20;
  undefined8 *local_4d18;
  undefined8 *local_4d10;
  undefined8 *local_4d08;
  undefined8 local_4d00;
  undefined8 uStack_4cf8;
  float *local_4ce8;
  undefined1 local_4ce0 [24];
  undefined8 uStack_4cc8;
  undefined1 local_4cc0 [32];
  undefined1 local_4ca0 [32];
  undefined8 *local_4c80;
  undefined8 *local_4c78;
  undefined8 *local_4c70;
  undefined8 *local_4c68;
  undefined8 local_4c60;
  undefined8 uStack_4c58;
  undefined8 uStack_4c50;
  undefined8 uStack_4c48;
  undefined8 local_4c40;
  undefined8 uStack_4c38;
  undefined8 uStack_4c30;
  undefined8 uStack_4c28;
  undefined1 local_4c20 [32];
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined8 uStack_4bf0;
  undefined8 uStack_4be8;
  undefined8 local_4be0;
  undefined8 uStack_4bd8;
  undefined8 uStack_4bd0;
  undefined8 uStack_4bc8;
  undefined1 local_4bc0 [32];
  undefined8 local_4ba0;
  undefined8 uStack_4b98;
  undefined8 uStack_4b90;
  undefined8 uStack_4b88;
  undefined8 local_4b80;
  undefined8 uStack_4b78;
  undefined8 uStack_4b70;
  undefined8 uStack_4b68;
  undefined1 local_4b60 [32];
  undefined8 local_4b40;
  undefined8 uStack_4b38;
  undefined8 uStack_4b30;
  undefined8 uStack_4b28;
  undefined8 local_4b20;
  undefined8 uStack_4b18;
  undefined8 uStack_4b10;
  undefined8 uStack_4b08;
  undefined8 local_4b00;
  undefined8 uStack_4af8;
  undefined8 uStack_4af0;
  undefined8 uStack_4ae8;
  undefined8 local_4ae0;
  undefined8 uStack_4ad8;
  undefined8 uStack_4ad0;
  undefined8 uStack_4ac8;
  float local_4ac0;
  float fStack_4abc;
  float fStack_4ab8;
  float fStack_4ab4;
  float fStack_4ab0;
  float fStack_4aac;
  float fStack_4aa8;
  float fStack_4aa4;
  undefined1 local_4aa0 [32];
  undefined8 local_4a80;
  undefined8 uStack_4a78;
  undefined8 uStack_4a70;
  undefined8 uStack_4a68;
  undefined8 local_4a60;
  undefined8 uStack_4a58;
  undefined8 uStack_4a50;
  undefined8 uStack_4a48;
  undefined8 local_4a40;
  undefined8 uStack_4a38;
  undefined8 uStack_4a30;
  undefined8 uStack_4a28;
  undefined8 local_4a20;
  undefined8 uStack_4a18;
  undefined8 uStack_4a10;
  undefined8 uStack_4a08;
  float local_4a00;
  float fStack_49fc;
  float fStack_49f8;
  float fStack_49f4;
  float fStack_49f0;
  float fStack_49ec;
  float fStack_49e8;
  undefined4 uStack_49e4;
  undefined1 local_49e0 [32];
  undefined8 local_49c0;
  undefined8 uStack_49b8;
  undefined8 uStack_49b0;
  undefined8 uStack_49a8;
  undefined8 local_49a0;
  undefined8 uStack_4998;
  undefined8 uStack_4990;
  undefined8 uStack_4988;
  undefined8 local_4980;
  undefined8 uStack_4978;
  undefined8 uStack_4970;
  undefined8 uStack_4968;
  undefined8 local_4960;
  undefined8 uStack_4958;
  undefined8 uStack_4950;
  undefined8 uStack_4948;
  undefined8 local_4940;
  undefined8 uStack_4938;
  undefined8 uStack_4930;
  undefined8 uStack_4928;
  undefined8 local_4920;
  undefined8 uStack_4918;
  undefined8 uStack_4910;
  undefined8 uStack_4908;
  undefined8 local_4900;
  undefined8 uStack_48f8;
  undefined8 uStack_48f0;
  undefined8 uStack_48e8;
  undefined8 local_48e0;
  undefined8 uStack_48d8;
  undefined8 uStack_48d0;
  undefined8 uStack_48c8;
  undefined8 local_48c0;
  undefined8 uStack_48b8;
  undefined8 uStack_48b0;
  undefined8 uStack_48a8;
  undefined8 local_48a0;
  undefined8 uStack_4898;
  undefined8 uStack_4890;
  undefined8 uStack_4888;
  undefined8 local_4880;
  undefined8 uStack_4878;
  undefined8 uStack_4870;
  undefined8 uStack_4868;
  undefined1 local_4860 [8];
  float fStack_4858;
  float fStack_4854;
  float fStack_4850;
  float fStack_484c;
  float fStack_4848;
  float fStack_4844;
  undefined8 local_4840;
  undefined8 uStack_4838;
  undefined8 uStack_4830;
  undefined8 uStack_4828;
  float local_4820;
  float fStack_481c;
  float fStack_4818;
  float fStack_4814;
  float fStack_4810;
  float fStack_480c;
  float fStack_4808;
  float fStack_4804;
  undefined8 local_4800;
  undefined8 uStack_47f8;
  undefined8 uStack_47f0;
  undefined8 uStack_47e8;
  float local_47e0;
  float fStack_47dc;
  float fStack_47d8;
  float fStack_47d4;
  float fStack_47d0;
  float fStack_47cc;
  float fStack_47c8;
  float fStack_47c4;
  undefined8 local_47c0;
  undefined8 uStack_47b8;
  undefined8 uStack_47b0;
  undefined8 uStack_47a8;
  float local_47a0;
  float fStack_479c;
  float fStack_4798;
  float fStack_4794;
  float fStack_4790;
  float fStack_478c;
  float fStack_4788;
  float fStack_4784;
  undefined8 local_4780;
  undefined8 uStack_4778;
  undefined8 uStack_4770;
  undefined8 uStack_4768;
  float local_4760;
  float fStack_475c;
  float fStack_4758;
  float fStack_4754;
  float fStack_4750;
  float fStack_474c;
  float fStack_4748;
  float fStack_4744;
  undefined8 local_4740;
  undefined8 uStack_4738;
  undefined8 uStack_4730;
  undefined8 uStack_4728;
  float local_4720;
  float fStack_471c;
  float fStack_4718;
  float fStack_4714;
  float fStack_4710;
  float fStack_470c;
  float fStack_4708;
  float fStack_4704;
  undefined8 local_4700;
  undefined8 uStack_46f8;
  undefined8 uStack_46f0;
  undefined8 uStack_46e8;
  float local_46e0;
  float fStack_46dc;
  float fStack_46d8;
  float fStack_46d4;
  float fStack_46d0;
  float fStack_46cc;
  float fStack_46c8;
  float fStack_46c4;
  undefined8 local_46c0;
  undefined8 uStack_46b8;
  undefined8 uStack_46b0;
  undefined8 uStack_46a8;
  float local_46a0;
  float fStack_469c;
  float fStack_4698;
  float fStack_4694;
  float fStack_4690;
  float fStack_468c;
  float fStack_4688;
  float fStack_4684;
  undefined8 local_4680;
  undefined8 uStack_4678;
  undefined8 uStack_4670;
  undefined8 uStack_4668;
  float local_4660;
  float fStack_465c;
  float fStack_4658;
  float fStack_4654;
  float fStack_4650;
  float fStack_464c;
  float fStack_4648;
  float fStack_4644;
  undefined8 local_4640;
  undefined8 uStack_4638;
  undefined8 uStack_4630;
  undefined8 uStack_4628;
  float local_4620;
  float fStack_461c;
  float fStack_4618;
  float fStack_4614;
  float fStack_4610;
  float fStack_460c;
  float fStack_4608;
  float fStack_4604;
  undefined8 local_4600;
  undefined8 uStack_45f8;
  undefined8 uStack_45f0;
  undefined8 uStack_45e8;
  float local_45e0;
  float fStack_45dc;
  float fStack_45d8;
  float fStack_45d4;
  float fStack_45d0;
  float fStack_45cc;
  float fStack_45c8;
  float fStack_45c4;
  undefined8 local_45c0;
  undefined8 uStack_45b8;
  undefined8 uStack_45b0;
  undefined8 uStack_45a8;
  float local_45a0;
  float fStack_459c;
  float fStack_4598;
  float fStack_4594;
  float fStack_4590;
  float fStack_458c;
  float fStack_4588;
  float fStack_4584;
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 uStack_4570;
  undefined8 uStack_4568;
  float local_4560;
  float fStack_455c;
  float fStack_4558;
  float fStack_4554;
  float fStack_4550;
  float fStack_454c;
  float fStack_4548;
  float fStack_4544;
  undefined8 local_4540;
  undefined8 uStack_4538;
  undefined8 uStack_4530;
  undefined8 uStack_4528;
  float local_4520;
  float fStack_451c;
  float fStack_4518;
  float fStack_4514;
  float fStack_4510;
  float fStack_450c;
  float fStack_4508;
  float fStack_4504;
  undefined8 local_4500;
  undefined8 uStack_44f8;
  undefined8 uStack_44f0;
  undefined8 uStack_44e8;
  float local_44e0;
  float fStack_44dc;
  float fStack_44d8;
  float fStack_44d4;
  float fStack_44d0;
  float fStack_44cc;
  float fStack_44c8;
  float fStack_44c4;
  undefined8 local_44c0;
  undefined8 uStack_44b8;
  undefined8 uStack_44b0;
  undefined8 uStack_44a8;
  float local_44a0;
  float fStack_449c;
  float fStack_4498;
  float fStack_4494;
  float fStack_4490;
  float fStack_448c;
  float fStack_4488;
  float fStack_4484;
  undefined8 local_4480;
  undefined8 uStack_4478;
  undefined8 uStack_4470;
  undefined8 uStack_4468;
  float local_4460;
  float fStack_445c;
  float fStack_4458;
  float fStack_4454;
  float fStack_4450;
  float fStack_444c;
  float fStack_4448;
  float fStack_4444;
  undefined8 local_4440;
  undefined8 uStack_4438;
  undefined8 uStack_4430;
  undefined8 uStack_4428;
  float local_4420;
  float fStack_441c;
  float fStack_4418;
  float fStack_4414;
  float fStack_4410;
  float fStack_440c;
  float fStack_4408;
  float fStack_4404;
  undefined8 local_4400;
  undefined8 uStack_43f8;
  undefined8 uStack_43f0;
  undefined8 uStack_43e8;
  float local_43e0;
  float fStack_43dc;
  float fStack_43d8;
  float fStack_43d4;
  float fStack_43d0;
  float fStack_43cc;
  float fStack_43c8;
  float fStack_43c4;
  undefined8 local_43c0;
  undefined8 uStack_43b8;
  undefined8 uStack_43b0;
  undefined8 uStack_43a8;
  float local_43a0;
  float fStack_439c;
  float fStack_4398;
  float fStack_4394;
  float fStack_4390;
  float fStack_438c;
  float fStack_4388;
  float fStack_4384;
  undefined8 local_4380;
  undefined8 uStack_4378;
  undefined8 uStack_4370;
  undefined8 uStack_4368;
  float local_4360;
  float fStack_435c;
  float fStack_4358;
  float fStack_4354;
  float fStack_4350;
  float fStack_434c;
  float fStack_4348;
  float fStack_4344;
  undefined8 local_4340;
  undefined8 uStack_4338;
  undefined8 uStack_4330;
  undefined8 uStack_4328;
  float local_4320;
  float fStack_431c;
  float fStack_4318;
  float fStack_4314;
  float fStack_4310;
  float fStack_430c;
  float fStack_4308;
  float fStack_4304;
  undefined8 local_4300;
  undefined8 uStack_42f8;
  undefined8 uStack_42f0;
  undefined8 uStack_42e8;
  float local_42e0;
  float fStack_42dc;
  float fStack_42d8;
  float fStack_42d4;
  float fStack_42d0;
  float fStack_42cc;
  float fStack_42c8;
  float fStack_42c4;
  undefined8 local_42c0;
  undefined8 uStack_42b8;
  undefined8 uStack_42b0;
  undefined8 uStack_42a8;
  float local_42a0;
  float fStack_429c;
  float fStack_4298;
  float fStack_4294;
  float fStack_4290;
  float fStack_428c;
  float fStack_4288;
  float fStack_4284;
  undefined8 local_4280;
  undefined8 uStack_4278;
  undefined8 uStack_4270;
  undefined8 uStack_4268;
  float local_4260;
  float fStack_425c;
  float fStack_4258;
  float fStack_4254;
  float fStack_4250;
  float fStack_424c;
  float fStack_4248;
  float fStack_4244;
  undefined8 local_4240;
  undefined8 uStack_4238;
  undefined8 uStack_4230;
  undefined8 uStack_4228;
  undefined8 local_4220;
  undefined8 uStack_4218;
  undefined8 uStack_4210;
  undefined8 uStack_4208;
  undefined8 local_4200;
  undefined8 uStack_41f8;
  undefined8 uStack_41f0;
  undefined8 uStack_41e8;
  undefined1 local_41e0 [8];
  float fStack_41d8;
  float fStack_41d4;
  float fStack_41d0;
  float fStack_41cc;
  float fStack_41c8;
  undefined8 local_41c0;
  undefined8 uStack_41b8;
  undefined8 uStack_41b0;
  undefined8 uStack_41a8;
  undefined8 local_41a0;
  undefined8 uStack_4198;
  undefined8 uStack_4190;
  undefined8 uStack_4188;
  undefined8 local_4180;
  undefined8 uStack_4178;
  undefined8 uStack_4170;
  undefined8 uStack_4168;
  undefined1 local_4160 [8];
  float fStack_4158;
  float fStack_4154;
  float fStack_4150;
  float fStack_414c;
  float fStack_4148;
  undefined8 local_4140;
  undefined8 uStack_4138;
  undefined8 uStack_4130;
  undefined8 uStack_4128;
  undefined8 local_4120;
  undefined8 uStack_4118;
  undefined8 uStack_4110;
  undefined8 uStack_4108;
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 uStack_40f0;
  undefined8 uStack_40e8;
  float local_40e0;
  float fStack_40dc;
  float fStack_40d8;
  float fStack_40d4;
  float fStack_40d0;
  float fStack_40cc;
  float fStack_40c8;
  float fStack_40c4;
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  float local_40a0;
  float fStack_409c;
  float fStack_4098;
  float fStack_4094;
  float fStack_4090;
  float fStack_408c;
  float fStack_4088;
  float fStack_4084;
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  float local_4060;
  float fStack_405c;
  float fStack_4058;
  float fStack_4054;
  float fStack_4050;
  float fStack_404c;
  float fStack_4048;
  float fStack_4044;
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  float local_4020;
  float fStack_401c;
  float fStack_4018;
  float fStack_4014;
  float fStack_4010;
  float fStack_400c;
  float fStack_4008;
  float fStack_4004;
  undefined8 local_4000;
  undefined8 uStack_3ff8;
  undefined8 uStack_3ff0;
  undefined8 uStack_3fe8;
  float local_3fe0;
  float fStack_3fdc;
  float fStack_3fd8;
  float fStack_3fd4;
  float fStack_3fd0;
  float fStack_3fcc;
  float fStack_3fc8;
  float fStack_3fc4;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  float local_3fa0;
  float fStack_3f9c;
  float fStack_3f98;
  float fStack_3f94;
  float fStack_3f90;
  float fStack_3f8c;
  float fStack_3f88;
  float fStack_3f84;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  float local_3f60;
  float fStack_3f5c;
  float fStack_3f58;
  float fStack_3f54;
  float fStack_3f50;
  float fStack_3f4c;
  float fStack_3f48;
  float fStack_3f44;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  float local_3f20;
  float fStack_3f1c;
  float fStack_3f18;
  float fStack_3f14;
  float fStack_3f10;
  float fStack_3f0c;
  float fStack_3f08;
  float fStack_3f04;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  float local_3ee0;
  float fStack_3edc;
  float fStack_3ed8;
  float fStack_3ed4;
  float fStack_3ed0;
  float fStack_3ecc;
  float fStack_3ec8;
  float fStack_3ec4;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  float local_3ea0;
  float fStack_3e9c;
  float fStack_3e98;
  float fStack_3e94;
  float fStack_3e90;
  float fStack_3e8c;
  float fStack_3e88;
  float fStack_3e84;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  float local_3e60;
  float fStack_3e5c;
  float fStack_3e58;
  float fStack_3e54;
  float fStack_3e50;
  float fStack_3e4c;
  float fStack_3e48;
  float fStack_3e44;
  undefined8 local_3e40;
  undefined8 uStack_3e38;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  float local_3e20;
  float fStack_3e1c;
  float fStack_3e18;
  float fStack_3e14;
  float fStack_3e10;
  float fStack_3e0c;
  float fStack_3e08;
  float fStack_3e04;
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  float local_3de0;
  float fStack_3ddc;
  float fStack_3dd8;
  float fStack_3dd4;
  float fStack_3dd0;
  float fStack_3dcc;
  float fStack_3dc8;
  float fStack_3dc4;
  undefined8 local_3dc0;
  undefined8 uStack_3db8;
  undefined8 uStack_3db0;
  undefined8 uStack_3da8;
  float local_3da0;
  float fStack_3d9c;
  float fStack_3d98;
  float fStack_3d94;
  float fStack_3d90;
  float fStack_3d8c;
  float fStack_3d88;
  float fStack_3d84;
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  float local_3d60;
  float fStack_3d5c;
  float fStack_3d58;
  float fStack_3d54;
  float fStack_3d50;
  float fStack_3d4c;
  float fStack_3d48;
  float fStack_3d44;
  undefined8 local_3d40;
  undefined8 uStack_3d38;
  undefined8 uStack_3d30;
  undefined8 uStack_3d28;
  float local_3d20;
  float fStack_3d1c;
  float fStack_3d18;
  float fStack_3d14;
  float fStack_3d10;
  float fStack_3d0c;
  float fStack_3d08;
  float fStack_3d04;
  undefined8 local_3d00;
  undefined8 uStack_3cf8;
  undefined8 uStack_3cf0;
  undefined8 uStack_3ce8;
  float local_3ce0;
  float fStack_3cdc;
  float fStack_3cd8;
  float fStack_3cd4;
  float fStack_3cd0;
  float fStack_3ccc;
  float fStack_3cc8;
  float fStack_3cc4;
  undefined8 local_3cc0;
  undefined8 uStack_3cb8;
  undefined8 uStack_3cb0;
  undefined8 uStack_3ca8;
  float local_3ca0;
  float fStack_3c9c;
  float fStack_3c98;
  float fStack_3c94;
  float fStack_3c90;
  float fStack_3c8c;
  float fStack_3c88;
  float fStack_3c84;
  undefined8 local_3c80;
  undefined8 uStack_3c78;
  undefined8 uStack_3c70;
  undefined8 uStack_3c68;
  float local_3c60;
  float fStack_3c5c;
  float fStack_3c58;
  float fStack_3c54;
  float fStack_3c50;
  float fStack_3c4c;
  float fStack_3c48;
  float fStack_3c44;
  undefined8 local_3c40;
  undefined8 uStack_3c38;
  undefined8 uStack_3c30;
  undefined8 uStack_3c28;
  float local_3c20;
  float fStack_3c1c;
  float fStack_3c18;
  float fStack_3c14;
  float fStack_3c10;
  float fStack_3c0c;
  float fStack_3c08;
  float fStack_3c04;
  undefined8 local_3c00;
  undefined8 uStack_3bf8;
  undefined8 uStack_3bf0;
  undefined8 uStack_3be8;
  float local_3be0;
  float fStack_3bdc;
  float fStack_3bd8;
  float fStack_3bd4;
  float fStack_3bd0;
  float fStack_3bcc;
  float fStack_3bc8;
  float fStack_3bc4;
  undefined8 local_3bc0;
  undefined8 uStack_3bb8;
  undefined8 uStack_3bb0;
  undefined8 uStack_3ba8;
  float local_3ba0;
  float fStack_3b9c;
  float fStack_3b98;
  float fStack_3b94;
  float fStack_3b90;
  float fStack_3b8c;
  float fStack_3b88;
  float fStack_3b84;
  undefined8 local_3b80;
  undefined8 uStack_3b78;
  undefined8 uStack_3b70;
  undefined8 uStack_3b68;
  float local_3b60;
  float fStack_3b5c;
  float fStack_3b58;
  float fStack_3b54;
  float fStack_3b50;
  float fStack_3b4c;
  float fStack_3b48;
  float fStack_3b44;
  undefined8 local_3b40;
  undefined8 uStack_3b38;
  undefined8 uStack_3b30;
  undefined8 uStack_3b28;
  float local_3b20;
  float fStack_3b1c;
  float fStack_3b18;
  float fStack_3b14;
  float fStack_3b10;
  float fStack_3b0c;
  float fStack_3b08;
  float fStack_3b04;
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  undefined1 local_3ae0 [8];
  float fStack_3ad8;
  float fStack_3ad4;
  float fStack_3ad0;
  float fStack_3acc;
  float fStack_3ac8;
  undefined4 uStack_3ac4;
  undefined8 local_3ac0;
  undefined8 uStack_3ab8;
  undefined8 uStack_3ab0;
  undefined8 uStack_3aa8;
  undefined8 local_3aa0;
  undefined8 uStack_3a98;
  undefined8 uStack_3a90;
  undefined8 uStack_3a88;
  undefined8 local_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  undefined8 local_3a60;
  undefined8 uStack_3a58;
  undefined8 uStack_3a50;
  undefined8 uStack_3a48;
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  undefined8 local_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  undefined8 local_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  undefined8 local_39a0;
  undefined8 uStack_3998;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  undefined8 local_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  undefined8 local_3940;
  undefined8 uStack_3938;
  undefined8 uStack_3930;
  undefined8 uStack_3928;
  undefined8 local_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  undefined8 local_3900;
  undefined8 uStack_38f8;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  undefined8 local_38e0;
  undefined8 uStack_38d8;
  undefined8 uStack_38d0;
  undefined8 uStack_38c8;
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  undefined8 local_38a0;
  undefined8 uStack_3898;
  undefined8 uStack_3890;
  undefined8 uStack_3888;
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 uStack_3870;
  undefined8 uStack_3868;
  undefined8 local_3860;
  undefined8 uStack_3858;
  undefined8 uStack_3850;
  undefined8 uStack_3848;
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  undefined8 local_3820;
  undefined8 uStack_3818;
  undefined8 uStack_3810;
  undefined8 uStack_3808;
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined1 local_37f0 [8];
  float fStack_37e8;
  float fStack_37e4;
  undefined8 local_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37d0;
  undefined8 uStack_37c8;
  undefined4 local_37a4;
  undefined4 local_37a0;
  undefined4 local_379c;
  undefined4 local_3798;
  undefined4 local_3794;
  undefined4 local_3790;
  undefined4 local_378c;
  undefined4 local_3788;
  undefined4 local_3784;
  float local_3780;
  float fStack_377c;
  float fStack_3778;
  float fStack_3774;
  float fStack_3770;
  float fStack_376c;
  float fStack_3768;
  float fStack_3764;
  undefined8 local_3760;
  undefined8 uStack_3758;
  undefined8 uStack_3750;
  undefined8 uStack_3748;
  float local_3740;
  float fStack_373c;
  float fStack_3738;
  float fStack_3734;
  float fStack_3730;
  float fStack_372c;
  float fStack_3728;
  float fStack_3724;
  undefined8 local_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  float local_3700;
  float fStack_36fc;
  float fStack_36f8;
  float fStack_36f4;
  float fStack_36f0;
  float fStack_36ec;
  float fStack_36e8;
  float fStack_36e4;
  undefined8 local_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  float local_36c0;
  float fStack_36bc;
  float fStack_36b8;
  float fStack_36b4;
  float fStack_36b0;
  float fStack_36ac;
  float fStack_36a8;
  float fStack_36a4;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  float local_3680;
  float fStack_367c;
  float fStack_3678;
  float fStack_3674;
  float fStack_3670;
  float fStack_366c;
  float fStack_3668;
  float fStack_3664;
  undefined8 local_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 local_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  float local_3600;
  float fStack_35fc;
  float fStack_35f8;
  float fStack_35f4;
  float fStack_35f0;
  float fStack_35ec;
  float fStack_35e8;
  float fStack_35e4;
  undefined1 local_35e0 [32];
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined1 local_3580 [8];
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined1 local_3560 [8];
  undefined8 uStack_3558;
  undefined8 uStack_3550;
  undefined8 uStack_3548;
  undefined1 local_3540 [32];
  undefined1 local_3520 [32];
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined8 local_34e0;
  undefined8 uStack_34d8;
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 local_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined8 local_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined8 local_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  undefined8 local_3380;
  undefined8 uStack_3378;
  undefined8 uStack_3370;
  undefined8 uStack_3368;
  undefined8 local_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 uStack_3330;
  undefined8 uStack_3328;
  undefined8 local_3320;
  undefined8 uStack_3318;
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 uStack_32f0;
  undefined8 uStack_32e8;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined8 local_3220;
  undefined8 uStack_3218;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  undefined8 local_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  float local_3000;
  float fStack_2ffc;
  float fStack_2ff8;
  float fStack_2ff4;
  float fStack_2ff0;
  float fStack_2fec;
  float fStack_2fe8;
  float fStack_2fe4;
  undefined1 local_2fe0 [32];
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined8 local_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined1 local_2f80 [8];
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined1 local_2f60 [8];
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined1 local_2f40 [32];
  undefined1 local_2f20 [32];
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 local_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined8 local_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 local_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 local_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 local_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 local_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  float local_2a00;
  float fStack_29fc;
  float fStack_29f8;
  float fStack_29f4;
  float fStack_29f0;
  float fStack_29ec;
  float fStack_29e8;
  float fStack_29e4;
  undefined1 local_29e0 [32];
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined1 local_2980 [8];
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined1 local_2960 [8];
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  float local_2400;
  float fStack_23fc;
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined1 local_2380 [8];
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined1 local_2360 [8];
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined1 local_2340 [32];
  undefined1 local_2320 [32];
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  float local_1e00;
  float fStack_1dfc;
  float fStack_1df8;
  float fStack_1df4;
  float fStack_1df0;
  float fStack_1dec;
  float fStack_1de8;
  float fStack_1de4;
  undefined1 local_1de0 [32];
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined1 local_1d80 [8];
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined1 local_1d60 [8];
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined1 local_1d40 [32];
  undefined1 local_1d20 [32];
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  undefined4 uStack_1444;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  ulong uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  undefined4 uStack_13c4;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  ulong uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  ulong uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  ulong uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  ulong uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined1 local_12c0 [32];
  undefined4 local_12a0;
  undefined4 local_129c;
  undefined4 local_1298;
  undefined4 local_1294;
  undefined4 local_1290;
  undefined4 local_128c;
  undefined4 local_1288;
  undefined4 local_1284;
  undefined1 local_1280 [32];
  undefined4 local_1260;
  undefined4 local_125c;
  undefined4 local_1258;
  undefined4 local_1254;
  undefined4 local_1250;
  undefined4 local_124c;
  undefined4 local_1248;
  undefined4 local_1244;
  undefined1 local_1240 [32];
  undefined4 local_1220;
  undefined4 local_121c;
  undefined4 local_1218;
  undefined4 local_1214;
  undefined4 local_1210;
  undefined4 local_120c;
  undefined4 local_1208;
  undefined4 local_1204;
  undefined1 local_1200 [32];
  undefined4 local_11e0;
  undefined4 local_11dc;
  undefined4 local_11d8;
  undefined4 local_11d4;
  undefined4 local_11d0;
  undefined4 local_11cc;
  undefined4 local_11c8;
  undefined4 local_11c4;
  undefined1 local_11c0 [32];
  undefined4 local_11a0;
  undefined4 local_119c;
  undefined4 local_1198;
  undefined4 local_1194;
  undefined4 local_1190;
  undefined4 local_118c;
  undefined4 local_1188;
  undefined4 local_1184;
  undefined1 local_1180 [32];
  undefined4 local_1160;
  undefined4 local_115c;
  undefined4 local_1158;
  undefined4 local_1154;
  undefined4 local_1150;
  undefined4 local_114c;
  undefined4 local_1148;
  undefined4 local_1144;
  undefined1 local_1140 [32];
  undefined4 local_1120;
  undefined4 local_111c;
  undefined4 local_1118;
  undefined4 local_1114;
  undefined4 local_1110;
  undefined4 local_110c;
  undefined4 local_1108;
  undefined4 local_1104;
  undefined1 local_1100 [32];
  undefined4 local_10e0;
  undefined4 local_10dc;
  undefined4 local_10d8;
  undefined4 local_10d4;
  undefined4 local_10d0;
  undefined4 local_10cc;
  undefined4 local_10c8;
  undefined4 local_10c4;
  undefined1 local_10c0 [32];
  undefined4 local_10a0;
  undefined4 local_109c;
  undefined4 local_1098;
  undefined4 local_1094;
  undefined4 local_1090;
  undefined4 local_108c;
  undefined4 local_1088;
  undefined4 local_1084;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined1 local_b80 [16];
  undefined1 local_b70 [16];
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  undefined4 local_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  undefined4 local_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined4 local_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined4 local_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined4 local_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined4 local_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined4 local_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined4 local_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined4 local_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined4 local_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined4 local_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined4 local_a4;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined4 local_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined4 local_64;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined4 local_44;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_5b1c = in_RDI->w;
  local_5b20 = in_RDI->h;
  local_5b24 = in_RSI->w;
  local_5b18 = in_R9;
  local_5b10 = in_R8;
  local_5b08 = in_RCX;
  local_5afc = in_EDX;
  local_5af8 = in_RSI;
  local_5af0 = in_RDI;
  Mat::Mat((Mat *)CONCAT44(in_stack_ffffffffffff8dbc,in_stack_ffffffffffff8db8),
           in_stack_ffffffffffff8db4,in_stack_ffffffffffff8db0,
           CONCAT44(in_stack_ffffffffffff8dac,in_stack_ffffffffffff8da8),in_stack_ffffffffffff8da0);
  bVar145 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffff8dac,in_stack_ffffffffffff8da8));
  if (bVar145) {
    local_5ae4 = -100;
  }
  else {
    for (local_5b84 = 0; local_5b84 < local_5b20; local_5b84 = local_5b84 + 1) {
      if (local_5afc == 0) {
        local_60ec = local_5b84;
      }
      else {
        local_60ec = (local_5b20 + -1) - local_5b84;
      }
      local_5b88 = local_60ec;
      local_5b8c = ((int)local_5b24 >> 1) << 1;
      for (local_5b90 = 0; local_5b90 + 1 < (int)local_5b24; local_5b90 = local_5b90 + 2) {
        local_5b98 = Mat::row(local_5af0,local_5b88);
        local_5ba0 = Mat::operator_cast_to_float_(in_stack_00000008);
        local_5ba8 = Mat::row(local_5b10,0);
        local_5bb0 = Mat::row(local_5b10,1);
        local_5bb8 = Mat::row(local_5b10,2);
        local_5bc0 = Mat::row(local_5b10,3);
        local_5bc8 = Mat::row(&local_5b70,0);
        local_5bd0 = Mat::row(&local_5b70,1);
        local_5bd8 = Mat::row(&local_5b70,2);
        local_5be0 = Mat::row(&local_5b70,3);
        local_5be8 = Mat::row(local_5b08,local_5b90);
        local_5bf0 = Mat::row(local_5b08,local_5b24 + local_5b90);
        local_5bf8 = Mat::row(local_5b08,local_5b90 + local_5b24 * 2);
        local_5c00 = Mat::row(local_5b08,local_5b24 * 3 + local_5b90);
        local_5c08 = Mat::row(local_5b08,local_5b90 + 1);
        local_5c10 = Mat::row(local_5b08,local_5b90 + 1 + local_5b24);
        local_5c18 = Mat::row(local_5b08,local_5b90 + 1 + local_5b24 * 2);
        local_5c20 = Mat::row(local_5b08,local_5b90 + 1 + local_5b24 * 3);
        local_5c28 = Mat::row(local_5b18,local_5b90);
        local_5c30 = Mat::row(local_5b18,local_5b24 + local_5b90);
        local_5c38 = Mat::row(local_5b18,local_5b90 + local_5b24 * 2);
        local_5c40 = Mat::row(local_5b18,local_5b24 * 3 + local_5b90);
        local_5c48 = Mat::row(local_5b18,local_5b90 + 1);
        local_5c50 = Mat::row(local_5b18,local_5b90 + 1 + local_5b24);
        local_5c58 = Mat::row(local_5b18,local_5b90 + 1 + local_5b24 * 2);
        local_5c60 = Mat::row(local_5b18,local_5b90 + 1 + local_5b24 * 3);
        local_5980 = 0;
        uStack_5978 = 0;
        uStack_5970 = 0;
        uStack_5968 = 0;
        local_5c80 = 0;
        uStack_5c78 = 0;
        uStack_5c70 = 0;
        uStack_5c68 = 0;
        local_59a0._8_8_ = SUB328(ZEXT832(0),4);
        local_5ca0 = 0;
        uStack_5c98 = local_59a0._8_8_;
        uStack_5c90 = 0;
        uStack_5c88 = 0;
        local_59c0._8_8_ = SUB328(ZEXT832(0),4);
        local_5cc0 = 0;
        uStack_5cb8 = local_59c0._8_8_;
        uStack_5cb0 = 0;
        uStack_5ca8 = 0;
        local_59e0._8_8_ = SUB328(ZEXT832(0),4);
        local_5ce0 = 0;
        uStack_5cd8 = local_59e0._8_8_;
        uStack_5cd0 = 0;
        uStack_5cc8 = 0;
        local_5a00._8_8_ = SUB328(ZEXT832(0),4);
        local_5d00 = 0;
        uStack_5cf8 = local_5a00._8_8_;
        uStack_5cf0 = 0;
        uStack_5ce8 = 0;
        local_5a20._8_8_ = SUB328(ZEXT832(0),4);
        local_5d20 = 0;
        uStack_5d18 = local_5a20._8_8_;
        uStack_5d10 = 0;
        uStack_5d08 = 0;
        local_5a40._8_8_ = SUB328(ZEXT832(0),4);
        local_5d40 = 0;
        uStack_5d38 = local_5a40._8_8_;
        uStack_5d30 = 0;
        uStack_5d28 = 0;
        local_5a60._8_8_ = SUB328(ZEXT832(0),4);
        local_5d60 = 0;
        uStack_5d58 = local_5a60._8_8_;
        uStack_5d50 = 0;
        uStack_5d48 = 0;
        local_5d68 = local_5b1c & 7;
        for (local_5d64 = (int)local_5b1c >> 3; 0 < local_5d64; local_5d64 = local_5d64 + -1) {
          local_5848 = local_5b98;
          local_5da0 = *(undefined8 *)local_5b98;
          uStack_5d98 = *(undefined8 *)(local_5b98 + 2);
          uStack_5d90 = *(undefined8 *)(local_5b98 + 4);
          uStack_5d88 = *(undefined8 *)(local_5b98 + 6);
          local_5850 = local_5be8;
          uVar12 = *(undefined8 *)local_5be8;
          uVar13 = *(undefined8 *)(local_5be8 + 2);
          uVar14 = *(undefined8 *)(local_5be8 + 4);
          uVar15 = *(undefined8 *)(local_5be8 + 6);
          local_4fa0 = local_5c80;
          uStack_4f98 = uStack_5c78;
          uStack_4f90 = uStack_5c70;
          uStack_4f88 = uStack_5c68;
          local_4f60._0_4_ = (float)uVar12;
          local_40e0 = (float)local_4f60;
          local_4f60._4_4_ = (float)((ulong)uVar12 >> 0x20);
          fStack_40dc = local_4f60._4_4_;
          uStack_4f58._0_4_ = (float)uVar13;
          fStack_40d8 = (float)uStack_4f58;
          uStack_4f58._4_4_ = (float)((ulong)uVar13 >> 0x20);
          fStack_40d4 = uStack_4f58._4_4_;
          uStack_4f50._0_4_ = (float)uVar14;
          fStack_40d0 = (float)uStack_4f50;
          uStack_4f50._4_4_ = (float)((ulong)uVar14 >> 0x20);
          fStack_40cc = uStack_4f50._4_4_;
          uStack_4f48._0_4_ = (float)uVar15;
          fStack_40c8 = (float)uStack_4f48;
          uStack_4f48._4_4_ = (float)((ulong)uVar15 >> 0x20);
          fStack_4804 = uStack_4f48._4_4_;
          local_4100._0_4_ = (float)local_5da0;
          local_4100._4_4_ = (float)((ulong)local_5da0 >> 0x20);
          uStack_40f8._0_4_ = (float)uStack_5d98;
          uStack_40f8._4_4_ = (float)((ulong)uStack_5d98 >> 0x20);
          uStack_40f0._0_4_ = (float)uStack_5d90;
          uStack_40f0._4_4_ = (float)((ulong)uStack_5d90 >> 0x20);
          uStack_40e8._0_4_ = (float)uStack_5d88;
          local_4820 = (float)local_4f60 * (float)local_4100;
          fStack_481c = local_4f60._4_4_ * local_4100._4_4_;
          fStack_4818 = (float)uStack_4f58 * (float)uStack_40f8;
          fStack_4814 = uStack_4f58._4_4_ * uStack_40f8._4_4_;
          fStack_4810 = (float)uStack_4f50 * (float)uStack_40f0;
          fStack_480c = uStack_4f50._4_4_ * uStack_40f0._4_4_;
          fStack_4808 = (float)uStack_4f48 * (float)uStack_40e8;
          uVar16 = local_5c80;
          uVar17 = uStack_5c78;
          uVar18 = uStack_5c70;
          uVar19 = uStack_5c68;
          local_4840._0_4_ = (float)local_5c80;
          local_4840._4_4_ = (float)((ulong)local_5c80 >> 0x20);
          uStack_4838._0_4_ = (float)uStack_5c78;
          uStack_4838._4_4_ = (float)((ulong)uStack_5c78 >> 0x20);
          uStack_4830._0_4_ = (float)uStack_5c70;
          uStack_4830._4_4_ = (float)((ulong)uStack_5c70 >> 0x20);
          uStack_4828._0_4_ = (float)uStack_5c68;
          uStack_4828._4_4_ = (float)((ulong)uStack_5c68 >> 0x20);
          local_5c80 = CONCAT44(fStack_481c + local_4840._4_4_,local_4820 + (float)local_4840);
          uStack_5c78 = CONCAT44(fStack_4814 + uStack_4838._4_4_,fStack_4818 + (float)uStack_4838);
          uStack_5c70 = CONCAT44(fStack_480c + uStack_4830._4_4_,fStack_4810 + (float)uStack_4830);
          uStack_5c68 = CONCAT44(uStack_4f48._4_4_ + uStack_4828._4_4_,
                                 fStack_4808 + (float)uStack_4828);
          local_5858 = local_5bf0;
          uVar20 = *(undefined8 *)local_5bf0;
          uVar21 = *(undefined8 *)(local_5bf0 + 2);
          uVar22 = *(undefined8 *)(local_5bf0 + 4);
          uVar23 = *(undefined8 *)(local_5bf0 + 6);
          local_5000 = local_5ca0;
          uStack_4ff8 = uStack_5c98;
          uStack_4ff0 = uStack_5c90;
          uStack_4fe8 = uStack_5c88;
          local_4fc0._0_4_ = (float)uVar20;
          local_40a0 = (float)local_4fc0;
          local_4fc0._4_4_ = (float)((ulong)uVar20 >> 0x20);
          fStack_409c = local_4fc0._4_4_;
          uStack_4fb8._0_4_ = (float)uVar21;
          fStack_4098 = (float)uStack_4fb8;
          uStack_4fb8._4_4_ = (float)((ulong)uVar21 >> 0x20);
          fStack_4094 = uStack_4fb8._4_4_;
          uStack_4fb0._0_4_ = (float)uVar22;
          fStack_4090 = (float)uStack_4fb0;
          uStack_4fb0._4_4_ = (float)((ulong)uVar22 >> 0x20);
          fStack_408c = uStack_4fb0._4_4_;
          uStack_4fa8._0_4_ = (float)uVar23;
          fStack_4088 = (float)uStack_4fa8;
          uStack_4fa8._4_4_ = (float)((ulong)uVar23 >> 0x20);
          fStack_47c4 = uStack_4fa8._4_4_;
          local_47e0 = (float)local_4fc0 * (float)local_4100;
          fStack_47dc = local_4fc0._4_4_ * local_4100._4_4_;
          fStack_47d8 = (float)uStack_4fb8 * (float)uStack_40f8;
          fStack_47d4 = uStack_4fb8._4_4_ * uStack_40f8._4_4_;
          fStack_47d0 = (float)uStack_4fb0 * (float)uStack_40f0;
          fStack_47cc = uStack_4fb0._4_4_ * uStack_40f0._4_4_;
          fStack_47c8 = (float)uStack_4fa8 * (float)uStack_40e8;
          uVar24 = local_5ca0;
          uVar25 = uStack_5c98;
          uVar26 = uStack_5c90;
          uVar27 = uStack_5c88;
          local_4800._0_4_ = (float)local_5ca0;
          local_4800._4_4_ = (float)((ulong)local_5ca0 >> 0x20);
          uStack_47f8._0_4_ = (float)uStack_5c98;
          uStack_47f8._4_4_ = (float)((ulong)uStack_5c98 >> 0x20);
          uStack_47f0._0_4_ = (float)uStack_5c90;
          uStack_47f0._4_4_ = (float)((ulong)uStack_5c90 >> 0x20);
          uStack_47e8._0_4_ = (float)uStack_5c88;
          uStack_47e8._4_4_ = (float)((ulong)uStack_5c88 >> 0x20);
          local_5ca0 = CONCAT44(fStack_47dc + local_4800._4_4_,local_47e0 + (float)local_4800);
          uStack_5c98 = CONCAT44(fStack_47d4 + uStack_47f8._4_4_,fStack_47d8 + (float)uStack_47f8);
          uStack_5c90 = CONCAT44(fStack_47cc + uStack_47f0._4_4_,fStack_47d0 + (float)uStack_47f0);
          uStack_5c88 = CONCAT44(uStack_4fa8._4_4_ + uStack_47e8._4_4_,
                                 fStack_47c8 + (float)uStack_47e8);
          local_5860 = local_5bf8;
          uVar28 = *(undefined8 *)local_5bf8;
          uVar29 = *(undefined8 *)(local_5bf8 + 2);
          uVar30 = *(undefined8 *)(local_5bf8 + 4);
          uVar31 = *(undefined8 *)(local_5bf8 + 6);
          local_5060 = local_5cc0;
          uStack_5058 = uStack_5cb8;
          uStack_5050 = uStack_5cb0;
          uStack_5048 = uStack_5ca8;
          local_5020._0_4_ = (float)uVar28;
          local_4060 = (float)local_5020;
          local_5020._4_4_ = (float)((ulong)uVar28 >> 0x20);
          fStack_405c = local_5020._4_4_;
          uStack_5018._0_4_ = (float)uVar29;
          fStack_4058 = (float)uStack_5018;
          uStack_5018._4_4_ = (float)((ulong)uVar29 >> 0x20);
          fStack_4054 = uStack_5018._4_4_;
          uStack_5010._0_4_ = (float)uVar30;
          fStack_4050 = (float)uStack_5010;
          uStack_5010._4_4_ = (float)((ulong)uVar30 >> 0x20);
          fStack_404c = uStack_5010._4_4_;
          uStack_5008._0_4_ = (float)uVar31;
          fStack_4048 = (float)uStack_5008;
          uStack_5008._4_4_ = (float)((ulong)uVar31 >> 0x20);
          fStack_4784 = uStack_5008._4_4_;
          local_47a0 = (float)local_5020 * (float)local_4100;
          fStack_479c = local_5020._4_4_ * local_4100._4_4_;
          fStack_4798 = (float)uStack_5018 * (float)uStack_40f8;
          fStack_4794 = uStack_5018._4_4_ * uStack_40f8._4_4_;
          fStack_4790 = (float)uStack_5010 * (float)uStack_40f0;
          fStack_478c = uStack_5010._4_4_ * uStack_40f0._4_4_;
          fStack_4788 = (float)uStack_5008 * (float)uStack_40e8;
          uVar32 = local_5cc0;
          uVar33 = uStack_5cb8;
          uVar34 = uStack_5cb0;
          uVar35 = uStack_5ca8;
          local_47c0._0_4_ = (float)local_5cc0;
          local_47c0._4_4_ = (float)((ulong)local_5cc0 >> 0x20);
          uStack_47b8._0_4_ = (float)uStack_5cb8;
          uStack_47b8._4_4_ = (float)((ulong)uStack_5cb8 >> 0x20);
          uStack_47b0._0_4_ = (float)uStack_5cb0;
          uStack_47b0._4_4_ = (float)((ulong)uStack_5cb0 >> 0x20);
          uStack_47a8._0_4_ = (float)uStack_5ca8;
          uStack_47a8._4_4_ = (float)((ulong)uStack_5ca8 >> 0x20);
          local_5cc0 = CONCAT44(fStack_479c + local_47c0._4_4_,local_47a0 + (float)local_47c0);
          uStack_5cb8 = CONCAT44(fStack_4794 + uStack_47b8._4_4_,fStack_4798 + (float)uStack_47b8);
          uStack_5cb0 = CONCAT44(fStack_478c + uStack_47b0._4_4_,fStack_4790 + (float)uStack_47b0);
          uStack_5ca8 = CONCAT44(uStack_5008._4_4_ + uStack_47a8._4_4_,
                                 fStack_4788 + (float)uStack_47a8);
          local_5868 = local_5c00;
          uVar36 = *(undefined8 *)local_5c00;
          uVar37 = *(undefined8 *)(local_5c00 + 2);
          uVar38 = *(undefined8 *)(local_5c00 + 4);
          uVar39 = *(undefined8 *)(local_5c00 + 6);
          local_50c0 = local_5ce0;
          uStack_50b8 = uStack_5cd8;
          uStack_50b0 = uStack_5cd0;
          uStack_50a8 = uStack_5cc8;
          local_5080._0_4_ = (float)uVar36;
          local_4020 = (float)local_5080;
          local_5080._4_4_ = (float)((ulong)uVar36 >> 0x20);
          fStack_401c = local_5080._4_4_;
          uStack_5078._0_4_ = (float)uVar37;
          fStack_4018 = (float)uStack_5078;
          uStack_5078._4_4_ = (float)((ulong)uVar37 >> 0x20);
          fStack_4014 = uStack_5078._4_4_;
          uStack_5070._0_4_ = (float)uVar38;
          fStack_4010 = (float)uStack_5070;
          uStack_5070._4_4_ = (float)((ulong)uVar38 >> 0x20);
          fStack_400c = uStack_5070._4_4_;
          uStack_5068._0_4_ = (float)uVar39;
          fStack_4008 = (float)uStack_5068;
          uStack_5068._4_4_ = (float)((ulong)uVar39 >> 0x20);
          fStack_4744 = uStack_5068._4_4_;
          local_4760 = (float)local_5080 * (float)local_4100;
          fStack_475c = local_5080._4_4_ * local_4100._4_4_;
          fStack_4758 = (float)uStack_5078 * (float)uStack_40f8;
          fStack_4754 = uStack_5078._4_4_ * uStack_40f8._4_4_;
          fStack_4750 = (float)uStack_5070 * (float)uStack_40f0;
          fStack_474c = uStack_5070._4_4_ * uStack_40f0._4_4_;
          fStack_4748 = (float)uStack_5068 * (float)uStack_40e8;
          uVar40 = local_5ce0;
          uVar41 = uStack_5cd8;
          uVar42 = uStack_5cd0;
          uVar43 = uStack_5cc8;
          local_4780._0_4_ = (float)local_5ce0;
          local_4780._4_4_ = (float)((ulong)local_5ce0 >> 0x20);
          uStack_4778._0_4_ = (float)uStack_5cd8;
          uStack_4778._4_4_ = (float)((ulong)uStack_5cd8 >> 0x20);
          uStack_4770._0_4_ = (float)uStack_5cd0;
          uStack_4770._4_4_ = (float)((ulong)uStack_5cd0 >> 0x20);
          uStack_4768._0_4_ = (float)uStack_5cc8;
          uStack_4768._4_4_ = (float)((ulong)uStack_5cc8 >> 0x20);
          local_5ce0 = CONCAT44(fStack_475c + local_4780._4_4_,local_4760 + (float)local_4780);
          uStack_5cd8 = CONCAT44(fStack_4754 + uStack_4778._4_4_,fStack_4758 + (float)uStack_4778);
          uStack_5cd0 = CONCAT44(fStack_474c + uStack_4770._4_4_,fStack_4750 + (float)uStack_4770);
          uStack_5cc8 = CONCAT44(uStack_5068._4_4_ + uStack_4768._4_4_,
                                 fStack_4748 + (float)uStack_4768);
          local_5870 = local_5c08;
          uVar44 = *(undefined8 *)local_5c08;
          uVar45 = *(undefined8 *)(local_5c08 + 2);
          uVar46 = *(undefined8 *)(local_5c08 + 4);
          uVar47 = *(undefined8 *)(local_5c08 + 6);
          local_5120 = local_5d00;
          uStack_5118 = uStack_5cf8;
          uStack_5110 = uStack_5cf0;
          uStack_5108 = uStack_5ce8;
          local_50e0._0_4_ = (float)uVar44;
          local_3fe0 = (float)local_50e0;
          local_50e0._4_4_ = (float)((ulong)uVar44 >> 0x20);
          fStack_3fdc = local_50e0._4_4_;
          uStack_50d8._0_4_ = (float)uVar45;
          fStack_3fd8 = (float)uStack_50d8;
          uStack_50d8._4_4_ = (float)((ulong)uVar45 >> 0x20);
          fStack_3fd4 = uStack_50d8._4_4_;
          uStack_50d0._0_4_ = (float)uVar46;
          fStack_3fd0 = (float)uStack_50d0;
          uStack_50d0._4_4_ = (float)((ulong)uVar46 >> 0x20);
          fStack_3fcc = uStack_50d0._4_4_;
          uStack_50c8._0_4_ = (float)uVar47;
          fStack_3fc8 = (float)uStack_50c8;
          uStack_50c8._4_4_ = (float)((ulong)uVar47 >> 0x20);
          fStack_4704 = uStack_50c8._4_4_;
          local_4720 = (float)local_50e0 * (float)local_4100;
          fStack_471c = local_50e0._4_4_ * local_4100._4_4_;
          fStack_4718 = (float)uStack_50d8 * (float)uStack_40f8;
          fStack_4714 = uStack_50d8._4_4_ * uStack_40f8._4_4_;
          fStack_4710 = (float)uStack_50d0 * (float)uStack_40f0;
          fStack_470c = uStack_50d0._4_4_ * uStack_40f0._4_4_;
          fStack_4708 = (float)uStack_50c8 * (float)uStack_40e8;
          uVar48 = local_5d00;
          uVar49 = uStack_5cf8;
          uVar50 = uStack_5cf0;
          uVar51 = uStack_5ce8;
          local_4740._0_4_ = (float)local_5d00;
          local_4740._4_4_ = (float)((ulong)local_5d00 >> 0x20);
          uStack_4738._0_4_ = (float)uStack_5cf8;
          uStack_4738._4_4_ = (float)((ulong)uStack_5cf8 >> 0x20);
          uStack_4730._0_4_ = (float)uStack_5cf0;
          uStack_4730._4_4_ = (float)((ulong)uStack_5cf0 >> 0x20);
          uStack_4728._0_4_ = (float)uStack_5ce8;
          uStack_4728._4_4_ = (float)((ulong)uStack_5ce8 >> 0x20);
          local_5d00 = CONCAT44(fStack_471c + local_4740._4_4_,local_4720 + (float)local_4740);
          uStack_5cf8 = CONCAT44(fStack_4714 + uStack_4738._4_4_,fStack_4718 + (float)uStack_4738);
          uStack_5cf0 = CONCAT44(fStack_470c + uStack_4730._4_4_,fStack_4710 + (float)uStack_4730);
          uStack_5ce8 = CONCAT44(uStack_50c8._4_4_ + uStack_4728._4_4_,
                                 fStack_4708 + (float)uStack_4728);
          local_5878 = local_5c10;
          uVar52 = *(undefined8 *)local_5c10;
          uVar53 = *(undefined8 *)(local_5c10 + 2);
          uVar54 = *(undefined8 *)(local_5c10 + 4);
          uVar55 = *(undefined8 *)(local_5c10 + 6);
          local_5180 = local_5d20;
          uStack_5178 = uStack_5d18;
          uStack_5170 = uStack_5d10;
          uStack_5168 = uStack_5d08;
          local_5140._0_4_ = (float)uVar52;
          local_3fa0 = (float)local_5140;
          local_5140._4_4_ = (float)((ulong)uVar52 >> 0x20);
          fStack_3f9c = local_5140._4_4_;
          uStack_5138._0_4_ = (float)uVar53;
          fStack_3f98 = (float)uStack_5138;
          uStack_5138._4_4_ = (float)((ulong)uVar53 >> 0x20);
          fStack_3f94 = uStack_5138._4_4_;
          uStack_5130._0_4_ = (float)uVar54;
          fStack_3f90 = (float)uStack_5130;
          uStack_5130._4_4_ = (float)((ulong)uVar54 >> 0x20);
          fStack_3f8c = uStack_5130._4_4_;
          uStack_5128._0_4_ = (float)uVar55;
          fStack_3f88 = (float)uStack_5128;
          uStack_5128._4_4_ = (float)((ulong)uVar55 >> 0x20);
          fStack_46c4 = uStack_5128._4_4_;
          local_46e0 = (float)local_5140 * (float)local_4100;
          fStack_46dc = local_5140._4_4_ * local_4100._4_4_;
          fStack_46d8 = (float)uStack_5138 * (float)uStack_40f8;
          fStack_46d4 = uStack_5138._4_4_ * uStack_40f8._4_4_;
          fStack_46d0 = (float)uStack_5130 * (float)uStack_40f0;
          fStack_46cc = uStack_5130._4_4_ * uStack_40f0._4_4_;
          fStack_46c8 = (float)uStack_5128 * (float)uStack_40e8;
          uVar56 = local_5d20;
          uVar57 = uStack_5d18;
          uVar58 = uStack_5d10;
          uVar59 = uStack_5d08;
          local_4700._0_4_ = (float)local_5d20;
          local_4700._4_4_ = (float)((ulong)local_5d20 >> 0x20);
          uStack_46f8._0_4_ = (float)uStack_5d18;
          uStack_46f8._4_4_ = (float)((ulong)uStack_5d18 >> 0x20);
          uStack_46f0._0_4_ = (float)uStack_5d10;
          uStack_46f0._4_4_ = (float)((ulong)uStack_5d10 >> 0x20);
          uStack_46e8._0_4_ = (float)uStack_5d08;
          uStack_46e8._4_4_ = (float)((ulong)uStack_5d08 >> 0x20);
          local_5d20 = CONCAT44(fStack_46dc + local_4700._4_4_,local_46e0 + (float)local_4700);
          uStack_5d18 = CONCAT44(fStack_46d4 + uStack_46f8._4_4_,fStack_46d8 + (float)uStack_46f8);
          uStack_5d10 = CONCAT44(fStack_46cc + uStack_46f0._4_4_,fStack_46d0 + (float)uStack_46f0);
          uStack_5d08 = CONCAT44(uStack_5128._4_4_ + uStack_46e8._4_4_,
                                 fStack_46c8 + (float)uStack_46e8);
          local_5880 = local_5c18;
          uVar60 = *(undefined8 *)local_5c18;
          uVar61 = *(undefined8 *)(local_5c18 + 2);
          uVar62 = *(undefined8 *)(local_5c18 + 4);
          uVar63 = *(undefined8 *)(local_5c18 + 6);
          local_51e0 = local_5d40;
          uStack_51d8 = uStack_5d38;
          uStack_51d0 = uStack_5d30;
          uStack_51c8 = uStack_5d28;
          local_51a0._0_4_ = (float)uVar60;
          local_3f60 = (float)local_51a0;
          local_51a0._4_4_ = (float)((ulong)uVar60 >> 0x20);
          fStack_3f5c = local_51a0._4_4_;
          uStack_5198._0_4_ = (float)uVar61;
          fStack_3f58 = (float)uStack_5198;
          uStack_5198._4_4_ = (float)((ulong)uVar61 >> 0x20);
          fStack_3f54 = uStack_5198._4_4_;
          uStack_5190._0_4_ = (float)uVar62;
          fStack_3f50 = (float)uStack_5190;
          uStack_5190._4_4_ = (float)((ulong)uVar62 >> 0x20);
          fStack_3f4c = uStack_5190._4_4_;
          uStack_5188._0_4_ = (float)uVar63;
          fStack_3f48 = (float)uStack_5188;
          uStack_5188._4_4_ = (float)((ulong)uVar63 >> 0x20);
          fStack_4684 = uStack_5188._4_4_;
          local_46a0 = (float)local_51a0 * (float)local_4100;
          fStack_469c = local_51a0._4_4_ * local_4100._4_4_;
          fStack_4698 = (float)uStack_5198 * (float)uStack_40f8;
          fStack_4694 = uStack_5198._4_4_ * uStack_40f8._4_4_;
          fStack_4690 = (float)uStack_5190 * (float)uStack_40f0;
          fStack_468c = uStack_5190._4_4_ * uStack_40f0._4_4_;
          fStack_4688 = (float)uStack_5188 * (float)uStack_40e8;
          uVar64 = local_5d40;
          uVar65 = uStack_5d38;
          uVar66 = uStack_5d30;
          uVar67 = uStack_5d28;
          local_46c0._0_4_ = (float)local_5d40;
          local_46c0._4_4_ = (float)((ulong)local_5d40 >> 0x20);
          uStack_46b8._0_4_ = (float)uStack_5d38;
          uStack_46b8._4_4_ = (float)((ulong)uStack_5d38 >> 0x20);
          uStack_46b0._0_4_ = (float)uStack_5d30;
          uStack_46b0._4_4_ = (float)((ulong)uStack_5d30 >> 0x20);
          uStack_46a8._0_4_ = (float)uStack_5d28;
          uStack_46a8._4_4_ = (float)((ulong)uStack_5d28 >> 0x20);
          local_5d40 = CONCAT44(fStack_469c + local_46c0._4_4_,local_46a0 + (float)local_46c0);
          uStack_5d38 = CONCAT44(fStack_4694 + uStack_46b8._4_4_,fStack_4698 + (float)uStack_46b8);
          uStack_5d30 = CONCAT44(fStack_468c + uStack_46b0._4_4_,fStack_4690 + (float)uStack_46b0);
          uStack_5d28 = CONCAT44(uStack_5188._4_4_ + uStack_46a8._4_4_,
                                 fStack_4688 + (float)uStack_46a8);
          local_5888 = local_5c20;
          uVar68 = *(undefined8 *)local_5c20;
          uVar69 = *(undefined8 *)(local_5c20 + 2);
          uVar70 = *(undefined8 *)(local_5c20 + 4);
          uVar71 = *(undefined8 *)(local_5c20 + 6);
          local_5240 = local_5d60;
          uStack_5238 = uStack_5d58;
          uStack_5230 = uStack_5d50;
          uStack_5228 = uStack_5d48;
          local_5200._0_4_ = (float)uVar68;
          local_3f20 = (float)local_5200;
          local_5200._4_4_ = (float)((ulong)uVar68 >> 0x20);
          fStack_3f1c = local_5200._4_4_;
          uStack_51f8._0_4_ = (float)uVar69;
          fStack_3f18 = (float)uStack_51f8;
          uStack_51f8._4_4_ = (float)((ulong)uVar69 >> 0x20);
          fStack_3f14 = uStack_51f8._4_4_;
          uStack_51f0._0_4_ = (float)uVar70;
          fStack_3f10 = (float)uStack_51f0;
          uStack_51f0._4_4_ = (float)((ulong)uVar70 >> 0x20);
          fStack_3f0c = uStack_51f0._4_4_;
          uStack_51e8._0_4_ = (float)uVar71;
          fStack_3f08 = (float)uStack_51e8;
          uStack_51e8._4_4_ = (float)((ulong)uVar71 >> 0x20);
          fStack_4644 = uStack_51e8._4_4_;
          local_4660 = (float)local_5200 * (float)local_4100;
          fStack_465c = local_5200._4_4_ * local_4100._4_4_;
          fStack_4658 = (float)uStack_51f8 * (float)uStack_40f8;
          fStack_4654 = uStack_51f8._4_4_ * uStack_40f8._4_4_;
          fStack_4650 = (float)uStack_51f0 * (float)uStack_40f0;
          fStack_464c = uStack_51f0._4_4_ * uStack_40f0._4_4_;
          fStack_4648 = (float)uStack_51e8 * (float)uStack_40e8;
          uVar72 = local_5d60;
          uVar73 = uStack_5d58;
          uVar74 = uStack_5d50;
          uVar75 = uStack_5d48;
          local_4680._0_4_ = (float)local_5d60;
          local_4680._4_4_ = (float)((ulong)local_5d60 >> 0x20);
          uStack_4678._0_4_ = (float)uStack_5d58;
          uStack_4678._4_4_ = (float)((ulong)uStack_5d58 >> 0x20);
          uStack_4670._0_4_ = (float)uStack_5d50;
          uStack_4670._4_4_ = (float)((ulong)uStack_5d50 >> 0x20);
          uStack_4668._0_4_ = (float)uStack_5d48;
          uStack_4668._4_4_ = (float)((ulong)uStack_5d48 >> 0x20);
          local_5d60 = CONCAT44(fStack_465c + local_4680._4_4_,local_4660 + (float)local_4680);
          uStack_5d58 = CONCAT44(fStack_4654 + uStack_4678._4_4_,fStack_4658 + (float)uStack_4678);
          uStack_5d50 = CONCAT44(fStack_464c + uStack_4670._4_4_,fStack_4650 + (float)uStack_4670);
          uStack_5d48 = CONCAT44(uStack_51e8._4_4_ + uStack_4668._4_4_,
                                 fStack_4648 + (float)uStack_4668);
          local_5b98 = local_5b98 + 8;
          local_5be8 = local_5be8 + 8;
          local_5bf0 = local_5bf0 + 8;
          local_5bf8 = local_5bf8 + 8;
          local_5c00 = local_5c00 + 8;
          local_5c08 = local_5c08 + 8;
          local_5c10 = local_5c10 + 8;
          local_5c18 = local_5c18 + 8;
          local_5c20 = local_5c20 + 8;
          local_5220 = local_5da0;
          uStack_5218 = uStack_5d98;
          uStack_5210 = uStack_5d90;
          uStack_5208 = uStack_5d88;
          local_5200 = uVar68;
          uStack_51f8 = uVar69;
          uStack_51f0 = uVar70;
          uStack_51e8 = uVar71;
          local_51c0 = local_5da0;
          uStack_51b8 = uStack_5d98;
          uStack_51b0 = uStack_5d90;
          uStack_51a8 = uStack_5d88;
          local_51a0 = uVar60;
          uStack_5198 = uVar61;
          uStack_5190 = uVar62;
          uStack_5188 = uVar63;
          local_5160 = local_5da0;
          uStack_5158 = uStack_5d98;
          uStack_5150 = uStack_5d90;
          uStack_5148 = uStack_5d88;
          local_5140 = uVar52;
          uStack_5138 = uVar53;
          uStack_5130 = uVar54;
          uStack_5128 = uVar55;
          local_5100 = local_5da0;
          uStack_50f8 = uStack_5d98;
          uStack_50f0 = uStack_5d90;
          uStack_50e8 = uStack_5d88;
          local_50e0 = uVar44;
          uStack_50d8 = uVar45;
          uStack_50d0 = uVar46;
          uStack_50c8 = uVar47;
          local_50a0 = local_5da0;
          uStack_5098 = uStack_5d98;
          uStack_5090 = uStack_5d90;
          uStack_5088 = uStack_5d88;
          local_5080 = uVar36;
          uStack_5078 = uVar37;
          uStack_5070 = uVar38;
          uStack_5068 = uVar39;
          local_5040 = local_5da0;
          uStack_5038 = uStack_5d98;
          uStack_5030 = uStack_5d90;
          uStack_5028 = uStack_5d88;
          local_5020 = uVar28;
          uStack_5018 = uVar29;
          uStack_5010 = uVar30;
          uStack_5008 = uVar31;
          local_4fe0 = local_5da0;
          uStack_4fd8 = uStack_5d98;
          uStack_4fd0 = uStack_5d90;
          uStack_4fc8 = uStack_5d88;
          local_4fc0 = uVar20;
          uStack_4fb8 = uVar21;
          uStack_4fb0 = uVar22;
          uStack_4fa8 = uVar23;
          local_4f80 = local_5da0;
          uStack_4f78 = uStack_5d98;
          uStack_4f70 = uStack_5d90;
          uStack_4f68 = uStack_5d88;
          local_4f60 = uVar12;
          uStack_4f58 = uVar13;
          uStack_4f50 = uVar14;
          uStack_4f48 = uVar15;
          local_4840 = uVar16;
          uStack_4838 = uVar17;
          uStack_4830 = uVar18;
          uStack_4828 = uVar19;
          local_4800 = uVar24;
          uStack_47f8 = uVar25;
          uStack_47f0 = uVar26;
          uStack_47e8 = uVar27;
          local_47c0 = uVar32;
          uStack_47b8 = uVar33;
          uStack_47b0 = uVar34;
          uStack_47a8 = uVar35;
          local_4780 = uVar40;
          uStack_4778 = uVar41;
          uStack_4770 = uVar42;
          uStack_4768 = uVar43;
          local_4740 = uVar48;
          uStack_4738 = uVar49;
          uStack_4730 = uVar50;
          uStack_4728 = uVar51;
          local_4700 = uVar56;
          uStack_46f8 = uVar57;
          uStack_46f0 = uVar58;
          uStack_46e8 = uVar59;
          local_46c0 = uVar64;
          uStack_46b8 = uVar65;
          uStack_46b0 = uVar66;
          uStack_46a8 = uVar67;
          local_4680 = uVar72;
          uStack_4678 = uVar73;
          uStack_4670 = uVar74;
          uStack_4668 = uVar75;
          local_4100 = local_5da0;
          uStack_40f8 = uStack_5d98;
          uStack_40f0 = uStack_5d90;
          uStack_40e8 = uStack_5d88;
          fStack_40c4 = fStack_4804;
          local_40c0 = local_5da0;
          uStack_40b8 = uStack_5d98;
          uStack_40b0 = uStack_5d90;
          uStack_40a8 = uStack_5d88;
          fStack_4084 = fStack_47c4;
          local_4080 = local_5da0;
          uStack_4078 = uStack_5d98;
          uStack_4070 = uStack_5d90;
          uStack_4068 = uStack_5d88;
          fStack_4044 = fStack_4784;
          local_4040 = local_5da0;
          uStack_4038 = uStack_5d98;
          uStack_4030 = uStack_5d90;
          uStack_4028 = uStack_5d88;
          fStack_4004 = fStack_4744;
          local_4000 = local_5da0;
          uStack_3ff8 = uStack_5d98;
          uStack_3ff0 = uStack_5d90;
          uStack_3fe8 = uStack_5d88;
          fStack_3fc4 = fStack_4704;
          local_3fc0 = local_5da0;
          uStack_3fb8 = uStack_5d98;
          uStack_3fb0 = uStack_5d90;
          uStack_3fa8 = uStack_5d88;
          fStack_3f84 = fStack_46c4;
          local_3f80 = local_5da0;
          uStack_3f78 = uStack_5d98;
          uStack_3f70 = uStack_5d90;
          uStack_3f68 = uStack_5d88;
          fStack_3f44 = fStack_4684;
          local_3f40 = local_5da0;
          uStack_3f38 = uStack_5d98;
          uStack_3f30 = uStack_5d90;
          uStack_3f28 = uStack_5d88;
          fStack_3f04 = fStack_4644;
        }
        local_5da8 = local_5b24 & 7;
        for (local_5da4 = (int)local_5b24 >> 3; 0 < local_5da4; local_5da4 = local_5da4 + -1) {
          local_5890 = local_5ba0;
          local_5de0 = *(undefined8 *)local_5ba0;
          uStack_5dd8 = *(undefined8 *)(local_5ba0 + 2);
          uStack_5dd0 = *(undefined8 *)(local_5ba0 + 4);
          uStack_5dc8 = *(undefined8 *)(local_5ba0 + 6);
          local_5898 = local_5c28;
          uVar12 = *(undefined8 *)local_5c28;
          uVar13 = *(undefined8 *)(local_5c28 + 2);
          uVar14 = *(undefined8 *)(local_5c28 + 4);
          uVar15 = *(undefined8 *)(local_5c28 + 6);
          local_52a0 = local_5c80;
          uStack_5298 = uStack_5c78;
          uStack_5290 = uStack_5c70;
          uStack_5288 = uStack_5c68;
          local_5260._0_4_ = (float)uVar12;
          local_3ee0 = (float)local_5260;
          local_5260._4_4_ = (float)((ulong)uVar12 >> 0x20);
          fStack_3edc = local_5260._4_4_;
          uStack_5258._0_4_ = (float)uVar13;
          fStack_3ed8 = (float)uStack_5258;
          uStack_5258._4_4_ = (float)((ulong)uVar13 >> 0x20);
          fStack_3ed4 = uStack_5258._4_4_;
          uStack_5250._0_4_ = (float)uVar14;
          fStack_3ed0 = (float)uStack_5250;
          uStack_5250._4_4_ = (float)((ulong)uVar14 >> 0x20);
          fStack_3ecc = uStack_5250._4_4_;
          uStack_5248._0_4_ = (float)uVar15;
          fStack_3ec8 = (float)uStack_5248;
          uStack_5248._4_4_ = (float)((ulong)uVar15 >> 0x20);
          fStack_4604 = uStack_5248._4_4_;
          local_3f00._0_4_ = (float)local_5de0;
          local_3f00._4_4_ = (float)((ulong)local_5de0 >> 0x20);
          uStack_3ef8._0_4_ = (float)uStack_5dd8;
          uStack_3ef8._4_4_ = (float)((ulong)uStack_5dd8 >> 0x20);
          uStack_3ef0._0_4_ = (float)uStack_5dd0;
          uStack_3ef0._4_4_ = (float)((ulong)uStack_5dd0 >> 0x20);
          uStack_3ee8._0_4_ = (float)uStack_5dc8;
          local_4620 = (float)local_5260 * (float)local_3f00;
          fStack_461c = local_5260._4_4_ * local_3f00._4_4_;
          fStack_4618 = (float)uStack_5258 * (float)uStack_3ef8;
          fStack_4614 = uStack_5258._4_4_ * uStack_3ef8._4_4_;
          fStack_4610 = (float)uStack_5250 * (float)uStack_3ef0;
          fStack_460c = uStack_5250._4_4_ * uStack_3ef0._4_4_;
          fStack_4608 = (float)uStack_5248 * (float)uStack_3ee8;
          uVar16 = local_5c80;
          uVar17 = uStack_5c78;
          uVar18 = uStack_5c70;
          uVar19 = uStack_5c68;
          local_4640._0_4_ = (float)local_5c80;
          local_4640._4_4_ = (float)((ulong)local_5c80 >> 0x20);
          uStack_4638._0_4_ = (float)uStack_5c78;
          uStack_4638._4_4_ = (float)((ulong)uStack_5c78 >> 0x20);
          uStack_4630._0_4_ = (float)uStack_5c70;
          uStack_4630._4_4_ = (float)((ulong)uStack_5c70 >> 0x20);
          uStack_4628._0_4_ = (float)uStack_5c68;
          uStack_4628._4_4_ = (float)((ulong)uStack_5c68 >> 0x20);
          local_5c80 = CONCAT44(fStack_461c + local_4640._4_4_,local_4620 + (float)local_4640);
          uStack_5c78 = CONCAT44(fStack_4614 + uStack_4638._4_4_,fStack_4618 + (float)uStack_4638);
          uStack_5c70 = CONCAT44(fStack_460c + uStack_4630._4_4_,fStack_4610 + (float)uStack_4630);
          uStack_5c68 = CONCAT44(uStack_5248._4_4_ + uStack_4628._4_4_,
                                 fStack_4608 + (float)uStack_4628);
          local_58a0 = local_5c30;
          uVar20 = *(undefined8 *)local_5c30;
          uVar21 = *(undefined8 *)(local_5c30 + 2);
          uVar22 = *(undefined8 *)(local_5c30 + 4);
          uVar23 = *(undefined8 *)(local_5c30 + 6);
          local_5300 = local_5ca0;
          uStack_52f8 = uStack_5c98;
          uStack_52f0 = uStack_5c90;
          uStack_52e8 = uStack_5c88;
          local_52c0._0_4_ = (float)uVar20;
          local_3ea0 = (float)local_52c0;
          local_52c0._4_4_ = (float)((ulong)uVar20 >> 0x20);
          fStack_3e9c = local_52c0._4_4_;
          uStack_52b8._0_4_ = (float)uVar21;
          fStack_3e98 = (float)uStack_52b8;
          uStack_52b8._4_4_ = (float)((ulong)uVar21 >> 0x20);
          fStack_3e94 = uStack_52b8._4_4_;
          uStack_52b0._0_4_ = (float)uVar22;
          fStack_3e90 = (float)uStack_52b0;
          uStack_52b0._4_4_ = (float)((ulong)uVar22 >> 0x20);
          fStack_3e8c = uStack_52b0._4_4_;
          uStack_52a8._0_4_ = (float)uVar23;
          fStack_3e88 = (float)uStack_52a8;
          uStack_52a8._4_4_ = (float)((ulong)uVar23 >> 0x20);
          fStack_45c4 = uStack_52a8._4_4_;
          local_45e0 = (float)local_52c0 * (float)local_3f00;
          fStack_45dc = local_52c0._4_4_ * local_3f00._4_4_;
          fStack_45d8 = (float)uStack_52b8 * (float)uStack_3ef8;
          fStack_45d4 = uStack_52b8._4_4_ * uStack_3ef8._4_4_;
          fStack_45d0 = (float)uStack_52b0 * (float)uStack_3ef0;
          fStack_45cc = uStack_52b0._4_4_ * uStack_3ef0._4_4_;
          fStack_45c8 = (float)uStack_52a8 * (float)uStack_3ee8;
          uVar24 = local_5ca0;
          uVar25 = uStack_5c98;
          uVar26 = uStack_5c90;
          uVar27 = uStack_5c88;
          local_4600._0_4_ = (float)local_5ca0;
          local_4600._4_4_ = (float)((ulong)local_5ca0 >> 0x20);
          uStack_45f8._0_4_ = (float)uStack_5c98;
          uStack_45f8._4_4_ = (float)((ulong)uStack_5c98 >> 0x20);
          uStack_45f0._0_4_ = (float)uStack_5c90;
          uStack_45f0._4_4_ = (float)((ulong)uStack_5c90 >> 0x20);
          uStack_45e8._0_4_ = (float)uStack_5c88;
          uStack_45e8._4_4_ = (float)((ulong)uStack_5c88 >> 0x20);
          local_5ca0 = CONCAT44(fStack_45dc + local_4600._4_4_,local_45e0 + (float)local_4600);
          uStack_5c98 = CONCAT44(fStack_45d4 + uStack_45f8._4_4_,fStack_45d8 + (float)uStack_45f8);
          uStack_5c90 = CONCAT44(fStack_45cc + uStack_45f0._4_4_,fStack_45d0 + (float)uStack_45f0);
          uStack_5c88 = CONCAT44(uStack_52a8._4_4_ + uStack_45e8._4_4_,
                                 fStack_45c8 + (float)uStack_45e8);
          local_58a8 = local_5c38;
          uVar28 = *(undefined8 *)local_5c38;
          uVar29 = *(undefined8 *)(local_5c38 + 2);
          uVar30 = *(undefined8 *)(local_5c38 + 4);
          uVar31 = *(undefined8 *)(local_5c38 + 6);
          local_5360 = local_5cc0;
          uStack_5358 = uStack_5cb8;
          uStack_5350 = uStack_5cb0;
          uStack_5348 = uStack_5ca8;
          local_5320._0_4_ = (float)uVar28;
          local_3e60 = (float)local_5320;
          local_5320._4_4_ = (float)((ulong)uVar28 >> 0x20);
          fStack_3e5c = local_5320._4_4_;
          uStack_5318._0_4_ = (float)uVar29;
          fStack_3e58 = (float)uStack_5318;
          uStack_5318._4_4_ = (float)((ulong)uVar29 >> 0x20);
          fStack_3e54 = uStack_5318._4_4_;
          uStack_5310._0_4_ = (float)uVar30;
          fStack_3e50 = (float)uStack_5310;
          uStack_5310._4_4_ = (float)((ulong)uVar30 >> 0x20);
          fStack_3e4c = uStack_5310._4_4_;
          uStack_5308._0_4_ = (float)uVar31;
          fStack_3e48 = (float)uStack_5308;
          uStack_5308._4_4_ = (float)((ulong)uVar31 >> 0x20);
          fStack_4584 = uStack_5308._4_4_;
          local_45a0 = (float)local_5320 * (float)local_3f00;
          fStack_459c = local_5320._4_4_ * local_3f00._4_4_;
          fStack_4598 = (float)uStack_5318 * (float)uStack_3ef8;
          fStack_4594 = uStack_5318._4_4_ * uStack_3ef8._4_4_;
          fStack_4590 = (float)uStack_5310 * (float)uStack_3ef0;
          fStack_458c = uStack_5310._4_4_ * uStack_3ef0._4_4_;
          fStack_4588 = (float)uStack_5308 * (float)uStack_3ee8;
          uVar32 = local_5cc0;
          uVar33 = uStack_5cb8;
          uVar34 = uStack_5cb0;
          uVar35 = uStack_5ca8;
          local_45c0._0_4_ = (float)local_5cc0;
          local_45c0._4_4_ = (float)((ulong)local_5cc0 >> 0x20);
          uStack_45b8._0_4_ = (float)uStack_5cb8;
          uStack_45b8._4_4_ = (float)((ulong)uStack_5cb8 >> 0x20);
          uStack_45b0._0_4_ = (float)uStack_5cb0;
          uStack_45b0._4_4_ = (float)((ulong)uStack_5cb0 >> 0x20);
          uStack_45a8._0_4_ = (float)uStack_5ca8;
          uStack_45a8._4_4_ = (float)((ulong)uStack_5ca8 >> 0x20);
          local_5cc0 = CONCAT44(fStack_459c + local_45c0._4_4_,local_45a0 + (float)local_45c0);
          uStack_5cb8 = CONCAT44(fStack_4594 + uStack_45b8._4_4_,fStack_4598 + (float)uStack_45b8);
          uStack_5cb0 = CONCAT44(fStack_458c + uStack_45b0._4_4_,fStack_4590 + (float)uStack_45b0);
          uStack_5ca8 = CONCAT44(uStack_5308._4_4_ + uStack_45a8._4_4_,
                                 fStack_4588 + (float)uStack_45a8);
          local_58b0 = local_5c40;
          uVar36 = *(undefined8 *)local_5c40;
          uVar37 = *(undefined8 *)(local_5c40 + 2);
          uVar38 = *(undefined8 *)(local_5c40 + 4);
          uVar39 = *(undefined8 *)(local_5c40 + 6);
          local_53c0 = local_5ce0;
          uStack_53b8 = uStack_5cd8;
          uStack_53b0 = uStack_5cd0;
          uStack_53a8 = uStack_5cc8;
          local_5380._0_4_ = (float)uVar36;
          local_3e20 = (float)local_5380;
          local_5380._4_4_ = (float)((ulong)uVar36 >> 0x20);
          fStack_3e1c = local_5380._4_4_;
          uStack_5378._0_4_ = (float)uVar37;
          fStack_3e18 = (float)uStack_5378;
          uStack_5378._4_4_ = (float)((ulong)uVar37 >> 0x20);
          fStack_3e14 = uStack_5378._4_4_;
          uStack_5370._0_4_ = (float)uVar38;
          fStack_3e10 = (float)uStack_5370;
          uStack_5370._4_4_ = (float)((ulong)uVar38 >> 0x20);
          fStack_3e0c = uStack_5370._4_4_;
          uStack_5368._0_4_ = (float)uVar39;
          fStack_3e08 = (float)uStack_5368;
          uStack_5368._4_4_ = (float)((ulong)uVar39 >> 0x20);
          fStack_4544 = uStack_5368._4_4_;
          local_4560 = (float)local_5380 * (float)local_3f00;
          fStack_455c = local_5380._4_4_ * local_3f00._4_4_;
          fStack_4558 = (float)uStack_5378 * (float)uStack_3ef8;
          fStack_4554 = uStack_5378._4_4_ * uStack_3ef8._4_4_;
          fStack_4550 = (float)uStack_5370 * (float)uStack_3ef0;
          fStack_454c = uStack_5370._4_4_ * uStack_3ef0._4_4_;
          fStack_4548 = (float)uStack_5368 * (float)uStack_3ee8;
          uVar40 = local_5ce0;
          uVar41 = uStack_5cd8;
          uVar42 = uStack_5cd0;
          uVar43 = uStack_5cc8;
          local_4580._0_4_ = (float)local_5ce0;
          local_4580._4_4_ = (float)((ulong)local_5ce0 >> 0x20);
          uStack_4578._0_4_ = (float)uStack_5cd8;
          uStack_4578._4_4_ = (float)((ulong)uStack_5cd8 >> 0x20);
          uStack_4570._0_4_ = (float)uStack_5cd0;
          uStack_4570._4_4_ = (float)((ulong)uStack_5cd0 >> 0x20);
          uStack_4568._0_4_ = (float)uStack_5cc8;
          uStack_4568._4_4_ = (float)((ulong)uStack_5cc8 >> 0x20);
          local_5ce0 = CONCAT44(fStack_455c + local_4580._4_4_,local_4560 + (float)local_4580);
          uStack_5cd8 = CONCAT44(fStack_4554 + uStack_4578._4_4_,fStack_4558 + (float)uStack_4578);
          uStack_5cd0 = CONCAT44(fStack_454c + uStack_4570._4_4_,fStack_4550 + (float)uStack_4570);
          uStack_5cc8 = CONCAT44(uStack_5368._4_4_ + uStack_4568._4_4_,
                                 fStack_4548 + (float)uStack_4568);
          local_58b8 = local_5c48;
          uVar44 = *(undefined8 *)local_5c48;
          uVar45 = *(undefined8 *)(local_5c48 + 2);
          uVar46 = *(undefined8 *)(local_5c48 + 4);
          uVar47 = *(undefined8 *)(local_5c48 + 6);
          local_5420 = local_5d00;
          uStack_5418 = uStack_5cf8;
          uStack_5410 = uStack_5cf0;
          uStack_5408 = uStack_5ce8;
          local_53e0._0_4_ = (float)uVar44;
          local_3de0 = (float)local_53e0;
          local_53e0._4_4_ = (float)((ulong)uVar44 >> 0x20);
          fStack_3ddc = local_53e0._4_4_;
          uStack_53d8._0_4_ = (float)uVar45;
          fStack_3dd8 = (float)uStack_53d8;
          uStack_53d8._4_4_ = (float)((ulong)uVar45 >> 0x20);
          fStack_3dd4 = uStack_53d8._4_4_;
          uStack_53d0._0_4_ = (float)uVar46;
          fStack_3dd0 = (float)uStack_53d0;
          uStack_53d0._4_4_ = (float)((ulong)uVar46 >> 0x20);
          fStack_3dcc = uStack_53d0._4_4_;
          uStack_53c8._0_4_ = (float)uVar47;
          fStack_3dc8 = (float)uStack_53c8;
          uStack_53c8._4_4_ = (float)((ulong)uVar47 >> 0x20);
          fStack_4504 = uStack_53c8._4_4_;
          local_4520 = (float)local_53e0 * (float)local_3f00;
          fStack_451c = local_53e0._4_4_ * local_3f00._4_4_;
          fStack_4518 = (float)uStack_53d8 * (float)uStack_3ef8;
          fStack_4514 = uStack_53d8._4_4_ * uStack_3ef8._4_4_;
          fStack_4510 = (float)uStack_53d0 * (float)uStack_3ef0;
          fStack_450c = uStack_53d0._4_4_ * uStack_3ef0._4_4_;
          fStack_4508 = (float)uStack_53c8 * (float)uStack_3ee8;
          uVar48 = local_5d00;
          uVar49 = uStack_5cf8;
          uVar50 = uStack_5cf0;
          uVar51 = uStack_5ce8;
          local_4540._0_4_ = (float)local_5d00;
          local_4540._4_4_ = (float)((ulong)local_5d00 >> 0x20);
          uStack_4538._0_4_ = (float)uStack_5cf8;
          uStack_4538._4_4_ = (float)((ulong)uStack_5cf8 >> 0x20);
          uStack_4530._0_4_ = (float)uStack_5cf0;
          uStack_4530._4_4_ = (float)((ulong)uStack_5cf0 >> 0x20);
          uStack_4528._0_4_ = (float)uStack_5ce8;
          uStack_4528._4_4_ = (float)((ulong)uStack_5ce8 >> 0x20);
          local_5d00 = CONCAT44(fStack_451c + local_4540._4_4_,local_4520 + (float)local_4540);
          uStack_5cf8 = CONCAT44(fStack_4514 + uStack_4538._4_4_,fStack_4518 + (float)uStack_4538);
          uStack_5cf0 = CONCAT44(fStack_450c + uStack_4530._4_4_,fStack_4510 + (float)uStack_4530);
          uStack_5ce8 = CONCAT44(uStack_53c8._4_4_ + uStack_4528._4_4_,
                                 fStack_4508 + (float)uStack_4528);
          local_58c0 = local_5c50;
          uVar52 = *(undefined8 *)local_5c50;
          uVar53 = *(undefined8 *)(local_5c50 + 2);
          uVar54 = *(undefined8 *)(local_5c50 + 4);
          uVar55 = *(undefined8 *)(local_5c50 + 6);
          local_5480 = local_5d20;
          uStack_5478 = uStack_5d18;
          uStack_5470 = uStack_5d10;
          uStack_5468 = uStack_5d08;
          local_5440._0_4_ = (float)uVar52;
          local_3da0 = (float)local_5440;
          local_5440._4_4_ = (float)((ulong)uVar52 >> 0x20);
          fStack_3d9c = local_5440._4_4_;
          uStack_5438._0_4_ = (float)uVar53;
          fStack_3d98 = (float)uStack_5438;
          uStack_5438._4_4_ = (float)((ulong)uVar53 >> 0x20);
          fStack_3d94 = uStack_5438._4_4_;
          uStack_5430._0_4_ = (float)uVar54;
          fStack_3d90 = (float)uStack_5430;
          uStack_5430._4_4_ = (float)((ulong)uVar54 >> 0x20);
          fStack_3d8c = uStack_5430._4_4_;
          uStack_5428._0_4_ = (float)uVar55;
          fStack_3d88 = (float)uStack_5428;
          uStack_5428._4_4_ = (float)((ulong)uVar55 >> 0x20);
          fStack_44c4 = uStack_5428._4_4_;
          local_44e0 = (float)local_5440 * (float)local_3f00;
          fStack_44dc = local_5440._4_4_ * local_3f00._4_4_;
          fStack_44d8 = (float)uStack_5438 * (float)uStack_3ef8;
          fStack_44d4 = uStack_5438._4_4_ * uStack_3ef8._4_4_;
          fStack_44d0 = (float)uStack_5430 * (float)uStack_3ef0;
          fStack_44cc = uStack_5430._4_4_ * uStack_3ef0._4_4_;
          fStack_44c8 = (float)uStack_5428 * (float)uStack_3ee8;
          uVar56 = local_5d20;
          uVar57 = uStack_5d18;
          uVar58 = uStack_5d10;
          uVar59 = uStack_5d08;
          local_4500._0_4_ = (float)local_5d20;
          local_4500._4_4_ = (float)((ulong)local_5d20 >> 0x20);
          uStack_44f8._0_4_ = (float)uStack_5d18;
          uStack_44f8._4_4_ = (float)((ulong)uStack_5d18 >> 0x20);
          uStack_44f0._0_4_ = (float)uStack_5d10;
          uStack_44f0._4_4_ = (float)((ulong)uStack_5d10 >> 0x20);
          uStack_44e8._0_4_ = (float)uStack_5d08;
          uStack_44e8._4_4_ = (float)((ulong)uStack_5d08 >> 0x20);
          local_5d20 = CONCAT44(fStack_44dc + local_4500._4_4_,local_44e0 + (float)local_4500);
          uStack_5d18 = CONCAT44(fStack_44d4 + uStack_44f8._4_4_,fStack_44d8 + (float)uStack_44f8);
          uStack_5d10 = CONCAT44(fStack_44cc + uStack_44f0._4_4_,fStack_44d0 + (float)uStack_44f0);
          uStack_5d08 = CONCAT44(uStack_5428._4_4_ + uStack_44e8._4_4_,
                                 fStack_44c8 + (float)uStack_44e8);
          local_58c8 = local_5c58;
          uVar60 = *(undefined8 *)local_5c58;
          uVar61 = *(undefined8 *)(local_5c58 + 2);
          uVar62 = *(undefined8 *)(local_5c58 + 4);
          uVar63 = *(undefined8 *)(local_5c58 + 6);
          local_54e0 = local_5d40;
          uStack_54d8 = uStack_5d38;
          uStack_54d0 = uStack_5d30;
          uStack_54c8 = uStack_5d28;
          local_54a0._0_4_ = (float)uVar60;
          local_3d60 = (float)local_54a0;
          local_54a0._4_4_ = (float)((ulong)uVar60 >> 0x20);
          fStack_3d5c = local_54a0._4_4_;
          uStack_5498._0_4_ = (float)uVar61;
          fStack_3d58 = (float)uStack_5498;
          uStack_5498._4_4_ = (float)((ulong)uVar61 >> 0x20);
          fStack_3d54 = uStack_5498._4_4_;
          uStack_5490._0_4_ = (float)uVar62;
          fStack_3d50 = (float)uStack_5490;
          uStack_5490._4_4_ = (float)((ulong)uVar62 >> 0x20);
          fStack_3d4c = uStack_5490._4_4_;
          uStack_5488._0_4_ = (float)uVar63;
          fStack_3d48 = (float)uStack_5488;
          uStack_5488._4_4_ = (float)((ulong)uVar63 >> 0x20);
          fStack_4484 = uStack_5488._4_4_;
          local_44a0 = (float)local_54a0 * (float)local_3f00;
          fStack_449c = local_54a0._4_4_ * local_3f00._4_4_;
          fStack_4498 = (float)uStack_5498 * (float)uStack_3ef8;
          fStack_4494 = uStack_5498._4_4_ * uStack_3ef8._4_4_;
          fStack_4490 = (float)uStack_5490 * (float)uStack_3ef0;
          fStack_448c = uStack_5490._4_4_ * uStack_3ef0._4_4_;
          fStack_4488 = (float)uStack_5488 * (float)uStack_3ee8;
          uVar64 = local_5d40;
          uVar65 = uStack_5d38;
          uVar66 = uStack_5d30;
          uVar67 = uStack_5d28;
          local_44c0._0_4_ = (float)local_5d40;
          local_44c0._4_4_ = (float)((ulong)local_5d40 >> 0x20);
          uStack_44b8._0_4_ = (float)uStack_5d38;
          uStack_44b8._4_4_ = (float)((ulong)uStack_5d38 >> 0x20);
          uStack_44b0._0_4_ = (float)uStack_5d30;
          uStack_44b0._4_4_ = (float)((ulong)uStack_5d30 >> 0x20);
          uStack_44a8._0_4_ = (float)uStack_5d28;
          uStack_44a8._4_4_ = (float)((ulong)uStack_5d28 >> 0x20);
          local_5d40 = CONCAT44(fStack_449c + local_44c0._4_4_,local_44a0 + (float)local_44c0);
          uStack_5d38 = CONCAT44(fStack_4494 + uStack_44b8._4_4_,fStack_4498 + (float)uStack_44b8);
          uStack_5d30 = CONCAT44(fStack_448c + uStack_44b0._4_4_,fStack_4490 + (float)uStack_44b0);
          uStack_5d28 = CONCAT44(uStack_5488._4_4_ + uStack_44a8._4_4_,
                                 fStack_4488 + (float)uStack_44a8);
          local_58d0 = local_5c60;
          uVar68 = *(undefined8 *)local_5c60;
          uVar69 = *(undefined8 *)(local_5c60 + 2);
          uVar70 = *(undefined8 *)(local_5c60 + 4);
          uVar71 = *(undefined8 *)(local_5c60 + 6);
          local_5540 = local_5d60;
          uStack_5538 = uStack_5d58;
          uStack_5530 = uStack_5d50;
          uStack_5528 = uStack_5d48;
          local_5500._0_4_ = (float)uVar68;
          local_3d20 = (float)local_5500;
          local_5500._4_4_ = (float)((ulong)uVar68 >> 0x20);
          fStack_3d1c = local_5500._4_4_;
          uStack_54f8._0_4_ = (float)uVar69;
          fStack_3d18 = (float)uStack_54f8;
          uStack_54f8._4_4_ = (float)((ulong)uVar69 >> 0x20);
          fStack_3d14 = uStack_54f8._4_4_;
          uStack_54f0._0_4_ = (float)uVar70;
          fStack_3d10 = (float)uStack_54f0;
          uStack_54f0._4_4_ = (float)((ulong)uVar70 >> 0x20);
          fStack_3d0c = uStack_54f0._4_4_;
          uStack_54e8._0_4_ = (float)uVar71;
          fStack_3d08 = (float)uStack_54e8;
          uStack_54e8._4_4_ = (float)((ulong)uVar71 >> 0x20);
          fStack_4444 = uStack_54e8._4_4_;
          local_4460 = (float)local_5500 * (float)local_3f00;
          fStack_445c = local_5500._4_4_ * local_3f00._4_4_;
          fStack_4458 = (float)uStack_54f8 * (float)uStack_3ef8;
          fStack_4454 = uStack_54f8._4_4_ * uStack_3ef8._4_4_;
          fStack_4450 = (float)uStack_54f0 * (float)uStack_3ef0;
          fStack_444c = uStack_54f0._4_4_ * uStack_3ef0._4_4_;
          fStack_4448 = (float)uStack_54e8 * (float)uStack_3ee8;
          uVar72 = local_5d60;
          uVar73 = uStack_5d58;
          uVar74 = uStack_5d50;
          uVar75 = uStack_5d48;
          local_4480._0_4_ = (float)local_5d60;
          local_4480._4_4_ = (float)((ulong)local_5d60 >> 0x20);
          uStack_4478._0_4_ = (float)uStack_5d58;
          uStack_4478._4_4_ = (float)((ulong)uStack_5d58 >> 0x20);
          uStack_4470._0_4_ = (float)uStack_5d50;
          uStack_4470._4_4_ = (float)((ulong)uStack_5d50 >> 0x20);
          uStack_4468._0_4_ = (float)uStack_5d48;
          uStack_4468._4_4_ = (float)((ulong)uStack_5d48 >> 0x20);
          local_5d60 = CONCAT44(fStack_445c + local_4480._4_4_,local_4460 + (float)local_4480);
          uStack_5d58 = CONCAT44(fStack_4454 + uStack_4478._4_4_,fStack_4458 + (float)uStack_4478);
          uStack_5d50 = CONCAT44(fStack_444c + uStack_4470._4_4_,fStack_4450 + (float)uStack_4470);
          uStack_5d48 = CONCAT44(uStack_54e8._4_4_ + uStack_4468._4_4_,
                                 fStack_4448 + (float)uStack_4468);
          local_5ba0 = local_5ba0 + 8;
          local_5c28 = local_5c28 + 8;
          local_5c30 = local_5c30 + 8;
          local_5c38 = local_5c38 + 8;
          local_5c40 = local_5c40 + 8;
          local_5c48 = local_5c48 + 8;
          local_5c50 = local_5c50 + 8;
          local_5c58 = local_5c58 + 8;
          local_5c60 = local_5c60 + 8;
          local_5520 = local_5de0;
          uStack_5518 = uStack_5dd8;
          uStack_5510 = uStack_5dd0;
          uStack_5508 = uStack_5dc8;
          local_5500 = uVar68;
          uStack_54f8 = uVar69;
          uStack_54f0 = uVar70;
          uStack_54e8 = uVar71;
          local_54c0 = local_5de0;
          uStack_54b8 = uStack_5dd8;
          uStack_54b0 = uStack_5dd0;
          uStack_54a8 = uStack_5dc8;
          local_54a0 = uVar60;
          uStack_5498 = uVar61;
          uStack_5490 = uVar62;
          uStack_5488 = uVar63;
          local_5460 = local_5de0;
          uStack_5458 = uStack_5dd8;
          uStack_5450 = uStack_5dd0;
          uStack_5448 = uStack_5dc8;
          local_5440 = uVar52;
          uStack_5438 = uVar53;
          uStack_5430 = uVar54;
          uStack_5428 = uVar55;
          local_5400 = local_5de0;
          uStack_53f8 = uStack_5dd8;
          uStack_53f0 = uStack_5dd0;
          uStack_53e8 = uStack_5dc8;
          local_53e0 = uVar44;
          uStack_53d8 = uVar45;
          uStack_53d0 = uVar46;
          uStack_53c8 = uVar47;
          local_53a0 = local_5de0;
          uStack_5398 = uStack_5dd8;
          uStack_5390 = uStack_5dd0;
          uStack_5388 = uStack_5dc8;
          local_5380 = uVar36;
          uStack_5378 = uVar37;
          uStack_5370 = uVar38;
          uStack_5368 = uVar39;
          local_5340 = local_5de0;
          uStack_5338 = uStack_5dd8;
          uStack_5330 = uStack_5dd0;
          uStack_5328 = uStack_5dc8;
          local_5320 = uVar28;
          uStack_5318 = uVar29;
          uStack_5310 = uVar30;
          uStack_5308 = uVar31;
          local_52e0 = local_5de0;
          uStack_52d8 = uStack_5dd8;
          uStack_52d0 = uStack_5dd0;
          uStack_52c8 = uStack_5dc8;
          local_52c0 = uVar20;
          uStack_52b8 = uVar21;
          uStack_52b0 = uVar22;
          uStack_52a8 = uVar23;
          local_5280 = local_5de0;
          uStack_5278 = uStack_5dd8;
          uStack_5270 = uStack_5dd0;
          uStack_5268 = uStack_5dc8;
          local_5260 = uVar12;
          uStack_5258 = uVar13;
          uStack_5250 = uVar14;
          uStack_5248 = uVar15;
          local_4640 = uVar16;
          uStack_4638 = uVar17;
          uStack_4630 = uVar18;
          uStack_4628 = uVar19;
          local_4600 = uVar24;
          uStack_45f8 = uVar25;
          uStack_45f0 = uVar26;
          uStack_45e8 = uVar27;
          local_45c0 = uVar32;
          uStack_45b8 = uVar33;
          uStack_45b0 = uVar34;
          uStack_45a8 = uVar35;
          local_4580 = uVar40;
          uStack_4578 = uVar41;
          uStack_4570 = uVar42;
          uStack_4568 = uVar43;
          local_4540 = uVar48;
          uStack_4538 = uVar49;
          uStack_4530 = uVar50;
          uStack_4528 = uVar51;
          local_4500 = uVar56;
          uStack_44f8 = uVar57;
          uStack_44f0 = uVar58;
          uStack_44e8 = uVar59;
          local_44c0 = uVar64;
          uStack_44b8 = uVar65;
          uStack_44b0 = uVar66;
          uStack_44a8 = uVar67;
          local_4480 = uVar72;
          uStack_4478 = uVar73;
          uStack_4470 = uVar74;
          uStack_4468 = uVar75;
          local_3f00 = local_5de0;
          uStack_3ef8 = uStack_5dd8;
          uStack_3ef0 = uStack_5dd0;
          uStack_3ee8 = uStack_5dc8;
          fStack_3ec4 = fStack_4604;
          local_3ec0 = local_5de0;
          uStack_3eb8 = uStack_5dd8;
          uStack_3eb0 = uStack_5dd0;
          uStack_3ea8 = uStack_5dc8;
          fStack_3e84 = fStack_45c4;
          local_3e80 = local_5de0;
          uStack_3e78 = uStack_5dd8;
          uStack_3e70 = uStack_5dd0;
          uStack_3e68 = uStack_5dc8;
          fStack_3e44 = fStack_4584;
          local_3e40 = local_5de0;
          uStack_3e38 = uStack_5dd8;
          uStack_3e30 = uStack_5dd0;
          uStack_3e28 = uStack_5dc8;
          fStack_3e04 = fStack_4544;
          local_3e00 = local_5de0;
          uStack_3df8 = uStack_5dd8;
          uStack_3df0 = uStack_5dd0;
          uStack_3de8 = uStack_5dc8;
          fStack_3dc4 = fStack_4504;
          local_3dc0 = local_5de0;
          uStack_3db8 = uStack_5dd8;
          uStack_3db0 = uStack_5dd0;
          uStack_3da8 = uStack_5dc8;
          fStack_3d84 = fStack_44c4;
          local_3d80 = local_5de0;
          uStack_3d78 = uStack_5dd8;
          uStack_3d70 = uStack_5dd0;
          uStack_3d68 = uStack_5dc8;
          fStack_3d44 = fStack_4484;
          local_3d40 = local_5de0;
          uStack_3d38 = uStack_5dd8;
          uStack_3d30 = uStack_5dd0;
          uStack_3d28 = uStack_5dc8;
          fStack_3d04 = fStack_4444;
        }
        local_4e48 = &local_5e00;
        local_4d08 = &local_5c80;
        local_4d10 = &local_5ca0;
        local_4d18 = &local_5cc0;
        local_4d20 = &local_5ce0;
        local_4d28 = &local_5d00;
        local_4d30 = &local_5d20;
        local_4d38 = &local_5d40;
        local_4d40 = &local_5d60;
        local_3820 = local_5c80;
        uStack_3818 = uStack_5c78;
        uStack_3810 = uStack_5c70;
        uStack_3808 = uStack_5c68;
        auVar143._8_8_ = uStack_5c78;
        auVar143._0_8_ = local_5c80;
        auVar143._16_8_ = uStack_5c70;
        auVar143._24_8_ = uStack_5c68;
        local_3840 = local_5ca0;
        uStack_3838 = uStack_5c98;
        uStack_3830 = uStack_5c90;
        uStack_3828 = uStack_5c88;
        auVar142._8_8_ = uStack_5c98;
        auVar142._0_8_ = local_5ca0;
        auVar142._16_8_ = uStack_5c90;
        auVar142._24_8_ = uStack_5c88;
        local_4d60 = vhaddps_avx(auVar143,auVar142);
        local_3860 = local_5cc0;
        uStack_3858 = uStack_5cb8;
        uStack_3850 = uStack_5cb0;
        uStack_3848 = uStack_5ca8;
        auVar141._8_8_ = uStack_5cb8;
        auVar141._0_8_ = local_5cc0;
        auVar141._16_8_ = uStack_5cb0;
        auVar141._24_8_ = uStack_5ca8;
        local_3880 = local_5ce0;
        uStack_3878 = uStack_5cd8;
        uStack_3870 = uStack_5cd0;
        uStack_3868 = uStack_5cc8;
        auVar10._8_8_ = uStack_5cd8;
        auVar10._0_8_ = local_5ce0;
        auVar10._16_8_ = uStack_5cd0;
        auVar10._24_8_ = uStack_5cc8;
        local_4d80 = vhaddps_avx(auVar141,auVar10);
        local_38a0 = local_5d00;
        uStack_3898 = uStack_5cf8;
        uStack_3890 = uStack_5cf0;
        uStack_3888 = uStack_5ce8;
        auVar9._8_8_ = uStack_5cf8;
        auVar9._0_8_ = local_5d00;
        auVar9._16_8_ = uStack_5cf0;
        auVar9._24_8_ = uStack_5ce8;
        local_38c0 = local_5d20;
        uStack_38b8 = uStack_5d18;
        uStack_38b0 = uStack_5d10;
        uStack_38a8 = uStack_5d08;
        auVar8._8_8_ = uStack_5d18;
        auVar8._0_8_ = local_5d20;
        auVar8._16_8_ = uStack_5d10;
        auVar8._24_8_ = uStack_5d08;
        local_4da0 = vhaddps_avx(auVar9,auVar8);
        local_38e0 = local_5d40;
        uStack_38d8 = uStack_5d38;
        uStack_38d0 = uStack_5d30;
        uStack_38c8 = uStack_5d28;
        auVar7._8_8_ = uStack_5d38;
        auVar7._0_8_ = local_5d40;
        auVar7._16_8_ = uStack_5d30;
        auVar7._24_8_ = uStack_5d28;
        local_3900 = local_5d60;
        uStack_38f8 = uStack_5d58;
        uStack_38f0 = uStack_5d50;
        uStack_38e8 = uStack_5d48;
        auVar11._8_8_ = uStack_5d58;
        auVar11._0_8_ = local_5d60;
        auVar11._16_8_ = uStack_5d50;
        auVar11._24_8_ = uStack_5d48;
        local_4dc0 = vhaddps_avx(auVar7,auVar11);
        local_3920 = local_4d60._0_8_;
        uStack_3918 = local_4d60._8_8_;
        uStack_3910 = local_4d60._16_8_;
        uStack_3908 = local_4d60._24_8_;
        local_3940 = local_4d80._0_8_;
        uStack_3938 = local_4d80._8_8_;
        uStack_3930 = local_4d80._16_8_;
        uStack_3928 = local_4d80._24_8_;
        local_4de0 = vhaddps_avx(local_4d60,local_4d80);
        local_3960 = local_4da0._0_8_;
        uStack_3958 = local_4da0._8_8_;
        uStack_3950 = local_4da0._16_8_;
        uStack_3948 = local_4da0._24_8_;
        local_3980 = local_4dc0._0_8_;
        uStack_3978 = local_4dc0._8_8_;
        uStack_3970 = local_4dc0._16_8_;
        uStack_3968 = local_4dc0._24_8_;
        local_4e00 = vhaddps_avx(local_4da0,local_4dc0);
        local_4e20 = vblendps_avx(local_4de0,local_4e00,0xf0);
        local_4e40 = vperm2f128_avx(local_4de0,local_4e00,0x21);
        local_4880 = local_4e40._0_8_;
        uVar12 = local_4880;
        uStack_4878 = local_4e40._8_8_;
        uVar13 = uStack_4878;
        uStack_4870 = local_4e40._16_8_;
        uVar14 = uStack_4870;
        uStack_4868 = local_4e40._24_8_;
        uVar15 = uStack_4868;
        local_4860._0_4_ = local_4e20._0_4_;
        local_4860._4_4_ = local_4e20._4_4_;
        fStack_4858 = local_4e20._8_4_;
        fStack_4854 = local_4e20._12_4_;
        fStack_4850 = local_4e20._16_4_;
        fStack_484c = local_4e20._20_4_;
        fStack_4848 = local_4e20._24_4_;
        fStack_4844 = local_4e20._28_4_;
        local_4880._0_4_ = local_4e40._0_4_;
        local_4880._4_4_ = local_4e40._4_4_;
        uStack_4878._0_4_ = local_4e40._8_4_;
        uStack_4878._4_4_ = local_4e40._12_4_;
        uStack_4870._0_4_ = local_4e40._16_4_;
        uStack_4870._4_4_ = local_4e40._20_4_;
        uStack_4868._0_4_ = local_4e40._24_4_;
        uStack_4868._4_4_ = local_4e40._28_4_;
        local_4e80 = CONCAT44((float)local_4860._4_4_ + local_4880._4_4_,
                              (float)local_4860._0_4_ + (float)local_4880);
        uStack_4e78 = CONCAT44(fStack_4854 + uStack_4878._4_4_,fStack_4858 + (float)uStack_4878);
        uStack_4e70 = CONCAT44(fStack_484c + uStack_4870._4_4_,fStack_4850 + (float)uStack_4870);
        uStack_4e68 = CONCAT44(fStack_4844 + uStack_4868._4_4_,fStack_4848 + (float)uStack_4868);
        local_5e00 = local_5ba8[local_5b90] + (float)local_4860._0_4_ + (float)local_4880;
        fStack_5dfc = local_5bb0[local_5b90] + (float)local_4860._4_4_ + local_4880._4_4_;
        fStack_5df8 = local_5bb8[local_5b90] + fStack_4858 + (float)uStack_4878;
        fStack_5df4 = local_5bc0[local_5b90] + fStack_4854 + uStack_4878._4_4_;
        fStack_5df0 = local_5ba8[local_5b90 + 1] + fStack_4850 + (float)uStack_4870;
        fStack_5dec = local_5bb0[local_5b90 + 1] + fStack_484c + uStack_4870._4_4_;
        fStack_5de8 = local_5bb8[local_5b90 + 1] + fStack_4848 + (float)uStack_4868;
        fStack_5de4 = local_5bc0[local_5b90 + 1] + fStack_4844 + uStack_4868._4_4_;
        for (; 0 < (int)local_5d68; local_5d68 = local_5d68 - 1) {
          local_5e04 = *local_5b98;
          local_5e00 = *local_5be8 * local_5e04 + local_5e00;
          fStack_5dfc = *local_5bf0 * local_5e04 + fStack_5dfc;
          fStack_5df8 = *local_5bf8 * local_5e04 + fStack_5df8;
          fStack_5df4 = *local_5c00 * local_5e04 + fStack_5df4;
          fStack_5df0 = *local_5c08 * local_5e04 + fStack_5df0;
          fStack_5dec = *local_5c10 * local_5e04 + fStack_5dec;
          fStack_5de8 = *local_5c18 * local_5e04 + fStack_5de8;
          fStack_5de4 = *local_5c20 * local_5e04 + fStack_5de4;
          local_5b98 = local_5b98 + 1;
          local_5be8 = local_5be8 + 1;
          local_5bf0 = local_5bf0 + 1;
          local_5bf8 = local_5bf8 + 1;
          local_5c00 = local_5c00 + 1;
          local_5c08 = local_5c08 + 1;
          local_5c10 = local_5c10 + 1;
          local_5c18 = local_5c18 + 1;
          local_5c20 = local_5c20 + 1;
        }
        for (; 0 < (int)local_5da8; local_5da8 = local_5da8 - 1) {
          local_5e08 = *local_5ba0;
          local_5e00 = *local_5c28 * local_5e08 + local_5e00;
          fStack_5dfc = *local_5c30 * local_5e08 + fStack_5dfc;
          fStack_5df8 = *local_5c38 * local_5e08 + fStack_5df8;
          fStack_5df4 = *local_5c40 * local_5e08 + fStack_5df4;
          fStack_5df0 = *local_5c48 * local_5e08 + fStack_5df0;
          fStack_5dec = *local_5c50 * local_5e08 + fStack_5dec;
          fStack_5de8 = *local_5c58 * local_5e08 + fStack_5de8;
          fStack_5de4 = *local_5c60 * local_5e08 + fStack_5de4;
          local_5ba0 = local_5ba0 + 1;
          local_5c28 = local_5c28 + 1;
          local_5c30 = local_5c30 + 1;
          local_5c38 = local_5c38 + 1;
          local_5c40 = local_5c40 + 1;
          local_5c48 = local_5c48 + 1;
          local_5c50 = local_5c50 + 1;
          local_5c58 = local_5c58 + 1;
          local_5c60 = local_5c60 + 1;
        }
        local_5bc8[local_5b90] = local_5e00;
        local_5bd0[local_5b90] = fStack_5dfc;
        local_5bd8[local_5b90] = fStack_5df8;
        local_5be0[local_5b90] = fStack_5df4;
        local_5bc8[local_5b90 + 1] = fStack_5df0;
        local_5bd0[local_5b90 + 1] = fStack_5dec;
        local_5bd8[local_5b90 + 1] = fStack_5de8;
        local_5be0[local_5b90 + 1] = fStack_5de4;
        local_5a60 = ZEXT832(0) << 0x20;
        local_5a40 = ZEXT832(0) << 0x20;
        local_5a20 = ZEXT832(0) << 0x20;
        local_5a00 = ZEXT832(0) << 0x20;
        local_59e0 = ZEXT832(0) << 0x20;
        local_59c0 = ZEXT832(0) << 0x20;
        local_59a0 = ZEXT832(0) << 0x20;
        local_4880 = uVar12;
        uStack_4878 = uVar13;
        uStack_4870 = uVar14;
        uStack_4868 = uVar15;
        _local_4860 = local_4e20;
      }
      for (local_5e0c = local_5b8c; local_5e0c < (int)local_5b24; local_5e0c = local_5e0c + 1) {
        local_5e18 = Mat::row(local_5af0,local_5b88);
        local_5e20 = Mat::operator_cast_to_float_(in_stack_00000008);
        local_5e28 = Mat::row(local_5b10,0);
        local_5e30 = Mat::row(local_5b10,1);
        local_5e38 = Mat::row(local_5b10,2);
        local_5e40 = Mat::row(local_5b10,3);
        local_5e48 = Mat::row(&local_5b70,0);
        local_5e50 = Mat::row(&local_5b70,1);
        local_5e58 = Mat::row(&local_5b70,2);
        local_5e60 = Mat::row(&local_5b70,3);
        local_5e68 = Mat::row(local_5b08,local_5e0c);
        local_5e70 = Mat::row(local_5b08,local_5b24 + local_5e0c);
        local_5e78 = Mat::row(local_5b08,local_5e0c + local_5b24 * 2);
        local_5e80 = Mat::row(local_5b08,local_5b24 * 3 + local_5e0c);
        local_5e88 = Mat::row(local_5b18,local_5e0c);
        local_5e90 = Mat::row(local_5b18,local_5b24 + local_5e0c);
        local_5e98 = Mat::row(local_5b18,local_5e0c + local_5b24 * 2);
        local_5ea0 = Mat::row(local_5b18,local_5b24 * 3 + local_5e0c);
        local_5a80 = 0;
        uStack_5a78 = 0;
        uStack_5a70 = 0;
        uStack_5a68 = 0;
        local_5ec0 = 0;
        uStack_5eb8 = 0;
        uStack_5eb0 = 0;
        uStack_5ea8 = 0;
        local_5aa0._8_8_ = SUB328(ZEXT832(0),4);
        local_5ee0 = 0;
        uStack_5ed8 = local_5aa0._8_8_;
        uStack_5ed0 = 0;
        uStack_5ec8 = 0;
        local_5ac0._8_8_ = SUB328(ZEXT832(0),4);
        local_5f00 = 0;
        uStack_5ef8 = local_5ac0._8_8_;
        uStack_5ef0 = 0;
        uStack_5ee8 = 0;
        local_5ae0._8_8_ = SUB328(ZEXT832(0),4);
        local_5f20 = 0;
        uStack_5f18 = local_5ae0._8_8_;
        uStack_5f10 = 0;
        uStack_5f08 = 0;
        local_5f28 = local_5b1c & 7;
        for (local_5f24 = (int)local_5b1c >> 3; 0 < local_5f24; local_5f24 = local_5f24 + -1) {
          local_58d8 = local_5e18;
          local_5f60 = *(undefined8 *)local_5e18;
          uStack_5f58 = *(undefined8 *)(local_5e18 + 2);
          uStack_5f50 = *(undefined8 *)(local_5e18 + 4);
          uStack_5f48 = *(undefined8 *)(local_5e18 + 6);
          local_58e0 = local_5e68;
          uVar12 = *(undefined8 *)local_5e68;
          uVar13 = *(undefined8 *)(local_5e68 + 2);
          uVar14 = *(undefined8 *)(local_5e68 + 4);
          uVar15 = *(undefined8 *)(local_5e68 + 6);
          local_55a0 = local_5ec0;
          uStack_5598 = uStack_5eb8;
          uStack_5590 = uStack_5eb0;
          uStack_5588 = uStack_5ea8;
          local_5560._0_4_ = (float)uVar12;
          local_3ce0 = (float)local_5560;
          local_5560._4_4_ = (float)((ulong)uVar12 >> 0x20);
          fStack_3cdc = local_5560._4_4_;
          uStack_5558._0_4_ = (float)uVar13;
          fStack_3cd8 = (float)uStack_5558;
          uStack_5558._4_4_ = (float)((ulong)uVar13 >> 0x20);
          fStack_3cd4 = uStack_5558._4_4_;
          uStack_5550._0_4_ = (float)uVar14;
          fStack_3cd0 = (float)uStack_5550;
          uStack_5550._4_4_ = (float)((ulong)uVar14 >> 0x20);
          fStack_3ccc = uStack_5550._4_4_;
          uStack_5548._0_4_ = (float)uVar15;
          fStack_3cc8 = (float)uStack_5548;
          uStack_5548._4_4_ = (float)((ulong)uVar15 >> 0x20);
          fStack_4404 = uStack_5548._4_4_;
          local_3d00._0_4_ = (float)local_5f60;
          local_3d00._4_4_ = (float)((ulong)local_5f60 >> 0x20);
          uStack_3cf8._0_4_ = (float)uStack_5f58;
          uStack_3cf8._4_4_ = (float)((ulong)uStack_5f58 >> 0x20);
          uStack_3cf0._0_4_ = (float)uStack_5f50;
          uStack_3cf0._4_4_ = (float)((ulong)uStack_5f50 >> 0x20);
          uStack_3ce8._0_4_ = (float)uStack_5f48;
          local_4420 = (float)local_5560 * (float)local_3d00;
          fStack_441c = local_5560._4_4_ * local_3d00._4_4_;
          fStack_4418 = (float)uStack_5558 * (float)uStack_3cf8;
          fStack_4414 = uStack_5558._4_4_ * uStack_3cf8._4_4_;
          fStack_4410 = (float)uStack_5550 * (float)uStack_3cf0;
          fStack_440c = uStack_5550._4_4_ * uStack_3cf0._4_4_;
          fStack_4408 = (float)uStack_5548 * (float)uStack_3ce8;
          uVar16 = local_5ec0;
          uVar17 = uStack_5eb8;
          uVar18 = uStack_5eb0;
          uVar19 = uStack_5ea8;
          local_4440._0_4_ = (float)local_5ec0;
          local_4440._4_4_ = (float)((ulong)local_5ec0 >> 0x20);
          uStack_4438._0_4_ = (float)uStack_5eb8;
          uStack_4438._4_4_ = (float)((ulong)uStack_5eb8 >> 0x20);
          uStack_4430._0_4_ = (float)uStack_5eb0;
          uStack_4430._4_4_ = (float)((ulong)uStack_5eb0 >> 0x20);
          uStack_4428._0_4_ = (float)uStack_5ea8;
          uStack_4428._4_4_ = (float)((ulong)uStack_5ea8 >> 0x20);
          local_5ec0 = CONCAT44(fStack_441c + local_4440._4_4_,local_4420 + (float)local_4440);
          uStack_5eb8 = CONCAT44(fStack_4414 + uStack_4438._4_4_,fStack_4418 + (float)uStack_4438);
          uStack_5eb0 = CONCAT44(fStack_440c + uStack_4430._4_4_,fStack_4410 + (float)uStack_4430);
          uStack_5ea8 = CONCAT44(uStack_5548._4_4_ + uStack_4428._4_4_,
                                 fStack_4408 + (float)uStack_4428);
          local_58e8 = local_5e70;
          uVar20 = *(undefined8 *)local_5e70;
          uVar21 = *(undefined8 *)(local_5e70 + 2);
          uVar22 = *(undefined8 *)(local_5e70 + 4);
          uVar23 = *(undefined8 *)(local_5e70 + 6);
          local_5600 = local_5ee0;
          uStack_55f8 = uStack_5ed8;
          uStack_55f0 = uStack_5ed0;
          uStack_55e8 = uStack_5ec8;
          local_55c0._0_4_ = (float)uVar20;
          local_3ca0 = (float)local_55c0;
          local_55c0._4_4_ = (float)((ulong)uVar20 >> 0x20);
          fStack_3c9c = local_55c0._4_4_;
          uStack_55b8._0_4_ = (float)uVar21;
          fStack_3c98 = (float)uStack_55b8;
          uStack_55b8._4_4_ = (float)((ulong)uVar21 >> 0x20);
          fStack_3c94 = uStack_55b8._4_4_;
          uStack_55b0._0_4_ = (float)uVar22;
          fStack_3c90 = (float)uStack_55b0;
          uStack_55b0._4_4_ = (float)((ulong)uVar22 >> 0x20);
          fStack_3c8c = uStack_55b0._4_4_;
          uStack_55a8._0_4_ = (float)uVar23;
          fStack_3c88 = (float)uStack_55a8;
          uStack_55a8._4_4_ = (float)((ulong)uVar23 >> 0x20);
          fStack_43c4 = uStack_55a8._4_4_;
          local_43e0 = (float)local_55c0 * (float)local_3d00;
          fStack_43dc = local_55c0._4_4_ * local_3d00._4_4_;
          fStack_43d8 = (float)uStack_55b8 * (float)uStack_3cf8;
          fStack_43d4 = uStack_55b8._4_4_ * uStack_3cf8._4_4_;
          fStack_43d0 = (float)uStack_55b0 * (float)uStack_3cf0;
          fStack_43cc = uStack_55b0._4_4_ * uStack_3cf0._4_4_;
          fStack_43c8 = (float)uStack_55a8 * (float)uStack_3ce8;
          uVar24 = local_5ee0;
          uVar25 = uStack_5ed8;
          uVar26 = uStack_5ed0;
          uVar27 = uStack_5ec8;
          local_4400._0_4_ = (float)local_5ee0;
          local_4400._4_4_ = (float)((ulong)local_5ee0 >> 0x20);
          uStack_43f8._0_4_ = (float)uStack_5ed8;
          uStack_43f8._4_4_ = (float)((ulong)uStack_5ed8 >> 0x20);
          uStack_43f0._0_4_ = (float)uStack_5ed0;
          uStack_43f0._4_4_ = (float)((ulong)uStack_5ed0 >> 0x20);
          uStack_43e8._0_4_ = (float)uStack_5ec8;
          uStack_43e8._4_4_ = (float)((ulong)uStack_5ec8 >> 0x20);
          local_5ee0 = CONCAT44(fStack_43dc + local_4400._4_4_,local_43e0 + (float)local_4400);
          uStack_5ed8 = CONCAT44(fStack_43d4 + uStack_43f8._4_4_,fStack_43d8 + (float)uStack_43f8);
          uStack_5ed0 = CONCAT44(fStack_43cc + uStack_43f0._4_4_,fStack_43d0 + (float)uStack_43f0);
          uStack_5ec8 = CONCAT44(uStack_55a8._4_4_ + uStack_43e8._4_4_,
                                 fStack_43c8 + (float)uStack_43e8);
          local_58f0 = local_5e78;
          uVar28 = *(undefined8 *)local_5e78;
          uVar29 = *(undefined8 *)(local_5e78 + 2);
          uVar30 = *(undefined8 *)(local_5e78 + 4);
          uVar31 = *(undefined8 *)(local_5e78 + 6);
          local_5660 = local_5f00;
          uStack_5658 = uStack_5ef8;
          uStack_5650 = uStack_5ef0;
          uStack_5648 = uStack_5ee8;
          local_5620._0_4_ = (float)uVar28;
          local_3c60 = (float)local_5620;
          local_5620._4_4_ = (float)((ulong)uVar28 >> 0x20);
          fStack_3c5c = local_5620._4_4_;
          uStack_5618._0_4_ = (float)uVar29;
          fStack_3c58 = (float)uStack_5618;
          uStack_5618._4_4_ = (float)((ulong)uVar29 >> 0x20);
          fStack_3c54 = uStack_5618._4_4_;
          uStack_5610._0_4_ = (float)uVar30;
          fStack_3c50 = (float)uStack_5610;
          uStack_5610._4_4_ = (float)((ulong)uVar30 >> 0x20);
          fStack_3c4c = uStack_5610._4_4_;
          uStack_5608._0_4_ = (float)uVar31;
          fStack_3c48 = (float)uStack_5608;
          uStack_5608._4_4_ = (float)((ulong)uVar31 >> 0x20);
          fStack_4384 = uStack_5608._4_4_;
          local_43a0 = (float)local_5620 * (float)local_3d00;
          fStack_439c = local_5620._4_4_ * local_3d00._4_4_;
          fStack_4398 = (float)uStack_5618 * (float)uStack_3cf8;
          fStack_4394 = uStack_5618._4_4_ * uStack_3cf8._4_4_;
          fStack_4390 = (float)uStack_5610 * (float)uStack_3cf0;
          fStack_438c = uStack_5610._4_4_ * uStack_3cf0._4_4_;
          fStack_4388 = (float)uStack_5608 * (float)uStack_3ce8;
          uVar32 = local_5f00;
          uVar33 = uStack_5ef8;
          uVar34 = uStack_5ef0;
          uVar35 = uStack_5ee8;
          local_43c0._0_4_ = (float)local_5f00;
          local_43c0._4_4_ = (float)((ulong)local_5f00 >> 0x20);
          uStack_43b8._0_4_ = (float)uStack_5ef8;
          uStack_43b8._4_4_ = (float)((ulong)uStack_5ef8 >> 0x20);
          uStack_43b0._0_4_ = (float)uStack_5ef0;
          uStack_43b0._4_4_ = (float)((ulong)uStack_5ef0 >> 0x20);
          uStack_43a8._0_4_ = (float)uStack_5ee8;
          uStack_43a8._4_4_ = (float)((ulong)uStack_5ee8 >> 0x20);
          local_5f00 = CONCAT44(fStack_439c + local_43c0._4_4_,local_43a0 + (float)local_43c0);
          uStack_5ef8 = CONCAT44(fStack_4394 + uStack_43b8._4_4_,fStack_4398 + (float)uStack_43b8);
          uStack_5ef0 = CONCAT44(fStack_438c + uStack_43b0._4_4_,fStack_4390 + (float)uStack_43b0);
          uStack_5ee8 = CONCAT44(uStack_5608._4_4_ + uStack_43a8._4_4_,
                                 fStack_4388 + (float)uStack_43a8);
          local_58f8 = local_5e80;
          uVar36 = *(undefined8 *)local_5e80;
          uVar37 = *(undefined8 *)(local_5e80 + 2);
          uVar38 = *(undefined8 *)(local_5e80 + 4);
          uVar39 = *(undefined8 *)(local_5e80 + 6);
          local_56c0 = local_5f20;
          uStack_56b8 = uStack_5f18;
          uStack_56b0 = uStack_5f10;
          uStack_56a8 = uStack_5f08;
          local_5680._0_4_ = (float)uVar36;
          local_3c20 = (float)local_5680;
          local_5680._4_4_ = (float)((ulong)uVar36 >> 0x20);
          fStack_3c1c = local_5680._4_4_;
          uStack_5678._0_4_ = (float)uVar37;
          fStack_3c18 = (float)uStack_5678;
          uStack_5678._4_4_ = (float)((ulong)uVar37 >> 0x20);
          fStack_3c14 = uStack_5678._4_4_;
          uStack_5670._0_4_ = (float)uVar38;
          fStack_3c10 = (float)uStack_5670;
          uStack_5670._4_4_ = (float)((ulong)uVar38 >> 0x20);
          fStack_3c0c = uStack_5670._4_4_;
          uStack_5668._0_4_ = (float)uVar39;
          fStack_3c08 = (float)uStack_5668;
          uStack_5668._4_4_ = (float)((ulong)uVar39 >> 0x20);
          fStack_4344 = uStack_5668._4_4_;
          local_4360 = (float)local_5680 * (float)local_3d00;
          fStack_435c = local_5680._4_4_ * local_3d00._4_4_;
          fStack_4358 = (float)uStack_5678 * (float)uStack_3cf8;
          fStack_4354 = uStack_5678._4_4_ * uStack_3cf8._4_4_;
          fStack_4350 = (float)uStack_5670 * (float)uStack_3cf0;
          fStack_434c = uStack_5670._4_4_ * uStack_3cf0._4_4_;
          fStack_4348 = (float)uStack_5668 * (float)uStack_3ce8;
          uVar40 = local_5f20;
          uVar41 = uStack_5f18;
          uVar42 = uStack_5f10;
          uVar43 = uStack_5f08;
          local_4380._0_4_ = (float)local_5f20;
          local_4380._4_4_ = (float)((ulong)local_5f20 >> 0x20);
          uStack_4378._0_4_ = (float)uStack_5f18;
          uStack_4378._4_4_ = (float)((ulong)uStack_5f18 >> 0x20);
          uStack_4370._0_4_ = (float)uStack_5f10;
          uStack_4370._4_4_ = (float)((ulong)uStack_5f10 >> 0x20);
          uStack_4368._0_4_ = (float)uStack_5f08;
          uStack_4368._4_4_ = (float)((ulong)uStack_5f08 >> 0x20);
          local_5f20 = CONCAT44(fStack_435c + local_4380._4_4_,local_4360 + (float)local_4380);
          uStack_5f18 = CONCAT44(fStack_4354 + uStack_4378._4_4_,fStack_4358 + (float)uStack_4378);
          uStack_5f10 = CONCAT44(fStack_434c + uStack_4370._4_4_,fStack_4350 + (float)uStack_4370);
          uStack_5f08 = CONCAT44(uStack_5668._4_4_ + uStack_4368._4_4_,
                                 fStack_4348 + (float)uStack_4368);
          local_5e18 = local_5e18 + 8;
          local_5e68 = local_5e68 + 8;
          local_5e70 = local_5e70 + 8;
          local_5e78 = local_5e78 + 8;
          local_5e80 = local_5e80 + 8;
          local_56a0 = local_5f60;
          uStack_5698 = uStack_5f58;
          uStack_5690 = uStack_5f50;
          uStack_5688 = uStack_5f48;
          local_5680 = uVar36;
          uStack_5678 = uVar37;
          uStack_5670 = uVar38;
          uStack_5668 = uVar39;
          local_5640 = local_5f60;
          uStack_5638 = uStack_5f58;
          uStack_5630 = uStack_5f50;
          uStack_5628 = uStack_5f48;
          local_5620 = uVar28;
          uStack_5618 = uVar29;
          uStack_5610 = uVar30;
          uStack_5608 = uVar31;
          local_55e0 = local_5f60;
          uStack_55d8 = uStack_5f58;
          uStack_55d0 = uStack_5f50;
          uStack_55c8 = uStack_5f48;
          local_55c0 = uVar20;
          uStack_55b8 = uVar21;
          uStack_55b0 = uVar22;
          uStack_55a8 = uVar23;
          local_5580 = local_5f60;
          uStack_5578 = uStack_5f58;
          uStack_5570 = uStack_5f50;
          uStack_5568 = uStack_5f48;
          local_5560 = uVar12;
          uStack_5558 = uVar13;
          uStack_5550 = uVar14;
          uStack_5548 = uVar15;
          local_4440 = uVar16;
          uStack_4438 = uVar17;
          uStack_4430 = uVar18;
          uStack_4428 = uVar19;
          local_4400 = uVar24;
          uStack_43f8 = uVar25;
          uStack_43f0 = uVar26;
          uStack_43e8 = uVar27;
          local_43c0 = uVar32;
          uStack_43b8 = uVar33;
          uStack_43b0 = uVar34;
          uStack_43a8 = uVar35;
          local_4380 = uVar40;
          uStack_4378 = uVar41;
          uStack_4370 = uVar42;
          uStack_4368 = uVar43;
          local_3d00 = local_5f60;
          uStack_3cf8 = uStack_5f58;
          uStack_3cf0 = uStack_5f50;
          uStack_3ce8 = uStack_5f48;
          fStack_3cc4 = fStack_4404;
          local_3cc0 = local_5f60;
          uStack_3cb8 = uStack_5f58;
          uStack_3cb0 = uStack_5f50;
          uStack_3ca8 = uStack_5f48;
          fStack_3c84 = fStack_43c4;
          local_3c80 = local_5f60;
          uStack_3c78 = uStack_5f58;
          uStack_3c70 = uStack_5f50;
          uStack_3c68 = uStack_5f48;
          fStack_3c44 = fStack_4384;
          local_3c40 = local_5f60;
          uStack_3c38 = uStack_5f58;
          uStack_3c30 = uStack_5f50;
          uStack_3c28 = uStack_5f48;
          fStack_3c04 = fStack_4344;
        }
        local_5f68 = local_5b24 & 7;
        for (local_5f64 = (int)local_5b24 >> 3; 0 < local_5f64; local_5f64 = local_5f64 + -1) {
          local_5900 = local_5e20;
          local_5fa0 = *(undefined8 *)local_5e20;
          uStack_5f98 = *(undefined8 *)(local_5e20 + 2);
          uStack_5f90 = *(undefined8 *)(local_5e20 + 4);
          uStack_5f88 = *(undefined8 *)(local_5e20 + 6);
          local_5908 = local_5e88;
          uVar12 = *(undefined8 *)local_5e88;
          uVar13 = *(undefined8 *)(local_5e88 + 2);
          uVar14 = *(undefined8 *)(local_5e88 + 4);
          uVar15 = *(undefined8 *)(local_5e88 + 6);
          local_5720 = local_5ec0;
          uStack_5718 = uStack_5eb8;
          uStack_5710 = uStack_5eb0;
          uStack_5708 = uStack_5ea8;
          local_56e0._0_4_ = (float)uVar12;
          local_3be0 = (float)local_56e0;
          local_56e0._4_4_ = (float)((ulong)uVar12 >> 0x20);
          fStack_3bdc = local_56e0._4_4_;
          uStack_56d8._0_4_ = (float)uVar13;
          fStack_3bd8 = (float)uStack_56d8;
          uStack_56d8._4_4_ = (float)((ulong)uVar13 >> 0x20);
          fStack_3bd4 = uStack_56d8._4_4_;
          uStack_56d0._0_4_ = (float)uVar14;
          fStack_3bd0 = (float)uStack_56d0;
          uStack_56d0._4_4_ = (float)((ulong)uVar14 >> 0x20);
          fStack_3bcc = uStack_56d0._4_4_;
          uStack_56c8._0_4_ = (float)uVar15;
          fStack_3bc8 = (float)uStack_56c8;
          uStack_56c8._4_4_ = (float)((ulong)uVar15 >> 0x20);
          fStack_4304 = uStack_56c8._4_4_;
          local_3c00._0_4_ = (float)local_5fa0;
          local_3c00._4_4_ = (float)((ulong)local_5fa0 >> 0x20);
          uStack_3bf8._0_4_ = (float)uStack_5f98;
          uStack_3bf8._4_4_ = (float)((ulong)uStack_5f98 >> 0x20);
          uStack_3bf0._0_4_ = (float)uStack_5f90;
          uStack_3bf0._4_4_ = (float)((ulong)uStack_5f90 >> 0x20);
          uStack_3be8._0_4_ = (float)uStack_5f88;
          local_4320 = (float)local_56e0 * (float)local_3c00;
          fStack_431c = local_56e0._4_4_ * local_3c00._4_4_;
          fStack_4318 = (float)uStack_56d8 * (float)uStack_3bf8;
          fStack_4314 = uStack_56d8._4_4_ * uStack_3bf8._4_4_;
          fStack_4310 = (float)uStack_56d0 * (float)uStack_3bf0;
          fStack_430c = uStack_56d0._4_4_ * uStack_3bf0._4_4_;
          fStack_4308 = (float)uStack_56c8 * (float)uStack_3be8;
          uVar16 = local_5ec0;
          uVar17 = uStack_5eb8;
          uVar18 = uStack_5eb0;
          uVar19 = uStack_5ea8;
          local_4340._0_4_ = (float)local_5ec0;
          local_4340._4_4_ = (float)((ulong)local_5ec0 >> 0x20);
          uStack_4338._0_4_ = (float)uStack_5eb8;
          uStack_4338._4_4_ = (float)((ulong)uStack_5eb8 >> 0x20);
          uStack_4330._0_4_ = (float)uStack_5eb0;
          uStack_4330._4_4_ = (float)((ulong)uStack_5eb0 >> 0x20);
          uStack_4328._0_4_ = (float)uStack_5ea8;
          uStack_4328._4_4_ = (float)((ulong)uStack_5ea8 >> 0x20);
          local_5ec0 = CONCAT44(fStack_431c + local_4340._4_4_,local_4320 + (float)local_4340);
          uStack_5eb8 = CONCAT44(fStack_4314 + uStack_4338._4_4_,fStack_4318 + (float)uStack_4338);
          uStack_5eb0 = CONCAT44(fStack_430c + uStack_4330._4_4_,fStack_4310 + (float)uStack_4330);
          uStack_5ea8 = CONCAT44(uStack_56c8._4_4_ + uStack_4328._4_4_,
                                 fStack_4308 + (float)uStack_4328);
          local_5910 = local_5e90;
          uVar20 = *(undefined8 *)local_5e90;
          uVar21 = *(undefined8 *)(local_5e90 + 2);
          uVar22 = *(undefined8 *)(local_5e90 + 4);
          uVar23 = *(undefined8 *)(local_5e90 + 6);
          local_5780 = local_5ee0;
          uStack_5778 = uStack_5ed8;
          uStack_5770 = uStack_5ed0;
          uStack_5768 = uStack_5ec8;
          local_5740._0_4_ = (float)uVar20;
          local_3ba0 = (float)local_5740;
          local_5740._4_4_ = (float)((ulong)uVar20 >> 0x20);
          fStack_3b9c = local_5740._4_4_;
          uStack_5738._0_4_ = (float)uVar21;
          fStack_3b98 = (float)uStack_5738;
          uStack_5738._4_4_ = (float)((ulong)uVar21 >> 0x20);
          fStack_3b94 = uStack_5738._4_4_;
          uStack_5730._0_4_ = (float)uVar22;
          fStack_3b90 = (float)uStack_5730;
          uStack_5730._4_4_ = (float)((ulong)uVar22 >> 0x20);
          fStack_3b8c = uStack_5730._4_4_;
          uStack_5728._0_4_ = (float)uVar23;
          fStack_3b88 = (float)uStack_5728;
          uStack_5728._4_4_ = (float)((ulong)uVar23 >> 0x20);
          fStack_42c4 = uStack_5728._4_4_;
          local_42e0 = (float)local_5740 * (float)local_3c00;
          fStack_42dc = local_5740._4_4_ * local_3c00._4_4_;
          fStack_42d8 = (float)uStack_5738 * (float)uStack_3bf8;
          fStack_42d4 = uStack_5738._4_4_ * uStack_3bf8._4_4_;
          fStack_42d0 = (float)uStack_5730 * (float)uStack_3bf0;
          fStack_42cc = uStack_5730._4_4_ * uStack_3bf0._4_4_;
          fStack_42c8 = (float)uStack_5728 * (float)uStack_3be8;
          uVar24 = local_5ee0;
          uVar25 = uStack_5ed8;
          uVar26 = uStack_5ed0;
          uVar27 = uStack_5ec8;
          local_4300._0_4_ = (float)local_5ee0;
          local_4300._4_4_ = (float)((ulong)local_5ee0 >> 0x20);
          uStack_42f8._0_4_ = (float)uStack_5ed8;
          uStack_42f8._4_4_ = (float)((ulong)uStack_5ed8 >> 0x20);
          uStack_42f0._0_4_ = (float)uStack_5ed0;
          uStack_42f0._4_4_ = (float)((ulong)uStack_5ed0 >> 0x20);
          uStack_42e8._0_4_ = (float)uStack_5ec8;
          uStack_42e8._4_4_ = (float)((ulong)uStack_5ec8 >> 0x20);
          local_5ee0 = CONCAT44(fStack_42dc + local_4300._4_4_,local_42e0 + (float)local_4300);
          uStack_5ed8 = CONCAT44(fStack_42d4 + uStack_42f8._4_4_,fStack_42d8 + (float)uStack_42f8);
          uStack_5ed0 = CONCAT44(fStack_42cc + uStack_42f0._4_4_,fStack_42d0 + (float)uStack_42f0);
          uStack_5ec8 = CONCAT44(uStack_5728._4_4_ + uStack_42e8._4_4_,
                                 fStack_42c8 + (float)uStack_42e8);
          local_5918 = local_5e98;
          uVar28 = *(undefined8 *)local_5e98;
          uVar29 = *(undefined8 *)(local_5e98 + 2);
          uVar30 = *(undefined8 *)(local_5e98 + 4);
          uVar31 = *(undefined8 *)(local_5e98 + 6);
          local_57e0 = local_5f00;
          uStack_57d8 = uStack_5ef8;
          uStack_57d0 = uStack_5ef0;
          uStack_57c8 = uStack_5ee8;
          local_57a0._0_4_ = (float)uVar28;
          local_3b60 = (float)local_57a0;
          local_57a0._4_4_ = (float)((ulong)uVar28 >> 0x20);
          fStack_3b5c = local_57a0._4_4_;
          uStack_5798._0_4_ = (float)uVar29;
          fStack_3b58 = (float)uStack_5798;
          uStack_5798._4_4_ = (float)((ulong)uVar29 >> 0x20);
          fStack_3b54 = uStack_5798._4_4_;
          uStack_5790._0_4_ = (float)uVar30;
          fStack_3b50 = (float)uStack_5790;
          uStack_5790._4_4_ = (float)((ulong)uVar30 >> 0x20);
          fStack_3b4c = uStack_5790._4_4_;
          uStack_5788._0_4_ = (float)uVar31;
          fStack_3b48 = (float)uStack_5788;
          uStack_5788._4_4_ = (float)((ulong)uVar31 >> 0x20);
          fStack_4284 = uStack_5788._4_4_;
          local_42a0 = (float)local_57a0 * (float)local_3c00;
          fStack_429c = local_57a0._4_4_ * local_3c00._4_4_;
          fStack_4298 = (float)uStack_5798 * (float)uStack_3bf8;
          fStack_4294 = uStack_5798._4_4_ * uStack_3bf8._4_4_;
          fStack_4290 = (float)uStack_5790 * (float)uStack_3bf0;
          fStack_428c = uStack_5790._4_4_ * uStack_3bf0._4_4_;
          fStack_4288 = (float)uStack_5788 * (float)uStack_3be8;
          uVar32 = local_5f00;
          uVar33 = uStack_5ef8;
          uVar34 = uStack_5ef0;
          uVar35 = uStack_5ee8;
          local_42c0._0_4_ = (float)local_5f00;
          local_42c0._4_4_ = (float)((ulong)local_5f00 >> 0x20);
          uStack_42b8._0_4_ = (float)uStack_5ef8;
          uStack_42b8._4_4_ = (float)((ulong)uStack_5ef8 >> 0x20);
          uStack_42b0._0_4_ = (float)uStack_5ef0;
          uStack_42b0._4_4_ = (float)((ulong)uStack_5ef0 >> 0x20);
          uStack_42a8._0_4_ = (float)uStack_5ee8;
          uStack_42a8._4_4_ = (float)((ulong)uStack_5ee8 >> 0x20);
          local_5f00 = CONCAT44(fStack_429c + local_42c0._4_4_,local_42a0 + (float)local_42c0);
          uStack_5ef8 = CONCAT44(fStack_4294 + uStack_42b8._4_4_,fStack_4298 + (float)uStack_42b8);
          uStack_5ef0 = CONCAT44(fStack_428c + uStack_42b0._4_4_,fStack_4290 + (float)uStack_42b0);
          uStack_5ee8 = CONCAT44(uStack_5788._4_4_ + uStack_42a8._4_4_,
                                 fStack_4288 + (float)uStack_42a8);
          local_5920 = local_5ea0;
          uVar36 = *(undefined8 *)local_5ea0;
          uVar37 = *(undefined8 *)(local_5ea0 + 2);
          uVar38 = *(undefined8 *)(local_5ea0 + 4);
          uVar39 = *(undefined8 *)(local_5ea0 + 6);
          local_5840 = local_5f20;
          uStack_5838 = uStack_5f18;
          uStack_5830 = uStack_5f10;
          uStack_5828 = uStack_5f08;
          local_5800._0_4_ = (float)uVar36;
          local_3b20 = (float)local_5800;
          local_5800._4_4_ = (float)((ulong)uVar36 >> 0x20);
          fStack_3b1c = local_5800._4_4_;
          uStack_57f8._0_4_ = (float)uVar37;
          fStack_3b18 = (float)uStack_57f8;
          uStack_57f8._4_4_ = (float)((ulong)uVar37 >> 0x20);
          fStack_3b14 = uStack_57f8._4_4_;
          uStack_57f0._0_4_ = (float)uVar38;
          fStack_3b10 = (float)uStack_57f0;
          uStack_57f0._4_4_ = (float)((ulong)uVar38 >> 0x20);
          fStack_3b0c = uStack_57f0._4_4_;
          uStack_57e8._0_4_ = (float)uVar39;
          fStack_3b08 = (float)uStack_57e8;
          uStack_57e8._4_4_ = (float)((ulong)uVar39 >> 0x20);
          fStack_4244 = uStack_57e8._4_4_;
          local_4260 = (float)local_5800 * (float)local_3c00;
          fStack_425c = local_5800._4_4_ * local_3c00._4_4_;
          fStack_4258 = (float)uStack_57f8 * (float)uStack_3bf8;
          fStack_4254 = uStack_57f8._4_4_ * uStack_3bf8._4_4_;
          fStack_4250 = (float)uStack_57f0 * (float)uStack_3bf0;
          fStack_424c = uStack_57f0._4_4_ * uStack_3bf0._4_4_;
          fStack_4248 = (float)uStack_57e8 * (float)uStack_3be8;
          uVar40 = local_5f20;
          uVar41 = uStack_5f18;
          uVar42 = uStack_5f10;
          uVar43 = uStack_5f08;
          local_4280._0_4_ = (float)local_5f20;
          local_4280._4_4_ = (float)((ulong)local_5f20 >> 0x20);
          uStack_4278._0_4_ = (float)uStack_5f18;
          uStack_4278._4_4_ = (float)((ulong)uStack_5f18 >> 0x20);
          uStack_4270._0_4_ = (float)uStack_5f10;
          uStack_4270._4_4_ = (float)((ulong)uStack_5f10 >> 0x20);
          uStack_4268._0_4_ = (float)uStack_5f08;
          uStack_4268._4_4_ = (float)((ulong)uStack_5f08 >> 0x20);
          local_5f20 = CONCAT44(fStack_425c + local_4280._4_4_,local_4260 + (float)local_4280);
          uStack_5f18 = CONCAT44(fStack_4254 + uStack_4278._4_4_,fStack_4258 + (float)uStack_4278);
          uStack_5f10 = CONCAT44(fStack_424c + uStack_4270._4_4_,fStack_4250 + (float)uStack_4270);
          uStack_5f08 = CONCAT44(uStack_57e8._4_4_ + uStack_4268._4_4_,
                                 fStack_4248 + (float)uStack_4268);
          local_5e20 = local_5e20 + 8;
          local_5e88 = local_5e88 + 8;
          local_5e90 = local_5e90 + 8;
          local_5e98 = local_5e98 + 8;
          local_5ea0 = local_5ea0 + 8;
          local_5820 = local_5fa0;
          uStack_5818 = uStack_5f98;
          uStack_5810 = uStack_5f90;
          uStack_5808 = uStack_5f88;
          local_5800 = uVar36;
          uStack_57f8 = uVar37;
          uStack_57f0 = uVar38;
          uStack_57e8 = uVar39;
          local_57c0 = local_5fa0;
          uStack_57b8 = uStack_5f98;
          uStack_57b0 = uStack_5f90;
          uStack_57a8 = uStack_5f88;
          local_57a0 = uVar28;
          uStack_5798 = uVar29;
          uStack_5790 = uVar30;
          uStack_5788 = uVar31;
          local_5760 = local_5fa0;
          uStack_5758 = uStack_5f98;
          uStack_5750 = uStack_5f90;
          uStack_5748 = uStack_5f88;
          local_5740 = uVar20;
          uStack_5738 = uVar21;
          uStack_5730 = uVar22;
          uStack_5728 = uVar23;
          local_5700 = local_5fa0;
          uStack_56f8 = uStack_5f98;
          uStack_56f0 = uStack_5f90;
          uStack_56e8 = uStack_5f88;
          local_56e0 = uVar12;
          uStack_56d8 = uVar13;
          uStack_56d0 = uVar14;
          uStack_56c8 = uVar15;
          local_4340 = uVar16;
          uStack_4338 = uVar17;
          uStack_4330 = uVar18;
          uStack_4328 = uVar19;
          local_4300 = uVar24;
          uStack_42f8 = uVar25;
          uStack_42f0 = uVar26;
          uStack_42e8 = uVar27;
          local_42c0 = uVar32;
          uStack_42b8 = uVar33;
          uStack_42b0 = uVar34;
          uStack_42a8 = uVar35;
          local_4280 = uVar40;
          uStack_4278 = uVar41;
          uStack_4270 = uVar42;
          uStack_4268 = uVar43;
          local_3c00 = local_5fa0;
          uStack_3bf8 = uStack_5f98;
          uStack_3bf0 = uStack_5f90;
          uStack_3be8 = uStack_5f88;
          fStack_3bc4 = fStack_4304;
          local_3bc0 = local_5fa0;
          uStack_3bb8 = uStack_5f98;
          uStack_3bb0 = uStack_5f90;
          uStack_3ba8 = uStack_5f88;
          fStack_3b84 = fStack_42c4;
          local_3b80 = local_5fa0;
          uStack_3b78 = uStack_5f98;
          uStack_3b70 = uStack_5f90;
          uStack_3b68 = uStack_5f88;
          fStack_3b44 = fStack_4284;
          local_3b40 = local_5fa0;
          uStack_3b38 = uStack_5f98;
          uStack_3b30 = uStack_5f90;
          uStack_3b28 = uStack_5f88;
          fStack_3b04 = fStack_4244;
        }
        local_4ce8 = &local_5fb0;
        local_4c68 = &local_5ec0;
        local_4c70 = &local_5ee0;
        local_4c78 = &local_5f00;
        local_4c80 = &local_5f20;
        local_39a0 = local_5ec0;
        uStack_3998 = uStack_5eb8;
        uStack_3990 = uStack_5eb0;
        uStack_3988 = uStack_5ea8;
        auVar140._8_8_ = uStack_5eb8;
        auVar140._0_8_ = local_5ec0;
        auVar140._16_8_ = uStack_5eb0;
        auVar140._24_8_ = uStack_5ea8;
        local_39c0 = local_5ee0;
        uStack_39b8 = uStack_5ed8;
        uStack_39b0 = uStack_5ed0;
        uStack_39a8 = uStack_5ec8;
        auVar139._8_8_ = uStack_5ed8;
        auVar139._0_8_ = local_5ee0;
        auVar139._16_8_ = uStack_5ed0;
        auVar139._24_8_ = uStack_5ec8;
        local_4ca0 = vhaddps_avx(auVar140,auVar139);
        local_39e0 = local_5f00;
        uStack_39d8 = uStack_5ef8;
        uStack_39d0 = uStack_5ef0;
        uStack_39c8 = uStack_5ee8;
        auVar138._8_8_ = uStack_5ef8;
        auVar138._0_8_ = local_5f00;
        auVar138._16_8_ = uStack_5ef0;
        auVar138._24_8_ = uStack_5ee8;
        local_3a00 = local_5f20;
        uStack_39f8 = uStack_5f18;
        uStack_39f0 = uStack_5f10;
        uStack_39e8 = uStack_5f08;
        auVar137._8_8_ = uStack_5f18;
        auVar137._0_8_ = local_5f20;
        auVar137._16_8_ = uStack_5f10;
        auVar137._24_8_ = uStack_5f08;
        local_4cc0 = vhaddps_avx(auVar138,auVar137);
        local_3a20 = local_4ca0._0_8_;
        uStack_3a18 = local_4ca0._8_8_;
        uStack_3a10 = local_4ca0._16_8_;
        uStack_3a08 = local_4ca0._24_8_;
        local_3a40 = local_4cc0._0_8_;
        uStack_3a38 = local_4cc0._8_8_;
        uStack_3a30 = local_4cc0._16_8_;
        uStack_3a28 = local_4cc0._24_8_;
        _local_4ce0 = vhaddps_avx(local_4ca0,local_4cc0);
        uStack_37d0 = local_4ce0._16_8_;
        uStack_37c8 = uStack_4cc8;
        local_37e0 = local_4ce0._0_8_;
        uStack_37d8 = local_4ce0._8_8_;
        _local_37f0 = stack0xffffffffffffb330;
        auVar4 = _local_37f0;
        local_3800 = local_4ce0._0_8_;
        uVar12 = local_3800;
        uStack_37f8 = local_4ce0._8_8_;
        uVar13 = uStack_37f8;
        local_37f0._0_4_ = local_4ce0._16_4_;
        local_37f0._4_4_ = local_4ce0._20_4_;
        fStack_37e8 = local_4ce0._24_4_;
        fStack_37e4 = local_4ce0._28_4_;
        local_3800._0_4_ = local_4ce0._0_4_;
        local_3800._4_4_ = local_4ce0._4_4_;
        uStack_37f8._0_4_ = local_4ce0._8_4_;
        uStack_37f8._4_4_ = local_4ce0._12_4_;
        local_4d00 = CONCAT44((float)local_37f0._4_4_ + local_3800._4_4_,
                              (float)local_37f0._0_4_ + (float)local_3800);
        uStack_4cf8 = CONCAT44(fStack_37e4 + uStack_37f8._4_4_,fStack_37e8 + (float)uStack_37f8);
        local_5fb0 = local_5e28[local_5e0c] + (float)local_37f0._0_4_ + (float)local_3800;
        fStack_5fac = local_5e30[local_5e0c] + (float)local_37f0._4_4_ + local_3800._4_4_;
        fStack_5fa8 = local_5e38[local_5e0c] + fStack_37e8 + (float)uStack_37f8;
        fStack_5fa4 = local_5e40[local_5e0c] + fStack_37e4 + uStack_37f8._4_4_;
        for (; 0 < (int)local_5f28; local_5f28 = local_5f28 - 1) {
          fVar1 = *local_5e18;
          local_5fb0 = *local_5e68 * fVar1 + local_5fb0;
          fStack_5fac = *local_5e70 * fVar1 + fStack_5fac;
          fStack_5fa8 = *local_5e78 * fVar1 + fStack_5fa8;
          fStack_5fa4 = *local_5e80 * fVar1 + fStack_5fa4;
          local_5e18 = local_5e18 + 1;
          local_5e68 = local_5e68 + 1;
          local_5e70 = local_5e70 + 1;
          local_5e78 = local_5e78 + 1;
          local_5e80 = local_5e80 + 1;
        }
        for (; 0 < (int)local_5f68; local_5f68 = local_5f68 - 1) {
          fVar1 = *local_5e20;
          local_5fb0 = *local_5e88 * fVar1 + local_5fb0;
          fStack_5fac = *local_5e90 * fVar1 + fStack_5fac;
          fStack_5fa8 = *local_5e98 * fVar1 + fStack_5fa8;
          fStack_5fa4 = *local_5ea0 * fVar1 + fStack_5fa4;
          local_5e20 = local_5e20 + 1;
          local_5e88 = local_5e88 + 1;
          local_5e90 = local_5e90 + 1;
          local_5e98 = local_5e98 + 1;
          local_5ea0 = local_5ea0 + 1;
        }
        local_5e48[local_5e0c] = local_5fb0;
        local_5e50[local_5e0c] = fStack_5fac;
        local_5e58[local_5e0c] = fStack_5fa8;
        local_5e60[local_5e0c] = fStack_5fa4;
        local_5ae0 = ZEXT832(0) << 0x20;
        local_5ac0 = ZEXT832(0) << 0x20;
        local_5aa0 = ZEXT832(0) << 0x20;
        local_3800 = uVar12;
        uStack_37f8 = uVar13;
        _local_37f0 = auVar4;
      }
      local_5fc0 = (undefined1 (*) [32])Mat::row(local_5af8,local_5b88);
      local_5fc8 = Mat::operator_cast_to_float_(hidden_state);
      local_5fd0 = Mat::operator_cast_to_float_(in_stack_00000008);
      local_5fd8 = (undefined1 (*) [32])Mat::row(&local_5b70,0);
      local_5fe0 = (undefined1 (*) [32])Mat::row(&local_5b70,1);
      local_5fe8 = (undefined1 (*) [32])Mat::row(&local_5b70,2);
      local_5ff0 = Mat::row(&local_5b70,3);
      local_5ff8 = local_5b24 & 7;
      for (local_5ff4 = (int)local_5b24 >> 3; 0 < local_5ff4; local_5ff4 = local_5ff4 + -1) {
        local_5928 = local_5fd8;
        local_4b80 = *(undefined8 *)*local_5fd8;
        uStack_4b78 = *(undefined8 *)(*local_5fd8 + 8);
        uStack_4b70 = *(undefined8 *)(*local_5fd8 + 0x10);
        uStack_4b68 = *(undefined8 *)(*local_5fd8 + 0x18);
        local_378c = 0x3f800000;
        local_1220 = 0x3f800000;
        auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
        auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
        auVar150._16_16_ = auVar4;
        auVar150._0_16_ = auVar5;
        local_1240._0_8_ = auVar5._0_8_;
        local_1240._8_8_ = auVar5._8_8_;
        local_1240._16_8_ = auVar4._0_8_;
        local_1240._24_8_ = auVar4._8_8_;
        local_4ba0 = local_1240._0_8_;
        uStack_4b98 = local_1240._8_8_;
        uStack_4b90 = local_1240._16_8_;
        uStack_4b88 = local_1240._24_8_;
        local_2920 = ZEXT832(0) << 0x20;
        local_1360 = 0;
        local_4b60._8_8_ = SUB328(ZEXT832(0),4);
        uStack_1358 = local_4b60._8_8_;
        uStack_1350 = 0;
        uStack_1348 = 0;
        auVar11 = vsubps_avx(ZEXT832((ulong)local_4b60._8_8_) << 0x40,*local_5fd8);
        local_29c0 = 0x3f8000003f800000;
        uStack_29b8 = 0x3f8000003f800000;
        uStack_29b0 = 0x3f8000003f800000;
        uStack_29a8 = 0x3f8000003f800000;
        local_2940._0_8_ = auVar11._0_8_;
        local_fe0 = local_2940._0_8_;
        local_2940._8_8_ = auVar11._8_8_;
        uStack_fd8 = local_2940._8_8_;
        local_2940._16_8_ = auVar11._16_8_;
        uStack_fd0 = local_2940._16_8_;
        local_2940._24_8_ = auVar11._24_8_;
        uStack_fc8 = local_2940._24_8_;
        local_1000 = 0x42b0c0a542b0c0a5;
        uStack_ff8 = 0x42b0c0a542b0c0a5;
        uStack_ff0 = 0x42b0c0a542b0c0a5;
        uStack_fe8 = 0x42b0c0a542b0c0a5;
        auVar105._8_8_ = 0x42b0c0a542b0c0a5;
        auVar105._0_8_ = 0x42b0c0a542b0c0a5;
        auVar105._16_8_ = 0x42b0c0a542b0c0a5;
        auVar105._24_8_ = 0x42b0c0a542b0c0a5;
        auVar11 = vminps_avx(auVar11,auVar105);
        local_2940._0_8_ = auVar11._0_8_;
        local_ea0 = local_2940._0_8_;
        local_2940._8_8_ = auVar11._8_8_;
        uStack_e98 = local_2940._8_8_;
        local_2940._16_8_ = auVar11._16_8_;
        uStack_e90 = local_2940._16_8_;
        local_2940._24_8_ = auVar11._24_8_;
        uStack_e88 = local_2940._24_8_;
        local_ec0 = 0xc2b0c0a5c2b0c0a5;
        uStack_eb8 = 0xc2b0c0a5c2b0c0a5;
        uStack_eb0 = 0xc2b0c0a5c2b0c0a5;
        uStack_ea8 = 0xc2b0c0a5c2b0c0a5;
        auVar110._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar110._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar110._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar110._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar7 = vmaxps_avx(auVar11,auVar110);
        local_2940._0_8_ = auVar7._0_8_;
        uVar12 = local_2940._0_8_;
        local_2940._8_8_ = auVar7._8_8_;
        uVar13 = local_2940._8_8_;
        local_2940._16_8_ = auVar7._16_8_;
        uVar14 = local_2940._16_8_;
        local_2940._24_8_ = auVar7._24_8_;
        uVar15 = local_2940._24_8_;
        local_2480 = 0x3fb8aa3b3fb8aa3b;
        uStack_2478 = 0x3fb8aa3b3fb8aa3b;
        uStack_2470 = 0x3fb8aa3b3fb8aa3b;
        uStack_2468 = 0x3fb8aa3b3fb8aa3b;
        local_2460._0_4_ = auVar7._0_4_;
        local_2460._4_4_ = auVar7._4_4_;
        uStack_2458._0_4_ = auVar7._8_4_;
        uStack_2458._4_4_ = auVar7._12_4_;
        uStack_2450._0_4_ = auVar7._16_4_;
        uStack_2450._4_4_ = auVar7._20_4_;
        uStack_2448._0_4_ = auVar7._24_4_;
        uStack_2448._4_4_ = auVar7._28_4_;
        local_2980._4_4_ = local_2460._4_4_ * 1.442695;
        local_2980._0_4_ = (float)local_2460 * 1.442695;
        uStack_2978._0_4_ = (float)uStack_2458 * 1.442695;
        uStack_2978._4_4_ = uStack_2458._4_4_ * 1.442695;
        uStack_2970._0_4_ = (float)uStack_2450 * 1.442695;
        uStack_2970._4_4_ = uStack_2450._4_4_ * 1.442695;
        auVar144 = _local_2980;
        uStack_2968._0_4_ = (float)uStack_2448 * 1.442695;
        uStack_2968._4_4_ = uStack_2448._4_4_;
        auVar11 = _local_2980;
        local_2720 = local_2980;
        uStack_2718 = uStack_2978;
        uStack_2970 = auVar144._16_8_;
        uStack_2710 = uStack_2970;
        uStack_2968 = auVar11._24_8_;
        uStack_2708 = uStack_2968;
        local_2880 = 0x3f0000003f000000;
        uStack_2878 = 0x3f0000003f000000;
        uStack_2870 = 0x3f0000003f000000;
        uStack_2868 = 0x3f0000003f000000;
        local_2980._4_4_ = local_2460._4_4_ * 1.442695 + 0.5;
        local_2980._0_4_ = (float)local_2460 * 1.442695 + 0.5;
        uStack_2978._0_4_ = (float)uStack_2458 * 1.442695 + 0.5;
        uStack_2978._4_4_ = uStack_2458._4_4_ * 1.442695 + 0.5;
        uStack_2970._0_4_ = (float)uStack_2450 * 1.442695 + 0.5;
        uStack_2970._4_4_ = uStack_2450._4_4_ * 1.442695 + 0.5;
        uStack_2968._0_4_ = (float)uStack_2448 * 1.442695 + 0.5;
        uStack_2968._4_4_ = uStack_2448._4_4_ + 0.5;
        auVar8 = vroundps_avx(_local_2980,1);
        auVar11 = vcmpps_avx(_local_2980,auVar8,1);
        local_29e0._0_8_ = auVar11._0_8_;
        local_d60 = local_29e0._0_8_;
        local_29e0._8_8_ = auVar11._8_8_;
        uStack_d58 = local_29e0._8_8_;
        local_29e0._16_8_ = auVar11._16_8_;
        uStack_d50 = local_29e0._16_8_;
        local_29e0._24_8_ = auVar11._24_8_;
        uStack_d48 = local_29e0._24_8_;
        local_d80 = 0x3f8000003f800000;
        uStack_d78 = 0x3f8000003f800000;
        uStack_d70 = 0x3f8000003f800000;
        uStack_d68 = 0x3f8000003f800000;
        auVar115._8_8_ = 0x3f8000003f800000;
        auVar115._0_8_ = 0x3f8000003f800000;
        auVar115._16_8_ = 0x3f8000003f800000;
        auVar115._24_8_ = 0x3f8000003f800000;
        local_29e0 = vandps_avx(auVar11,auVar115);
        local_2960 = auVar8._0_8_;
        local_1620 = local_2960;
        uStack_2958 = auVar8._8_8_;
        uStack_1618 = uStack_2958;
        uStack_2950 = auVar8._16_8_;
        uStack_1610 = uStack_2950;
        uStack_2948 = auVar8._24_8_;
        uStack_1608 = uStack_2948;
        local_1640 = local_29e0._0_8_;
        uStack_1638 = local_29e0._8_8_;
        uStack_1630 = local_29e0._16_8_;
        uStack_1628 = local_29e0._24_8_;
        _local_2980 = vsubps_avx(auVar8,local_29e0);
        local_24c0 = 0x3f3180003f318000;
        uStack_24b8 = 0x3f3180003f318000;
        uStack_24b0 = 0x3f3180003f318000;
        uStack_24a8 = 0x3f3180003f318000;
        local_24a0._0_4_ = local_2980._0_4_;
        local_24a0._4_4_ = local_2980._4_4_;
        uStack_2498._0_4_ = local_2980._8_4_;
        uStack_2498._4_4_ = local_2980._12_4_;
        uStack_2490._0_4_ = local_2980._16_4_;
        uStack_2490._4_4_ = local_2980._20_4_;
        uStack_2488._0_4_ = local_2980._24_4_;
        uStack_2488._4_4_ = local_2980._28_4_;
        local_2960._4_4_ = local_24a0._4_4_ * 0.6933594;
        local_2960._0_4_ = (float)local_24a0 * 0.6933594;
        uStack_2958._0_4_ = (float)uStack_2498 * 0.6933594;
        uStack_2958._4_4_ = uStack_2498._4_4_ * 0.6933594;
        uStack_2950._0_4_ = (float)uStack_2490 * 0.6933594;
        uStack_2950._4_4_ = uStack_2490._4_4_ * 0.6933594;
        auVar144 = _local_2960;
        uStack_2948._0_4_ = (float)uStack_2488 * 0.6933594;
        uStack_2948._4_4_ = uStack_2488._4_4_;
        auVar141 = _local_2960;
        local_24e0 = local_2980;
        uStack_24d8 = uStack_2978;
        uStack_24d0 = uStack_2970;
        uStack_24c8 = uStack_2968;
        local_2500 = 0xb95e8083b95e8083;
        uStack_24f8 = 0xb95e8083b95e8083;
        uStack_24f0 = 0xb95e8083b95e8083;
        uStack_24e8 = 0xb95e8083b95e8083;
        local_1660 = local_2940._0_8_;
        uStack_1658 = local_2940._8_8_;
        uStack_1650 = local_2940._16_8_;
        uStack_1648 = local_2940._24_8_;
        local_1680 = local_2960;
        uStack_1678 = uStack_2958;
        uStack_2950 = auVar144._16_8_;
        uStack_1670 = uStack_2950;
        uStack_2948 = auVar141._24_8_;
        uStack_1668 = uStack_2948;
        auVar92._16_8_ = uStack_2950;
        auVar92._0_16_ = _local_2960;
        auVar92._24_8_ = uStack_2948;
        auVar11 = vsubps_avx(auVar7,auVar92);
        local_2940._0_8_ = auVar11._0_8_;
        local_16a0 = local_2940._0_8_;
        local_2940._8_8_ = auVar11._8_8_;
        uStack_1698 = local_2940._8_8_;
        local_2940._16_8_ = auVar11._16_8_;
        uStack_1690 = local_2940._16_8_;
        local_2940._24_8_ = auVar11._24_8_;
        uStack_1688 = local_2940._24_8_;
        local_16c0 = CONCAT44(local_24a0._4_4_ * -0.00021219444,(float)local_24a0 * -0.00021219444);
        uStack_16b8 = CONCAT44(uStack_2498._4_4_ * -0.00021219444,
                               (float)uStack_2498 * -0.00021219444);
        uStack_16b0 = CONCAT44(uStack_2490._4_4_ * -0.00021219444,
                               (float)uStack_2490 * -0.00021219444);
        uStack_16a8 = CONCAT44(uStack_2488._4_4_,(float)uStack_2488 * -0.00021219444);
        auVar91._8_8_ = uStack_16b8;
        auVar91._0_8_ = local_16c0;
        auVar91._16_8_ = uStack_16b0;
        auVar91._24_8_ = uStack_16a8;
        local_2940 = vsubps_avx(auVar11,auVar91);
        local_2540 = local_2940._0_8_;
        uStack_2538 = local_2940._8_8_;
        uStack_2530 = local_2940._16_8_;
        uStack_2528 = local_2940._24_8_;
        local_2520._0_4_ = local_2940._0_4_;
        local_2520._4_4_ = local_2940._4_4_;
        uStack_2518._0_4_ = local_2940._8_4_;
        uStack_2518._4_4_ = local_2940._12_4_;
        uStack_2510._0_4_ = local_2940._16_4_;
        uStack_2510._4_4_ = local_2940._20_4_;
        uStack_2508._0_4_ = local_2940._24_4_;
        uStack_2508._4_4_ = local_2940._28_4_;
        fStack_29e4 = uStack_2508._4_4_;
        local_2a00 = (float)local_2520 * (float)local_2520;
        fStack_29fc = local_2520._4_4_ * local_2520._4_4_;
        fStack_29f8 = (float)uStack_2518 * (float)uStack_2518;
        fStack_29f4 = uStack_2518._4_4_ * uStack_2518._4_4_;
        fStack_29f0 = (float)uStack_2510 * (float)uStack_2510;
        fStack_29ec = uStack_2510._4_4_ * uStack_2510._4_4_;
        fStack_29e8 = (float)uStack_2508 * (float)uStack_2508;
        local_2560 = 0x3950696739506967;
        uStack_2558 = 0x3950696739506967;
        uStack_2550 = 0x3950696739506967;
        uStack_2548 = 0x3950696739506967;
        local_2580 = local_2940._0_8_;
        uStack_2578 = local_2940._8_8_;
        uStack_2570 = local_2940._16_8_;
        uStack_2568 = local_2940._24_8_;
        local_2a20 = CONCAT44(local_2520._4_4_ * 0.00019875691,(float)local_2520 * 0.00019875691);
        uStack_2a18 = CONCAT44(uStack_2518._4_4_ * 0.00019875691,(float)uStack_2518 * 0.00019875691)
        ;
        uStack_2a10 = CONCAT44(uStack_2510._4_4_ * 0.00019875691,(float)uStack_2510 * 0.00019875691)
        ;
        uStack_2a08 = CONCAT44(0x39506967,(float)uStack_2508 * 0.00019875691);
        local_2760 = local_2a20;
        uStack_2758 = uStack_2a18;
        uStack_2750 = uStack_2a10;
        uStack_2748 = uStack_2a08;
        local_2780 = 0x3ab743ce3ab743ce;
        uStack_2778 = 0x3ab743ce3ab743ce;
        uStack_2770 = 0x3ab743ce3ab743ce;
        uStack_2768 = 0x3ab743ce3ab743ce;
        local_3700 = (float)local_2520 * 0.00019875691 + 0.0013981999;
        fStack_36fc = local_2520._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_36f8 = (float)uStack_2518 * 0.00019875691 + 0.0013981999;
        fStack_36f4 = uStack_2518._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_36f0 = (float)uStack_2510 * 0.00019875691 + 0.0013981999;
        fStack_36ec = uStack_2510._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_36e8 = (float)uStack_2508 * 0.00019875691 + 0.0013981999;
        local_2a20 = CONCAT44(fStack_36fc,local_3700);
        uStack_2a18 = CONCAT44(fStack_36f4,fStack_36f8);
        uStack_2a10 = CONCAT44(fStack_36ec,fStack_36f0);
        uStack_2a08 = CONCAT44(0x3ad150fb,fStack_36e8);
        local_25a0 = local_2a20;
        uStack_2598 = uStack_2a18;
        uStack_2590 = uStack_2a10;
        uStack_2588 = uStack_2a08;
        local_25c0 = local_2940._0_8_;
        uStack_25b8 = local_2940._8_8_;
        uStack_25b0 = local_2940._16_8_;
        uStack_25a8 = local_2940._24_8_;
        local_3700 = local_3700 * (float)local_2520;
        fStack_36fc = fStack_36fc * local_2520._4_4_;
        fStack_36f8 = fStack_36f8 * (float)uStack_2518;
        fStack_36f4 = fStack_36f4 * uStack_2518._4_4_;
        fStack_36f0 = fStack_36f0 * (float)uStack_2510;
        fStack_36ec = fStack_36ec * uStack_2510._4_4_;
        fStack_36e8 = fStack_36e8 * (float)uStack_2508;
        local_2a20 = CONCAT44(fStack_36fc,local_3700);
        uStack_2a18 = CONCAT44(fStack_36f4,fStack_36f8);
        uStack_2a10 = CONCAT44(fStack_36ec,fStack_36f0);
        uStack_2a08 = CONCAT44(0x3ad150fb,fStack_36e8);
        local_27a0 = local_2a20;
        uStack_2798 = uStack_2a18;
        uStack_2790 = uStack_2a10;
        uStack_2788 = uStack_2a08;
        local_27c0 = 0x3c0889083c088908;
        uStack_27b8 = 0x3c0889083c088908;
        uStack_27b0 = 0x3c0889083c088908;
        uStack_27a8 = 0x3c0889083c088908;
        local_3700 = local_3700 + 0.008333452;
        fStack_36fc = fStack_36fc + 0.008333452;
        fStack_36f8 = fStack_36f8 + 0.008333452;
        fStack_36f4 = fStack_36f4 + 0.008333452;
        fStack_36f0 = fStack_36f0 + 0.008333452;
        fStack_36ec = fStack_36ec + 0.008333452;
        fStack_36e8 = fStack_36e8 + 0.008333452;
        local_2a20 = CONCAT44(fStack_36fc,local_3700);
        uStack_2a18 = CONCAT44(fStack_36f4,fStack_36f8);
        uStack_2a10 = CONCAT44(fStack_36ec,fStack_36f0);
        uStack_2a08 = CONCAT44(0x3c22b327,fStack_36e8);
        local_25e0 = local_2a20;
        uStack_25d8 = uStack_2a18;
        uStack_25d0 = uStack_2a10;
        uStack_25c8 = uStack_2a08;
        local_2600 = local_2940._0_8_;
        uStack_25f8 = local_2940._8_8_;
        uStack_25f0 = local_2940._16_8_;
        uStack_25e8 = local_2940._24_8_;
        local_3700 = local_3700 * (float)local_2520;
        fStack_36fc = fStack_36fc * local_2520._4_4_;
        fStack_36f8 = fStack_36f8 * (float)uStack_2518;
        fStack_36f4 = fStack_36f4 * uStack_2518._4_4_;
        fStack_36f0 = fStack_36f0 * (float)uStack_2510;
        fStack_36ec = fStack_36ec * uStack_2510._4_4_;
        fStack_36e8 = fStack_36e8 * (float)uStack_2508;
        local_2a20 = CONCAT44(fStack_36fc,local_3700);
        uStack_2a18 = CONCAT44(fStack_36f4,fStack_36f8);
        uStack_2a10 = CONCAT44(fStack_36ec,fStack_36f0);
        uStack_2a08 = CONCAT44(0x3c22b327,fStack_36e8);
        local_27e0 = local_2a20;
        uStack_27d8 = uStack_2a18;
        uStack_27d0 = uStack_2a10;
        uStack_27c8 = uStack_2a08;
        local_2800 = 0x3d2aa9c13d2aa9c1;
        uStack_27f8 = 0x3d2aa9c13d2aa9c1;
        uStack_27f0 = 0x3d2aa9c13d2aa9c1;
        uStack_27e8 = 0x3d2aa9c13d2aa9c1;
        local_3700 = local_3700 + 0.041665796;
        fStack_36fc = fStack_36fc + 0.041665796;
        fStack_36f8 = fStack_36f8 + 0.041665796;
        fStack_36f4 = fStack_36f4 + 0.041665796;
        fStack_36f0 = fStack_36f0 + 0.041665796;
        fStack_36ec = fStack_36ec + 0.041665796;
        fStack_36e8 = fStack_36e8 + 0.041665796;
        local_2a20 = CONCAT44(fStack_36fc,local_3700);
        uStack_2a18 = CONCAT44(fStack_36f4,fStack_36f8);
        uStack_2a10 = CONCAT44(fStack_36ec,fStack_36f0);
        uStack_2a08 = CONCAT44(0x3d53568b,fStack_36e8);
        local_2620 = local_2a20;
        uStack_2618 = uStack_2a18;
        uStack_2610 = uStack_2a10;
        uStack_2608 = uStack_2a08;
        local_2640 = local_2940._0_8_;
        uStack_2638 = local_2940._8_8_;
        uStack_2630 = local_2940._16_8_;
        uStack_2628 = local_2940._24_8_;
        local_3700 = local_3700 * (float)local_2520;
        fStack_36fc = fStack_36fc * local_2520._4_4_;
        fStack_36f8 = fStack_36f8 * (float)uStack_2518;
        fStack_36f4 = fStack_36f4 * uStack_2518._4_4_;
        fStack_36f0 = fStack_36f0 * (float)uStack_2510;
        fStack_36ec = fStack_36ec * uStack_2510._4_4_;
        fStack_36e8 = fStack_36e8 * (float)uStack_2508;
        local_2a20 = CONCAT44(fStack_36fc,local_3700);
        uStack_2a18 = CONCAT44(fStack_36f4,fStack_36f8);
        uStack_2a10 = CONCAT44(fStack_36ec,fStack_36f0);
        uStack_2a08 = CONCAT44(0x3d53568b,fStack_36e8);
        local_2820 = local_2a20;
        uStack_2818 = uStack_2a18;
        uStack_2810 = uStack_2a10;
        uStack_2808 = uStack_2a08;
        local_2840 = 0x3e2aaaaa3e2aaaaa;
        uStack_2838 = 0x3e2aaaaa3e2aaaaa;
        uStack_2830 = 0x3e2aaaaa3e2aaaaa;
        uStack_2828 = 0x3e2aaaaa3e2aaaaa;
        local_3700 = local_3700 + 0.16666666;
        fStack_36fc = fStack_36fc + 0.16666666;
        fStack_36f8 = fStack_36f8 + 0.16666666;
        fStack_36f4 = fStack_36f4 + 0.16666666;
        fStack_36f0 = fStack_36f0 + 0.16666666;
        fStack_36ec = fStack_36ec + 0.16666666;
        fStack_36e8 = fStack_36e8 + 0.16666666;
        local_2a20 = CONCAT44(fStack_36fc,local_3700);
        uStack_2a18 = CONCAT44(fStack_36f4,fStack_36f8);
        uStack_2a10 = CONCAT44(fStack_36ec,fStack_36f0);
        uStack_2a08 = CONCAT44(0x3e5f804d,fStack_36e8);
        local_2660 = local_2a20;
        uStack_2658 = uStack_2a18;
        uStack_2650 = uStack_2a10;
        uStack_2648 = uStack_2a08;
        local_2680 = local_2940._0_8_;
        uStack_2678 = local_2940._8_8_;
        uStack_2670 = local_2940._16_8_;
        uStack_2668 = local_2940._24_8_;
        local_3700 = local_3700 * (float)local_2520;
        fStack_36fc = fStack_36fc * local_2520._4_4_;
        fStack_36f8 = fStack_36f8 * (float)uStack_2518;
        fStack_36f4 = fStack_36f4 * uStack_2518._4_4_;
        fStack_36f0 = fStack_36f0 * (float)uStack_2510;
        fStack_36ec = fStack_36ec * uStack_2510._4_4_;
        fStack_36e8 = fStack_36e8 * (float)uStack_2508;
        local_2a20 = CONCAT44(fStack_36fc,local_3700);
        uStack_2a18 = CONCAT44(fStack_36f4,fStack_36f8);
        uStack_2a10 = CONCAT44(fStack_36ec,fStack_36f0);
        uStack_2a08 = CONCAT44(0x3e5f804d,fStack_36e8);
        local_2860 = local_2a20;
        uStack_2858 = uStack_2a18;
        uStack_2850 = uStack_2a10;
        uStack_2848 = uStack_2a08;
        local_3700 = local_3700 + 0.5;
        fStack_36fc = fStack_36fc + 0.5;
        fStack_36f8 = fStack_36f8 + 0.5;
        fStack_36f4 = fStack_36f4 + 0.5;
        fStack_36f0 = fStack_36f0 + 0.5;
        fStack_36ec = fStack_36ec + 0.5;
        fStack_36e8 = fStack_36e8 + 0.5;
        local_2a20 = CONCAT44(fStack_36fc,local_3700);
        uStack_2a18 = CONCAT44(fStack_36f4,fStack_36f8);
        uStack_2a10 = CONCAT44(fStack_36ec,fStack_36f0);
        uStack_2a08 = CONCAT44(0x3f37e013,fStack_36e8);
        local_26a0 = local_2a20;
        uStack_2698 = uStack_2a18;
        uStack_2690 = uStack_2a10;
        uStack_2688 = uStack_2a08;
        local_26c0 = CONCAT44(fStack_29fc,local_2a00);
        uStack_26b8 = CONCAT44(fStack_29f4,fStack_29f8);
        uStack_26b0 = CONCAT44(fStack_29ec,fStack_29f0);
        uStack_26a8 = CONCAT44(uStack_2508._4_4_,fStack_29e8);
        local_3700 = local_3700 * local_2a00;
        fStack_36fc = fStack_36fc * fStack_29fc;
        fStack_36f8 = fStack_36f8 * fStack_29f8;
        fStack_36f4 = fStack_36f4 * fStack_29f4;
        fStack_36f0 = fStack_36f0 * fStack_29f0;
        fStack_36ec = fStack_36ec * fStack_29ec;
        fStack_36e8 = fStack_36e8 * fStack_29e8;
        local_2a20 = CONCAT44(fStack_36fc,local_3700);
        uStack_2a18 = CONCAT44(fStack_36f4,fStack_36f8);
        uStack_2a10 = CONCAT44(fStack_36ec,fStack_36f0);
        uStack_2a08 = CONCAT44(0x3f37e013,fStack_36e8);
        local_28a0 = local_2a20;
        uStack_2898 = uStack_2a18;
        uStack_2890 = uStack_2a10;
        uStack_2888 = uStack_2a08;
        local_28c0 = local_2940._0_8_;
        uStack_28b8 = local_2940._8_8_;
        uStack_28b0 = local_2940._16_8_;
        uStack_28a8 = local_2940._24_8_;
        local_3700 = local_3700 + (float)local_2520;
        fStack_36fc = fStack_36fc + local_2520._4_4_;
        fStack_36f8 = fStack_36f8 + (float)uStack_2518;
        fStack_36f4 = fStack_36f4 + uStack_2518._4_4_;
        fStack_36f0 = fStack_36f0 + (float)uStack_2510;
        fStack_36ec = fStack_36ec + uStack_2510._4_4_;
        fStack_36e8 = fStack_36e8 + (float)uStack_2508;
        local_2a20 = CONCAT44(fStack_36fc,local_3700);
        uStack_2a18 = CONCAT44(fStack_36f4,fStack_36f8);
        uStack_2a10 = CONCAT44(fStack_36ec,fStack_36f0);
        uStack_2a08 = CONCAT44(uStack_2508._4_4_ + 0.71826285,fStack_36e8);
        local_28e0 = local_2a20;
        uStack_28d8 = uStack_2a18;
        uStack_28d0 = uStack_2a10;
        uStack_28c8 = uStack_2a08;
        local_2900 = 0x3f8000003f800000;
        uStack_28f8 = 0x3f8000003f800000;
        uStack_28f0 = 0x3f8000003f800000;
        uStack_28e8 = 0x3f8000003f800000;
        local_3700 = local_3700 + 1.0;
        fStack_36fc = fStack_36fc + 1.0;
        fStack_36f8 = fStack_36f8 + 1.0;
        fStack_36f4 = fStack_36f4 + 1.0;
        fStack_36f0 = fStack_36f0 + 1.0;
        fStack_36ec = fStack_36ec + 1.0;
        fStack_36e8 = fStack_36e8 + 1.0;
        fStack_36e4 = uStack_2508._4_4_ + 0.71826285 + 1.0;
        local_2a20 = CONCAT44(fStack_36fc,local_3700);
        uStack_2a18 = CONCAT44(fStack_36f4,fStack_36f8);
        uStack_2a10 = CONCAT44(fStack_36ec,fStack_36f0);
        uStack_2a08 = CONCAT44(fStack_36e4,fStack_36e8);
        local_c80 = local_2980;
        uStack_c78 = uStack_2978;
        uStack_c70 = uStack_2970;
        uStack_c68 = uStack_2968;
        local_29a0 = CONCAT44((int)local_24a0._4_4_,(int)(float)local_24a0);
        uStack_2998 = CONCAT44((int)uStack_2498._4_4_,(int)(float)uStack_2498);
        uStack_2990 = CONCAT44((int)uStack_2490._4_4_,(int)(float)uStack_2490);
        uStack_2988 = CONCAT44((int)uStack_2488._4_4_,(int)(float)uStack_2488);
        local_940 = local_29a0;
        uStack_938 = uStack_2998;
        uStack_930 = uStack_2990;
        uStack_928 = uStack_2988;
        local_960 = 0x7f0000007f;
        uStack_958 = 0x7f0000007f;
        uStack_950 = 0x7f0000007f;
        uStack_948 = 0x7f0000007f;
        local_9e0 = local_29a0;
        uStack_9d8 = uStack_2998;
        uStack_9d0 = uStack_2990;
        uStack_9c8 = uStack_2988;
        local_a00 = 0x7f0000007f;
        uStack_9f8 = 0x7f0000007f;
        uStack_9f0 = 0x7f0000007f;
        uStack_9e8 = 0x7f0000007f;
        local_990 = 0x7f0000007f;
        uStack_988 = 0x7f0000007f;
        local_9a0 = 0x7f0000007f;
        uStack_998 = 0x7f0000007f;
        local_200 = local_29a0;
        uStack_1f8 = uStack_2998;
        local_210 = 0x7f0000007f;
        uStack_208 = 0x7f0000007f;
        auVar128._8_8_ = uStack_2998;
        auVar128._0_8_ = local_29a0;
        auVar127._8_8_ = 0x7f0000007f;
        auVar127._0_8_ = 0x7f0000007f;
        local_970 = vpaddd_avx(auVar128,auVar127);
        local_220 = uStack_2990;
        uStack_218 = uStack_2988;
        local_230 = 0x7f0000007f;
        uStack_228 = 0x7f0000007f;
        auVar126._8_8_ = uStack_2988;
        auVar126._0_8_ = uStack_2990;
        auVar6._8_8_ = 0x7f0000007f;
        auVar6._0_8_ = 0x7f0000007f;
        local_980 = vpaddd_avx(auVar126,auVar6);
        local_a20 = local_970._0_8_;
        uStack_a18 = local_970._8_8_;
        uStack_a10 = local_980._0_8_;
        uStack_a08 = local_980._8_8_;
        local_9c0 = local_970._0_8_;
        uStack_9b8 = local_970._8_8_;
        uStack_9b0 = local_980._0_8_;
        uStack_9a8 = local_980._8_8_;
        local_500 = local_970._0_8_;
        uStack_4f8 = local_970._8_8_;
        uStack_4f0 = local_980._0_8_;
        uStack_4e8 = local_980._8_8_;
        local_504 = 0x17;
        local_580 = local_970._0_8_;
        uStack_578 = local_970._8_8_;
        uStack_570 = local_980._0_8_;
        uStack_568 = local_980._8_8_;
        local_c0 = local_970._0_8_;
        uStack_b8 = local_970._8_8_;
        local_c4 = 0x17;
        local_520 = vpslld_avx(local_970,ZEXT416(0x17));
        local_e0 = local_980._0_8_;
        uStack_d8 = local_980._8_8_;
        local_e4 = 0x17;
        local_530 = vpslld_avx(local_980,ZEXT416(0x17));
        local_5a0 = local_520._0_8_;
        uStack_598 = local_520._8_8_;
        uStack_590 = local_530._0_8_;
        uStack_588 = local_530._8_8_;
        local_560 = local_520._0_8_;
        uStack_558 = local_520._8_8_;
        uStack_550 = local_530._0_8_;
        uStack_548 = local_530._8_8_;
        local_29a0 = local_520._0_8_;
        uStack_2998 = local_520._8_8_;
        uStack_2990 = local_530._0_8_;
        uStack_2988 = local_530._8_8_;
        local_320 = local_520._0_8_;
        uStack_318 = local_520._8_8_;
        uStack_310 = local_530._0_8_;
        uStack_308 = local_530._8_8_;
        local_2a40 = local_520._0_8_;
        uStack_2a38 = local_520._8_8_;
        uStack_2a30 = local_530._0_8_;
        uStack_2a28 = local_530._8_8_;
        local_26e0 = local_2a20;
        uStack_26d8 = uStack_2a18;
        uStack_26d0 = uStack_2a10;
        uStack_26c8 = uStack_2a08;
        local_2700._0_4_ = local_520._0_4_;
        local_2700._4_4_ = local_520._4_4_;
        uStack_26f8._0_4_ = local_520._8_4_;
        uStack_26f8._4_4_ = local_520._12_4_;
        uStack_26f0._0_4_ = local_530._0_4_;
        uStack_26f0._4_4_ = local_530._4_4_;
        uStack_26e8._0_4_ = local_530._8_4_;
        local_3700 = local_3700 * (float)local_2700;
        fStack_36fc = fStack_36fc * local_2700._4_4_;
        fStack_36f8 = fStack_36f8 * (float)uStack_26f8;
        fStack_36f4 = fStack_36f4 * uStack_26f8._4_4_;
        fStack_36f0 = fStack_36f0 * (float)uStack_26f0;
        fStack_36ec = fStack_36ec * uStack_26f0._4_4_;
        fStack_36e8 = fStack_36e8 * (float)uStack_26e8;
        local_2a20 = CONCAT44(fStack_36fc,local_3700);
        uStack_2a18 = CONCAT44(fStack_36f4,fStack_36f8);
        uStack_2a10 = CONCAT44(fStack_36ec,fStack_36f0);
        uStack_2a08 = CONCAT44(fStack_36e4,fStack_36e8);
        local_36e0 = local_1240._0_8_;
        uStack_36d8 = local_1240._8_8_;
        uStack_36d0 = local_1240._16_8_;
        uStack_36c8 = local_1240._24_8_;
        local_4940 = local_2a20;
        uStack_4938 = uStack_2a18;
        uStack_4930 = uStack_2a10;
        uStack_4928 = uStack_2a08;
        local_4920._0_4_ = auVar5._0_4_;
        local_4920._4_4_ = auVar5._4_4_;
        uStack_4918._0_4_ = auVar5._8_4_;
        uStack_4918._4_4_ = auVar5._12_4_;
        uStack_4910._0_4_ = auVar4._0_4_;
        uStack_4910._4_4_ = auVar4._4_4_;
        uStack_4908._0_4_ = auVar4._8_4_;
        uStack_4908._4_4_ = auVar4._12_4_;
        local_3700 = (float)local_4920 + local_3700;
        fStack_36fc = local_4920._4_4_ + fStack_36fc;
        fStack_36f8 = (float)uStack_4918 + fStack_36f8;
        fStack_36f4 = uStack_4918._4_4_ + fStack_36f4;
        fStack_36f0 = (float)uStack_4910 + fStack_36f0;
        fStack_36ec = uStack_4910._4_4_ + fStack_36ec;
        fStack_36e8 = (float)uStack_4908 + fStack_36e8;
        fStack_36e4 = uStack_4908._4_4_ + fStack_36e4;
        auVar82._16_8_ = local_1240._16_8_;
        auVar82._0_16_ = auVar5;
        auVar82._24_8_ = local_1240._24_8_;
        auVar81._4_4_ = fStack_36fc;
        auVar81._0_4_ = local_3700;
        auVar81._8_4_ = fStack_36f8;
        auVar81._12_4_ = fStack_36f4;
        auVar81._16_4_ = fStack_36f0;
        auVar81._20_4_ = fStack_36ec;
        auVar81._24_4_ = fStack_36e8;
        auVar81._28_4_ = fStack_36e4;
        auVar7 = vdivps_avx(auVar82,auVar81);
        local_6c00 = auVar7._0_8_;
        uStack_6bf8 = auVar7._8_8_;
        uStack_6bf0 = auVar7._16_8_;
        uStack_6be8 = auVar7._24_8_;
        local_5930 = local_5fe0;
        local_4be0 = *(undefined8 *)*local_5fe0;
        uStack_4bd8 = *(undefined8 *)(*local_5fe0 + 8);
        uStack_4bd0 = *(undefined8 *)(*local_5fe0 + 0x10);
        uStack_4bc8 = *(undefined8 *)(*local_5fe0 + 0x18);
        local_3788 = 0x3f800000;
        local_1260 = 0x3f800000;
        auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
        auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
        auVar151._16_16_ = auVar4;
        auVar151._0_16_ = auVar5;
        local_1280._0_8_ = auVar5._0_8_;
        local_1280._8_8_ = auVar5._8_8_;
        local_1280._16_8_ = auVar4._0_8_;
        local_1280._24_8_ = auVar4._8_8_;
        local_4c00 = local_1280._0_8_;
        uStack_4bf8 = local_1280._8_8_;
        uStack_4bf0 = local_1280._16_8_;
        uStack_4be8 = local_1280._24_8_;
        local_2320 = ZEXT832(0) << 0x20;
        local_1320 = 0;
        local_4bc0._8_8_ = SUB328(ZEXT832(0),4);
        uStack_1318 = local_4bc0._8_8_;
        uStack_1310 = 0;
        uStack_1308 = 0;
        auVar11 = vsubps_avx(ZEXT832((ulong)local_4bc0._8_8_) << 0x40,*local_5fe0);
        local_23c0 = 0x3f8000003f800000;
        uStack_23b8 = 0x3f8000003f800000;
        uStack_23b0 = 0x3f8000003f800000;
        uStack_23a8 = 0x3f8000003f800000;
        local_2340._0_8_ = auVar11._0_8_;
        local_1020 = local_2340._0_8_;
        local_2340._8_8_ = auVar11._8_8_;
        uStack_1018 = local_2340._8_8_;
        local_2340._16_8_ = auVar11._16_8_;
        uStack_1010 = local_2340._16_8_;
        local_2340._24_8_ = auVar11._24_8_;
        uStack_1008 = local_2340._24_8_;
        local_1040 = 0x42b0c0a542b0c0a5;
        uStack_1038 = 0x42b0c0a542b0c0a5;
        uStack_1030 = 0x42b0c0a542b0c0a5;
        uStack_1028 = 0x42b0c0a542b0c0a5;
        auVar104._8_8_ = 0x42b0c0a542b0c0a5;
        auVar104._0_8_ = 0x42b0c0a542b0c0a5;
        auVar104._16_8_ = 0x42b0c0a542b0c0a5;
        auVar104._24_8_ = 0x42b0c0a542b0c0a5;
        auVar11 = vminps_avx(auVar11,auVar104);
        local_2340._0_8_ = auVar11._0_8_;
        local_ee0 = local_2340._0_8_;
        local_2340._8_8_ = auVar11._8_8_;
        uStack_ed8 = local_2340._8_8_;
        local_2340._16_8_ = auVar11._16_8_;
        uStack_ed0 = local_2340._16_8_;
        local_2340._24_8_ = auVar11._24_8_;
        uStack_ec8 = local_2340._24_8_;
        local_f00 = 0xc2b0c0a5c2b0c0a5;
        uStack_ef8 = 0xc2b0c0a5c2b0c0a5;
        uStack_ef0 = 0xc2b0c0a5c2b0c0a5;
        uStack_ee8 = 0xc2b0c0a5c2b0c0a5;
        auVar109._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar109._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar109._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar109._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar8 = vmaxps_avx(auVar11,auVar109);
        local_2340._0_8_ = auVar8._0_8_;
        uVar16 = local_2340._0_8_;
        local_2340._8_8_ = auVar8._8_8_;
        uVar17 = local_2340._8_8_;
        local_2340._16_8_ = auVar8._16_8_;
        uVar18 = local_2340._16_8_;
        local_2340._24_8_ = auVar8._24_8_;
        uVar19 = local_2340._24_8_;
        local_1e80 = 0x3fb8aa3b3fb8aa3b;
        uStack_1e78 = 0x3fb8aa3b3fb8aa3b;
        uStack_1e70 = 0x3fb8aa3b3fb8aa3b;
        uStack_1e68 = 0x3fb8aa3b3fb8aa3b;
        local_1e60._0_4_ = auVar8._0_4_;
        local_1e60._4_4_ = auVar8._4_4_;
        uStack_1e58._0_4_ = auVar8._8_4_;
        uStack_1e58._4_4_ = auVar8._12_4_;
        uStack_1e50._0_4_ = auVar8._16_4_;
        uStack_1e50._4_4_ = auVar8._20_4_;
        uStack_1e48._0_4_ = auVar8._24_4_;
        uStack_1e48._4_4_ = auVar8._28_4_;
        local_2380._4_4_ = local_1e60._4_4_ * 1.442695;
        local_2380._0_4_ = (float)local_1e60 * 1.442695;
        uStack_2378._0_4_ = (float)uStack_1e58 * 1.442695;
        uStack_2378._4_4_ = uStack_1e58._4_4_ * 1.442695;
        uStack_2370._0_4_ = (float)uStack_1e50 * 1.442695;
        uStack_2370._4_4_ = uStack_1e50._4_4_ * 1.442695;
        auVar144 = _local_2380;
        uStack_2368._0_4_ = (float)uStack_1e48 * 1.442695;
        uStack_2368._4_4_ = uStack_1e48._4_4_;
        auVar11 = _local_2380;
        local_2120 = local_2380;
        uStack_2118 = uStack_2378;
        uStack_2370 = auVar144._16_8_;
        uStack_2110 = uStack_2370;
        uStack_2368 = auVar11._24_8_;
        uStack_2108 = uStack_2368;
        local_2280 = 0x3f0000003f000000;
        uStack_2278 = 0x3f0000003f000000;
        uStack_2270 = 0x3f0000003f000000;
        uStack_2268 = 0x3f0000003f000000;
        local_2380._4_4_ = local_1e60._4_4_ * 1.442695 + 0.5;
        local_2380._0_4_ = (float)local_1e60 * 1.442695 + 0.5;
        uStack_2378._0_4_ = (float)uStack_1e58 * 1.442695 + 0.5;
        uStack_2378._4_4_ = uStack_1e58._4_4_ * 1.442695 + 0.5;
        uStack_2370._0_4_ = (float)uStack_1e50 * 1.442695 + 0.5;
        uStack_2370._4_4_ = uStack_1e50._4_4_ * 1.442695 + 0.5;
        uStack_2368._0_4_ = (float)uStack_1e48 * 1.442695 + 0.5;
        uStack_2368._4_4_ = uStack_1e48._4_4_ + 0.5;
        auVar9 = vroundps_avx(_local_2380,1);
        auVar11 = vcmpps_avx(_local_2380,auVar9,1);
        local_23e0._0_8_ = auVar11._0_8_;
        local_da0 = local_23e0._0_8_;
        local_23e0._8_8_ = auVar11._8_8_;
        uStack_d98 = local_23e0._8_8_;
        local_23e0._16_8_ = auVar11._16_8_;
        uStack_d90 = local_23e0._16_8_;
        local_23e0._24_8_ = auVar11._24_8_;
        uStack_d88 = local_23e0._24_8_;
        local_dc0 = 0x3f8000003f800000;
        uStack_db8 = 0x3f8000003f800000;
        uStack_db0 = 0x3f8000003f800000;
        uStack_da8 = 0x3f8000003f800000;
        auVar114._8_8_ = 0x3f8000003f800000;
        auVar114._0_8_ = 0x3f8000003f800000;
        auVar114._16_8_ = 0x3f8000003f800000;
        auVar114._24_8_ = 0x3f8000003f800000;
        local_23e0 = vandps_avx(auVar11,auVar114);
        local_2360 = auVar9._0_8_;
        local_16e0 = local_2360;
        uStack_2358 = auVar9._8_8_;
        uStack_16d8 = uStack_2358;
        uStack_2350 = auVar9._16_8_;
        uStack_16d0 = uStack_2350;
        uStack_2348 = auVar9._24_8_;
        uStack_16c8 = uStack_2348;
        local_1700 = local_23e0._0_8_;
        uStack_16f8 = local_23e0._8_8_;
        uStack_16f0 = local_23e0._16_8_;
        uStack_16e8 = local_23e0._24_8_;
        _local_2380 = vsubps_avx(auVar9,local_23e0);
        local_1ec0 = 0x3f3180003f318000;
        uStack_1eb8 = 0x3f3180003f318000;
        uStack_1eb0 = 0x3f3180003f318000;
        uStack_1ea8 = 0x3f3180003f318000;
        local_1ea0._0_4_ = local_2380._0_4_;
        local_1ea0._4_4_ = local_2380._4_4_;
        uStack_1e98._0_4_ = local_2380._8_4_;
        uStack_1e98._4_4_ = local_2380._12_4_;
        uStack_1e90._0_4_ = local_2380._16_4_;
        uStack_1e90._4_4_ = local_2380._20_4_;
        uStack_1e88._0_4_ = local_2380._24_4_;
        uStack_1e88._4_4_ = local_2380._28_4_;
        local_2360._4_4_ = local_1ea0._4_4_ * 0.6933594;
        local_2360._0_4_ = (float)local_1ea0 * 0.6933594;
        uStack_2358._0_4_ = (float)uStack_1e98 * 0.6933594;
        uStack_2358._4_4_ = uStack_1e98._4_4_ * 0.6933594;
        uStack_2350._0_4_ = (float)uStack_1e90 * 0.6933594;
        uStack_2350._4_4_ = uStack_1e90._4_4_ * 0.6933594;
        auVar144 = _local_2360;
        uStack_2348._0_4_ = (float)uStack_1e88 * 0.6933594;
        uStack_2348._4_4_ = uStack_1e88._4_4_;
        auVar142 = _local_2360;
        local_1ee0 = local_2380;
        uStack_1ed8 = uStack_2378;
        uStack_1ed0 = uStack_2370;
        uStack_1ec8 = uStack_2368;
        local_1f00 = 0xb95e8083b95e8083;
        uStack_1ef8 = 0xb95e8083b95e8083;
        uStack_1ef0 = 0xb95e8083b95e8083;
        uStack_1ee8 = 0xb95e8083b95e8083;
        local_1720 = local_2340._0_8_;
        uStack_1718 = local_2340._8_8_;
        uStack_1710 = local_2340._16_8_;
        uStack_1708 = local_2340._24_8_;
        local_1740 = local_2360;
        uStack_1738 = uStack_2358;
        uStack_2350 = auVar144._16_8_;
        uStack_1730 = uStack_2350;
        uStack_2348 = auVar142._24_8_;
        uStack_1728 = uStack_2348;
        auVar90._16_8_ = uStack_2350;
        auVar90._0_16_ = _local_2360;
        auVar90._24_8_ = uStack_2348;
        auVar11 = vsubps_avx(auVar8,auVar90);
        local_2340._0_8_ = auVar11._0_8_;
        local_1760 = local_2340._0_8_;
        local_2340._8_8_ = auVar11._8_8_;
        uStack_1758 = local_2340._8_8_;
        local_2340._16_8_ = auVar11._16_8_;
        uStack_1750 = local_2340._16_8_;
        local_2340._24_8_ = auVar11._24_8_;
        uStack_1748 = local_2340._24_8_;
        local_1780 = CONCAT44(local_1ea0._4_4_ * -0.00021219444,(float)local_1ea0 * -0.00021219444);
        uStack_1778 = CONCAT44(uStack_1e98._4_4_ * -0.00021219444,
                               (float)uStack_1e98 * -0.00021219444);
        uStack_1770 = CONCAT44(uStack_1e90._4_4_ * -0.00021219444,
                               (float)uStack_1e90 * -0.00021219444);
        uStack_1768 = CONCAT44(uStack_1e88._4_4_,(float)uStack_1e88 * -0.00021219444);
        auVar89._8_8_ = uStack_1778;
        auVar89._0_8_ = local_1780;
        auVar89._16_8_ = uStack_1770;
        auVar89._24_8_ = uStack_1768;
        local_2340 = vsubps_avx(auVar11,auVar89);
        local_1f40 = local_2340._0_8_;
        uStack_1f38 = local_2340._8_8_;
        uStack_1f30 = local_2340._16_8_;
        uStack_1f28 = local_2340._24_8_;
        local_1f20._0_4_ = local_2340._0_4_;
        local_1f20._4_4_ = local_2340._4_4_;
        uStack_1f18._0_4_ = local_2340._8_4_;
        uStack_1f18._4_4_ = local_2340._12_4_;
        uStack_1f10._0_4_ = local_2340._16_4_;
        uStack_1f10._4_4_ = local_2340._20_4_;
        uStack_1f08._0_4_ = local_2340._24_4_;
        uStack_1f08._4_4_ = local_2340._28_4_;
        fStack_23e4 = uStack_1f08._4_4_;
        local_2400 = (float)local_1f20 * (float)local_1f20;
        fStack_23fc = local_1f20._4_4_ * local_1f20._4_4_;
        fStack_23f8 = (float)uStack_1f18 * (float)uStack_1f18;
        fStack_23f4 = uStack_1f18._4_4_ * uStack_1f18._4_4_;
        fStack_23f0 = (float)uStack_1f10 * (float)uStack_1f10;
        fStack_23ec = uStack_1f10._4_4_ * uStack_1f10._4_4_;
        fStack_23e8 = (float)uStack_1f08 * (float)uStack_1f08;
        local_1f60 = 0x3950696739506967;
        uStack_1f58 = 0x3950696739506967;
        uStack_1f50 = 0x3950696739506967;
        uStack_1f48 = 0x3950696739506967;
        local_1f80 = local_2340._0_8_;
        uStack_1f78 = local_2340._8_8_;
        uStack_1f70 = local_2340._16_8_;
        uStack_1f68 = local_2340._24_8_;
        local_2420 = CONCAT44(local_1f20._4_4_ * 0.00019875691,(float)local_1f20 * 0.00019875691);
        uStack_2418 = CONCAT44(uStack_1f18._4_4_ * 0.00019875691,(float)uStack_1f18 * 0.00019875691)
        ;
        uStack_2410 = CONCAT44(uStack_1f10._4_4_ * 0.00019875691,(float)uStack_1f10 * 0.00019875691)
        ;
        uStack_2408 = CONCAT44(0x39506967,(float)uStack_1f08 * 0.00019875691);
        local_2160 = local_2420;
        uStack_2158 = uStack_2418;
        uStack_2150 = uStack_2410;
        uStack_2148 = uStack_2408;
        local_2180 = 0x3ab743ce3ab743ce;
        uStack_2178 = 0x3ab743ce3ab743ce;
        uStack_2170 = 0x3ab743ce3ab743ce;
        uStack_2168 = 0x3ab743ce3ab743ce;
        local_36c0 = (float)local_1f20 * 0.00019875691 + 0.0013981999;
        fStack_36bc = local_1f20._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_36b8 = (float)uStack_1f18 * 0.00019875691 + 0.0013981999;
        fStack_36b4 = uStack_1f18._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_36b0 = (float)uStack_1f10 * 0.00019875691 + 0.0013981999;
        fStack_36ac = uStack_1f10._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_36a8 = (float)uStack_1f08 * 0.00019875691 + 0.0013981999;
        local_2420 = CONCAT44(fStack_36bc,local_36c0);
        uStack_2418 = CONCAT44(fStack_36b4,fStack_36b8);
        uStack_2410 = CONCAT44(fStack_36ac,fStack_36b0);
        uStack_2408 = CONCAT44(0x3ad150fb,fStack_36a8);
        local_1fa0 = local_2420;
        uStack_1f98 = uStack_2418;
        uStack_1f90 = uStack_2410;
        uStack_1f88 = uStack_2408;
        local_1fc0 = local_2340._0_8_;
        uStack_1fb8 = local_2340._8_8_;
        uStack_1fb0 = local_2340._16_8_;
        uStack_1fa8 = local_2340._24_8_;
        local_36c0 = local_36c0 * (float)local_1f20;
        fStack_36bc = fStack_36bc * local_1f20._4_4_;
        fStack_36b8 = fStack_36b8 * (float)uStack_1f18;
        fStack_36b4 = fStack_36b4 * uStack_1f18._4_4_;
        fStack_36b0 = fStack_36b0 * (float)uStack_1f10;
        fStack_36ac = fStack_36ac * uStack_1f10._4_4_;
        fStack_36a8 = fStack_36a8 * (float)uStack_1f08;
        local_2420 = CONCAT44(fStack_36bc,local_36c0);
        uStack_2418 = CONCAT44(fStack_36b4,fStack_36b8);
        uStack_2410 = CONCAT44(fStack_36ac,fStack_36b0);
        uStack_2408 = CONCAT44(0x3ad150fb,fStack_36a8);
        local_21a0 = local_2420;
        uStack_2198 = uStack_2418;
        uStack_2190 = uStack_2410;
        uStack_2188 = uStack_2408;
        local_21c0 = 0x3c0889083c088908;
        uStack_21b8 = 0x3c0889083c088908;
        uStack_21b0 = 0x3c0889083c088908;
        uStack_21a8 = 0x3c0889083c088908;
        local_36c0 = local_36c0 + 0.008333452;
        fStack_36bc = fStack_36bc + 0.008333452;
        fStack_36b8 = fStack_36b8 + 0.008333452;
        fStack_36b4 = fStack_36b4 + 0.008333452;
        fStack_36b0 = fStack_36b0 + 0.008333452;
        fStack_36ac = fStack_36ac + 0.008333452;
        fStack_36a8 = fStack_36a8 + 0.008333452;
        local_2420 = CONCAT44(fStack_36bc,local_36c0);
        uStack_2418 = CONCAT44(fStack_36b4,fStack_36b8);
        uStack_2410 = CONCAT44(fStack_36ac,fStack_36b0);
        uStack_2408 = CONCAT44(0x3c22b327,fStack_36a8);
        local_1fe0 = local_2420;
        uStack_1fd8 = uStack_2418;
        uStack_1fd0 = uStack_2410;
        uStack_1fc8 = uStack_2408;
        local_2000 = local_2340._0_8_;
        uStack_1ff8 = local_2340._8_8_;
        uStack_1ff0 = local_2340._16_8_;
        uStack_1fe8 = local_2340._24_8_;
        local_36c0 = local_36c0 * (float)local_1f20;
        fStack_36bc = fStack_36bc * local_1f20._4_4_;
        fStack_36b8 = fStack_36b8 * (float)uStack_1f18;
        fStack_36b4 = fStack_36b4 * uStack_1f18._4_4_;
        fStack_36b0 = fStack_36b0 * (float)uStack_1f10;
        fStack_36ac = fStack_36ac * uStack_1f10._4_4_;
        fStack_36a8 = fStack_36a8 * (float)uStack_1f08;
        local_2420 = CONCAT44(fStack_36bc,local_36c0);
        uStack_2418 = CONCAT44(fStack_36b4,fStack_36b8);
        uStack_2410 = CONCAT44(fStack_36ac,fStack_36b0);
        uStack_2408 = CONCAT44(0x3c22b327,fStack_36a8);
        local_21e0 = local_2420;
        uStack_21d8 = uStack_2418;
        uStack_21d0 = uStack_2410;
        uStack_21c8 = uStack_2408;
        local_2200 = 0x3d2aa9c13d2aa9c1;
        uStack_21f8 = 0x3d2aa9c13d2aa9c1;
        uStack_21f0 = 0x3d2aa9c13d2aa9c1;
        uStack_21e8 = 0x3d2aa9c13d2aa9c1;
        local_36c0 = local_36c0 + 0.041665796;
        fStack_36bc = fStack_36bc + 0.041665796;
        fStack_36b8 = fStack_36b8 + 0.041665796;
        fStack_36b4 = fStack_36b4 + 0.041665796;
        fStack_36b0 = fStack_36b0 + 0.041665796;
        fStack_36ac = fStack_36ac + 0.041665796;
        fStack_36a8 = fStack_36a8 + 0.041665796;
        local_2420 = CONCAT44(fStack_36bc,local_36c0);
        uStack_2418 = CONCAT44(fStack_36b4,fStack_36b8);
        uStack_2410 = CONCAT44(fStack_36ac,fStack_36b0);
        uStack_2408 = CONCAT44(0x3d53568b,fStack_36a8);
        local_2020 = local_2420;
        uStack_2018 = uStack_2418;
        uStack_2010 = uStack_2410;
        uStack_2008 = uStack_2408;
        local_2040 = local_2340._0_8_;
        uStack_2038 = local_2340._8_8_;
        uStack_2030 = local_2340._16_8_;
        uStack_2028 = local_2340._24_8_;
        local_36c0 = local_36c0 * (float)local_1f20;
        fStack_36bc = fStack_36bc * local_1f20._4_4_;
        fStack_36b8 = fStack_36b8 * (float)uStack_1f18;
        fStack_36b4 = fStack_36b4 * uStack_1f18._4_4_;
        fStack_36b0 = fStack_36b0 * (float)uStack_1f10;
        fStack_36ac = fStack_36ac * uStack_1f10._4_4_;
        fStack_36a8 = fStack_36a8 * (float)uStack_1f08;
        local_2420 = CONCAT44(fStack_36bc,local_36c0);
        uStack_2418 = CONCAT44(fStack_36b4,fStack_36b8);
        uStack_2410 = CONCAT44(fStack_36ac,fStack_36b0);
        uStack_2408 = CONCAT44(0x3d53568b,fStack_36a8);
        local_2220 = local_2420;
        uStack_2218 = uStack_2418;
        uStack_2210 = uStack_2410;
        uStack_2208 = uStack_2408;
        local_2240 = 0x3e2aaaaa3e2aaaaa;
        uStack_2238 = 0x3e2aaaaa3e2aaaaa;
        uStack_2230 = 0x3e2aaaaa3e2aaaaa;
        uStack_2228 = 0x3e2aaaaa3e2aaaaa;
        local_36c0 = local_36c0 + 0.16666666;
        fStack_36bc = fStack_36bc + 0.16666666;
        fStack_36b8 = fStack_36b8 + 0.16666666;
        fStack_36b4 = fStack_36b4 + 0.16666666;
        fStack_36b0 = fStack_36b0 + 0.16666666;
        fStack_36ac = fStack_36ac + 0.16666666;
        fStack_36a8 = fStack_36a8 + 0.16666666;
        local_2420 = CONCAT44(fStack_36bc,local_36c0);
        uStack_2418 = CONCAT44(fStack_36b4,fStack_36b8);
        uStack_2410 = CONCAT44(fStack_36ac,fStack_36b0);
        uStack_2408 = CONCAT44(0x3e5f804d,fStack_36a8);
        local_2060 = local_2420;
        uStack_2058 = uStack_2418;
        uStack_2050 = uStack_2410;
        uStack_2048 = uStack_2408;
        local_2080 = local_2340._0_8_;
        uStack_2078 = local_2340._8_8_;
        uStack_2070 = local_2340._16_8_;
        uStack_2068 = local_2340._24_8_;
        local_36c0 = local_36c0 * (float)local_1f20;
        fStack_36bc = fStack_36bc * local_1f20._4_4_;
        fStack_36b8 = fStack_36b8 * (float)uStack_1f18;
        fStack_36b4 = fStack_36b4 * uStack_1f18._4_4_;
        fStack_36b0 = fStack_36b0 * (float)uStack_1f10;
        fStack_36ac = fStack_36ac * uStack_1f10._4_4_;
        fStack_36a8 = fStack_36a8 * (float)uStack_1f08;
        local_2420 = CONCAT44(fStack_36bc,local_36c0);
        uStack_2418 = CONCAT44(fStack_36b4,fStack_36b8);
        uStack_2410 = CONCAT44(fStack_36ac,fStack_36b0);
        uStack_2408 = CONCAT44(0x3e5f804d,fStack_36a8);
        local_2260 = local_2420;
        uStack_2258 = uStack_2418;
        uStack_2250 = uStack_2410;
        uStack_2248 = uStack_2408;
        local_36c0 = local_36c0 + 0.5;
        fStack_36bc = fStack_36bc + 0.5;
        fStack_36b8 = fStack_36b8 + 0.5;
        fStack_36b4 = fStack_36b4 + 0.5;
        fStack_36b0 = fStack_36b0 + 0.5;
        fStack_36ac = fStack_36ac + 0.5;
        fStack_36a8 = fStack_36a8 + 0.5;
        local_2420 = CONCAT44(fStack_36bc,local_36c0);
        uStack_2418 = CONCAT44(fStack_36b4,fStack_36b8);
        uStack_2410 = CONCAT44(fStack_36ac,fStack_36b0);
        uStack_2408 = CONCAT44(0x3f37e013,fStack_36a8);
        local_20a0 = local_2420;
        uStack_2098 = uStack_2418;
        uStack_2090 = uStack_2410;
        uStack_2088 = uStack_2408;
        local_20c0 = CONCAT44(fStack_23fc,local_2400);
        uStack_20b8 = CONCAT44(fStack_23f4,fStack_23f8);
        uStack_20b0 = CONCAT44(fStack_23ec,fStack_23f0);
        uStack_20a8 = CONCAT44(uStack_1f08._4_4_,fStack_23e8);
        local_36c0 = local_36c0 * local_2400;
        fStack_36bc = fStack_36bc * fStack_23fc;
        fStack_36b8 = fStack_36b8 * fStack_23f8;
        fStack_36b4 = fStack_36b4 * fStack_23f4;
        fStack_36b0 = fStack_36b0 * fStack_23f0;
        fStack_36ac = fStack_36ac * fStack_23ec;
        fStack_36a8 = fStack_36a8 * fStack_23e8;
        local_2420 = CONCAT44(fStack_36bc,local_36c0);
        uStack_2418 = CONCAT44(fStack_36b4,fStack_36b8);
        uStack_2410 = CONCAT44(fStack_36ac,fStack_36b0);
        uStack_2408 = CONCAT44(0x3f37e013,fStack_36a8);
        local_22a0 = local_2420;
        uStack_2298 = uStack_2418;
        uStack_2290 = uStack_2410;
        uStack_2288 = uStack_2408;
        local_22c0 = local_2340._0_8_;
        uStack_22b8 = local_2340._8_8_;
        uStack_22b0 = local_2340._16_8_;
        uStack_22a8 = local_2340._24_8_;
        local_36c0 = local_36c0 + (float)local_1f20;
        fStack_36bc = fStack_36bc + local_1f20._4_4_;
        fStack_36b8 = fStack_36b8 + (float)uStack_1f18;
        fStack_36b4 = fStack_36b4 + uStack_1f18._4_4_;
        fStack_36b0 = fStack_36b0 + (float)uStack_1f10;
        fStack_36ac = fStack_36ac + uStack_1f10._4_4_;
        fStack_36a8 = fStack_36a8 + (float)uStack_1f08;
        local_2420 = CONCAT44(fStack_36bc,local_36c0);
        uStack_2418 = CONCAT44(fStack_36b4,fStack_36b8);
        uStack_2410 = CONCAT44(fStack_36ac,fStack_36b0);
        uStack_2408 = CONCAT44(uStack_1f08._4_4_ + 0.71826285,fStack_36a8);
        local_22e0 = local_2420;
        uStack_22d8 = uStack_2418;
        uStack_22d0 = uStack_2410;
        uStack_22c8 = uStack_2408;
        local_2300 = 0x3f8000003f800000;
        uStack_22f8 = 0x3f8000003f800000;
        uStack_22f0 = 0x3f8000003f800000;
        uStack_22e8 = 0x3f8000003f800000;
        local_36c0 = local_36c0 + 1.0;
        fStack_36bc = fStack_36bc + 1.0;
        fStack_36b8 = fStack_36b8 + 1.0;
        fStack_36b4 = fStack_36b4 + 1.0;
        fStack_36b0 = fStack_36b0 + 1.0;
        fStack_36ac = fStack_36ac + 1.0;
        fStack_36a8 = fStack_36a8 + 1.0;
        fStack_36a4 = uStack_1f08._4_4_ + 0.71826285 + 1.0;
        local_2420 = CONCAT44(fStack_36bc,local_36c0);
        uStack_2418 = CONCAT44(fStack_36b4,fStack_36b8);
        uStack_2410 = CONCAT44(fStack_36ac,fStack_36b0);
        uStack_2408 = CONCAT44(fStack_36a4,fStack_36a8);
        local_ca0 = local_2380;
        uStack_c98 = uStack_2378;
        uStack_c90 = uStack_2370;
        uStack_c88 = uStack_2368;
        local_23a0 = CONCAT44((int)local_1ea0._4_4_,(int)(float)local_1ea0);
        uStack_2398 = CONCAT44((int)uStack_1e98._4_4_,(int)(float)uStack_1e98);
        uStack_2390 = CONCAT44((int)uStack_1e90._4_4_,(int)(float)uStack_1e90);
        uStack_2388 = CONCAT44((int)uStack_1e88._4_4_,(int)(float)uStack_1e88);
        local_a40 = local_23a0;
        uStack_a38 = uStack_2398;
        uStack_a30 = uStack_2390;
        uStack_a28 = uStack_2388;
        local_a60 = 0x7f0000007f;
        uStack_a58 = 0x7f0000007f;
        uStack_a50 = 0x7f0000007f;
        uStack_a48 = 0x7f0000007f;
        local_ae0 = local_23a0;
        uStack_ad8 = uStack_2398;
        uStack_ad0 = uStack_2390;
        uStack_ac8 = uStack_2388;
        local_b00 = 0x7f0000007f;
        uStack_af8 = 0x7f0000007f;
        uStack_af0 = 0x7f0000007f;
        uStack_ae8 = 0x7f0000007f;
        local_a90 = 0x7f0000007f;
        uStack_a88 = 0x7f0000007f;
        local_aa0 = 0x7f0000007f;
        uStack_a98 = 0x7f0000007f;
        local_1c0 = local_23a0;
        uStack_1b8 = uStack_2398;
        local_1d0 = 0x7f0000007f;
        uStack_1c8 = 0x7f0000007f;
        auVar132._8_8_ = uStack_2398;
        auVar132._0_8_ = local_23a0;
        auVar131._8_8_ = 0x7f0000007f;
        auVar131._0_8_ = 0x7f0000007f;
        local_a70 = vpaddd_avx(auVar132,auVar131);
        local_1e0 = uStack_2390;
        uStack_1d8 = uStack_2388;
        local_1f0 = 0x7f0000007f;
        uStack_1e8 = 0x7f0000007f;
        auVar130._8_8_ = uStack_2388;
        auVar130._0_8_ = uStack_2390;
        auVar129._8_8_ = 0x7f0000007f;
        auVar129._0_8_ = 0x7f0000007f;
        local_a80 = vpaddd_avx(auVar130,auVar129);
        local_b20 = local_a70._0_8_;
        uStack_b18 = local_a70._8_8_;
        uStack_b10 = local_a80._0_8_;
        uStack_b08 = local_a80._8_8_;
        local_ac0 = local_a70._0_8_;
        uStack_ab8 = local_a70._8_8_;
        uStack_ab0 = local_a80._0_8_;
        uStack_aa8 = local_a80._8_8_;
        local_5c0 = local_a70._0_8_;
        uStack_5b8 = local_a70._8_8_;
        uStack_5b0 = local_a80._0_8_;
        uStack_5a8 = local_a80._8_8_;
        local_5c4 = 0x17;
        local_640 = local_a70._0_8_;
        uStack_638 = local_a70._8_8_;
        uStack_630 = local_a80._0_8_;
        uStack_628 = local_a80._8_8_;
        local_80 = local_a70._0_8_;
        uStack_78 = local_a70._8_8_;
        local_84 = 0x17;
        local_5e0 = vpslld_avx(local_a70,ZEXT416(0x17));
        local_a0 = local_a80._0_8_;
        uStack_98 = local_a80._8_8_;
        local_a4 = 0x17;
        local_5f0 = vpslld_avx(local_a80,ZEXT416(0x17));
        local_660 = local_5e0._0_8_;
        uStack_658 = local_5e0._8_8_;
        uStack_650 = local_5f0._0_8_;
        uStack_648 = local_5f0._8_8_;
        local_620 = local_5e0._0_8_;
        uStack_618 = local_5e0._8_8_;
        uStack_610 = local_5f0._0_8_;
        uStack_608 = local_5f0._8_8_;
        local_23a0 = local_5e0._0_8_;
        uStack_2398 = local_5e0._8_8_;
        uStack_2390 = local_5f0._0_8_;
        uStack_2388 = local_5f0._8_8_;
        local_340 = local_5e0._0_8_;
        uStack_338 = local_5e0._8_8_;
        uStack_330 = local_5f0._0_8_;
        uStack_328 = local_5f0._8_8_;
        local_2440 = local_5e0._0_8_;
        uStack_2438 = local_5e0._8_8_;
        uStack_2430 = local_5f0._0_8_;
        uStack_2428 = local_5f0._8_8_;
        local_20e0 = local_2420;
        uStack_20d8 = uStack_2418;
        uStack_20d0 = uStack_2410;
        uStack_20c8 = uStack_2408;
        local_2100._0_4_ = local_5e0._0_4_;
        local_2100._4_4_ = local_5e0._4_4_;
        uStack_20f8._0_4_ = local_5e0._8_4_;
        uStack_20f8._4_4_ = local_5e0._12_4_;
        uStack_20f0._0_4_ = local_5f0._0_4_;
        uStack_20f0._4_4_ = local_5f0._4_4_;
        uStack_20e8._0_4_ = local_5f0._8_4_;
        local_36c0 = local_36c0 * (float)local_2100;
        fStack_36bc = fStack_36bc * local_2100._4_4_;
        fStack_36b8 = fStack_36b8 * (float)uStack_20f8;
        fStack_36b4 = fStack_36b4 * uStack_20f8._4_4_;
        fStack_36b0 = fStack_36b0 * (float)uStack_20f0;
        fStack_36ac = fStack_36ac * uStack_20f0._4_4_;
        fStack_36a8 = fStack_36a8 * (float)uStack_20e8;
        local_2420 = CONCAT44(fStack_36bc,local_36c0);
        uStack_2418 = CONCAT44(fStack_36b4,fStack_36b8);
        uStack_2410 = CONCAT44(fStack_36ac,fStack_36b0);
        uStack_2408 = CONCAT44(fStack_36a4,fStack_36a8);
        local_36a0 = local_1280._0_8_;
        uStack_3698 = local_1280._8_8_;
        uStack_3690 = local_1280._16_8_;
        uStack_3688 = local_1280._24_8_;
        local_4900 = local_2420;
        uStack_48f8 = uStack_2418;
        uStack_48f0 = uStack_2410;
        uStack_48e8 = uStack_2408;
        local_48e0._0_4_ = auVar5._0_4_;
        local_48e0._4_4_ = auVar5._4_4_;
        uStack_48d8._0_4_ = auVar5._8_4_;
        uStack_48d8._4_4_ = auVar5._12_4_;
        uStack_48d0._0_4_ = auVar4._0_4_;
        uStack_48d0._4_4_ = auVar4._4_4_;
        uStack_48c8._0_4_ = auVar4._8_4_;
        uStack_48c8._4_4_ = auVar4._12_4_;
        local_36c0 = (float)local_48e0 + local_36c0;
        fStack_36bc = local_48e0._4_4_ + fStack_36bc;
        fStack_36b8 = (float)uStack_48d8 + fStack_36b8;
        fStack_36b4 = uStack_48d8._4_4_ + fStack_36b4;
        fStack_36b0 = (float)uStack_48d0 + fStack_36b0;
        fStack_36ac = uStack_48d0._4_4_ + fStack_36ac;
        fStack_36a8 = (float)uStack_48c8 + fStack_36a8;
        fStack_36a4 = uStack_48c8._4_4_ + fStack_36a4;
        auVar84._16_8_ = local_1280._16_8_;
        auVar84._0_16_ = auVar5;
        auVar84._24_8_ = local_1280._24_8_;
        auVar83._4_4_ = fStack_36bc;
        auVar83._0_4_ = local_36c0;
        auVar83._8_4_ = fStack_36b8;
        auVar83._12_4_ = fStack_36b4;
        auVar83._16_4_ = fStack_36b0;
        auVar83._20_4_ = fStack_36ac;
        auVar83._24_4_ = fStack_36a8;
        auVar83._28_4_ = fStack_36a4;
        auVar8 = vdivps_avx(auVar84,auVar83);
        local_6d20 = auVar8._0_8_;
        uStack_6d18 = auVar8._8_8_;
        uStack_6d10 = auVar8._16_8_;
        uStack_6d08 = auVar8._24_8_;
        local_5938 = local_5fe8;
        local_4c40 = *(undefined8 *)*local_5fe8;
        uStack_4c38 = *(undefined8 *)(*local_5fe8 + 8);
        uStack_4c30 = *(undefined8 *)(*local_5fe8 + 0x10);
        uStack_4c28 = *(undefined8 *)(*local_5fe8 + 0x18);
        local_3784 = 0x3f800000;
        local_12a0 = 0x3f800000;
        auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
        auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
        auVar152._16_16_ = auVar4;
        auVar152._0_16_ = auVar5;
        local_12c0._0_8_ = auVar5._0_8_;
        local_12c0._8_8_ = auVar5._8_8_;
        local_12c0._16_8_ = auVar4._0_8_;
        local_12c0._24_8_ = auVar4._8_8_;
        local_4c60 = local_12c0._0_8_;
        uStack_4c58 = local_12c0._8_8_;
        uStack_4c50 = local_12c0._16_8_;
        uStack_4c48 = local_12c0._24_8_;
        local_1d20 = ZEXT832(0) << 0x20;
        local_12e0 = 0;
        local_4c20._8_8_ = SUB328(ZEXT832(0),4);
        uStack_12d8 = local_4c20._8_8_;
        uStack_12d0 = 0;
        uStack_12c8 = 0;
        auVar11 = vsubps_avx(ZEXT832((ulong)local_4c20._8_8_) << 0x40,*local_5fe8);
        local_1dc0 = 0x3f8000003f800000;
        uStack_1db8 = 0x3f8000003f800000;
        uStack_1db0 = 0x3f8000003f800000;
        uStack_1da8 = 0x3f8000003f800000;
        local_1d40._0_8_ = auVar11._0_8_;
        local_1060 = local_1d40._0_8_;
        local_1d40._8_8_ = auVar11._8_8_;
        uStack_1058 = local_1d40._8_8_;
        local_1d40._16_8_ = auVar11._16_8_;
        uStack_1050 = local_1d40._16_8_;
        local_1d40._24_8_ = auVar11._24_8_;
        uStack_1048 = local_1d40._24_8_;
        local_1080 = 0x42b0c0a542b0c0a5;
        uStack_1078 = 0x42b0c0a542b0c0a5;
        uStack_1070 = 0x42b0c0a542b0c0a5;
        uStack_1068 = 0x42b0c0a542b0c0a5;
        auVar103._8_8_ = 0x42b0c0a542b0c0a5;
        auVar103._0_8_ = 0x42b0c0a542b0c0a5;
        auVar103._16_8_ = 0x42b0c0a542b0c0a5;
        auVar103._24_8_ = 0x42b0c0a542b0c0a5;
        auVar11 = vminps_avx(auVar11,auVar103);
        local_1d40._0_8_ = auVar11._0_8_;
        local_f20 = local_1d40._0_8_;
        local_1d40._8_8_ = auVar11._8_8_;
        uStack_f18 = local_1d40._8_8_;
        local_1d40._16_8_ = auVar11._16_8_;
        uStack_f10 = local_1d40._16_8_;
        local_1d40._24_8_ = auVar11._24_8_;
        uStack_f08 = local_1d40._24_8_;
        local_f40 = 0xc2b0c0a5c2b0c0a5;
        uStack_f38 = 0xc2b0c0a5c2b0c0a5;
        uStack_f30 = 0xc2b0c0a5c2b0c0a5;
        uStack_f28 = 0xc2b0c0a5c2b0c0a5;
        auVar108._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar108._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar108._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar108._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar9 = vmaxps_avx(auVar11,auVar108);
        local_1d40._0_8_ = auVar9._0_8_;
        uVar20 = local_1d40._0_8_;
        local_1d40._8_8_ = auVar9._8_8_;
        uVar21 = local_1d40._8_8_;
        local_1d40._16_8_ = auVar9._16_8_;
        uVar22 = local_1d40._16_8_;
        local_1d40._24_8_ = auVar9._24_8_;
        uVar23 = local_1d40._24_8_;
        local_1880 = 0x3fb8aa3b3fb8aa3b;
        uStack_1878 = 0x3fb8aa3b3fb8aa3b;
        uStack_1870 = 0x3fb8aa3b3fb8aa3b;
        uStack_1868 = 0x3fb8aa3b3fb8aa3b;
        local_1860._0_4_ = auVar9._0_4_;
        local_1860._4_4_ = auVar9._4_4_;
        uStack_1858._0_4_ = auVar9._8_4_;
        uStack_1858._4_4_ = auVar9._12_4_;
        uStack_1850._0_4_ = auVar9._16_4_;
        uStack_1850._4_4_ = auVar9._20_4_;
        uStack_1848._0_4_ = auVar9._24_4_;
        uStack_1848._4_4_ = auVar9._28_4_;
        local_1d80._4_4_ = local_1860._4_4_ * 1.442695;
        local_1d80._0_4_ = (float)local_1860 * 1.442695;
        uStack_1d78._0_4_ = (float)uStack_1858 * 1.442695;
        uStack_1d78._4_4_ = uStack_1858._4_4_ * 1.442695;
        uStack_1d70._0_4_ = (float)uStack_1850 * 1.442695;
        uStack_1d70._4_4_ = uStack_1850._4_4_ * 1.442695;
        auVar144 = _local_1d80;
        uStack_1d68._0_4_ = (float)uStack_1848 * 1.442695;
        uStack_1d68._4_4_ = uStack_1848._4_4_;
        auVar11 = _local_1d80;
        local_1b20 = local_1d80;
        uStack_1b18 = uStack_1d78;
        uStack_1d70 = auVar144._16_8_;
        uStack_1b10 = uStack_1d70;
        uStack_1d68 = auVar11._24_8_;
        uStack_1b08 = uStack_1d68;
        local_1c80 = 0x3f0000003f000000;
        uStack_1c78 = 0x3f0000003f000000;
        uStack_1c70 = 0x3f0000003f000000;
        uStack_1c68 = 0x3f0000003f000000;
        local_1d80._4_4_ = local_1860._4_4_ * 1.442695 + 0.5;
        local_1d80._0_4_ = (float)local_1860 * 1.442695 + 0.5;
        uStack_1d78._0_4_ = (float)uStack_1858 * 1.442695 + 0.5;
        uStack_1d78._4_4_ = uStack_1858._4_4_ * 1.442695 + 0.5;
        uStack_1d70._0_4_ = (float)uStack_1850 * 1.442695 + 0.5;
        uStack_1d70._4_4_ = uStack_1850._4_4_ * 1.442695 + 0.5;
        uStack_1d68._0_4_ = (float)uStack_1848 * 1.442695 + 0.5;
        uStack_1d68._4_4_ = uStack_1848._4_4_ + 0.5;
        auVar10 = vroundps_avx(_local_1d80,1);
        auVar11 = vcmpps_avx(_local_1d80,auVar10,1);
        local_1de0._0_8_ = auVar11._0_8_;
        local_de0 = local_1de0._0_8_;
        local_1de0._8_8_ = auVar11._8_8_;
        uStack_dd8 = local_1de0._8_8_;
        local_1de0._16_8_ = auVar11._16_8_;
        uStack_dd0 = local_1de0._16_8_;
        local_1de0._24_8_ = auVar11._24_8_;
        uStack_dc8 = local_1de0._24_8_;
        local_e00 = 0x3f8000003f800000;
        uStack_df8 = 0x3f8000003f800000;
        uStack_df0 = 0x3f8000003f800000;
        uStack_de8 = 0x3f8000003f800000;
        auVar113._8_8_ = 0x3f8000003f800000;
        auVar113._0_8_ = 0x3f8000003f800000;
        auVar113._16_8_ = 0x3f8000003f800000;
        auVar113._24_8_ = 0x3f8000003f800000;
        local_1de0 = vandps_avx(auVar11,auVar113);
        local_1d60 = auVar10._0_8_;
        local_17a0 = local_1d60;
        uStack_1d58 = auVar10._8_8_;
        uStack_1798 = uStack_1d58;
        uStack_1d50 = auVar10._16_8_;
        uStack_1790 = uStack_1d50;
        uStack_1d48 = auVar10._24_8_;
        uStack_1788 = uStack_1d48;
        local_17c0 = local_1de0._0_8_;
        uStack_17b8 = local_1de0._8_8_;
        uStack_17b0 = local_1de0._16_8_;
        uStack_17a8 = local_1de0._24_8_;
        _local_1d80 = vsubps_avx(auVar10,local_1de0);
        local_18c0 = 0x3f3180003f318000;
        uStack_18b8 = 0x3f3180003f318000;
        uStack_18b0 = 0x3f3180003f318000;
        uStack_18a8 = 0x3f3180003f318000;
        local_18a0._0_4_ = local_1d80._0_4_;
        local_18a0._4_4_ = local_1d80._4_4_;
        uStack_1898._0_4_ = local_1d80._8_4_;
        uStack_1898._4_4_ = local_1d80._12_4_;
        uStack_1890._0_4_ = local_1d80._16_4_;
        uStack_1890._4_4_ = local_1d80._20_4_;
        uStack_1888._0_4_ = local_1d80._24_4_;
        uStack_1888._4_4_ = local_1d80._28_4_;
        local_1d60._4_4_ = local_18a0._4_4_ * 0.6933594;
        local_1d60._0_4_ = (float)local_18a0 * 0.6933594;
        uStack_1d58._0_4_ = (float)uStack_1898 * 0.6933594;
        uStack_1d58._4_4_ = uStack_1898._4_4_ * 0.6933594;
        uStack_1d50._0_4_ = (float)uStack_1890 * 0.6933594;
        uStack_1d50._4_4_ = uStack_1890._4_4_ * 0.6933594;
        auVar144 = _local_1d60;
        uStack_1d48._0_4_ = (float)uStack_1888 * 0.6933594;
        uStack_1d48._4_4_ = uStack_1888._4_4_;
        auVar143 = _local_1d60;
        local_18e0 = local_1d80;
        uStack_18d8 = uStack_1d78;
        uStack_18d0 = uStack_1d70;
        uStack_18c8 = uStack_1d68;
        local_1900 = 0xb95e8083b95e8083;
        uStack_18f8 = 0xb95e8083b95e8083;
        uStack_18f0 = 0xb95e8083b95e8083;
        uStack_18e8 = 0xb95e8083b95e8083;
        local_17e0 = local_1d40._0_8_;
        uStack_17d8 = local_1d40._8_8_;
        uStack_17d0 = local_1d40._16_8_;
        uStack_17c8 = local_1d40._24_8_;
        local_1800 = local_1d60;
        uStack_17f8 = uStack_1d58;
        uStack_1d50 = auVar144._16_8_;
        uStack_17f0 = uStack_1d50;
        uStack_1d48 = auVar143._24_8_;
        uStack_17e8 = uStack_1d48;
        auVar88._16_8_ = uStack_1d50;
        auVar88._0_16_ = _local_1d60;
        auVar88._24_8_ = uStack_1d48;
        auVar11 = vsubps_avx(auVar9,auVar88);
        local_1d40._0_8_ = auVar11._0_8_;
        local_1820 = local_1d40._0_8_;
        local_1d40._8_8_ = auVar11._8_8_;
        uStack_1818 = local_1d40._8_8_;
        local_1d40._16_8_ = auVar11._16_8_;
        uStack_1810 = local_1d40._16_8_;
        local_1d40._24_8_ = auVar11._24_8_;
        uStack_1808 = local_1d40._24_8_;
        local_1840 = CONCAT44(local_18a0._4_4_ * -0.00021219444,(float)local_18a0 * -0.00021219444);
        uStack_1838 = CONCAT44(uStack_1898._4_4_ * -0.00021219444,
                               (float)uStack_1898 * -0.00021219444);
        uStack_1830 = CONCAT44(uStack_1890._4_4_ * -0.00021219444,
                               (float)uStack_1890 * -0.00021219444);
        uStack_1828 = CONCAT44(uStack_1888._4_4_,(float)uStack_1888 * -0.00021219444);
        auVar87._8_8_ = uStack_1838;
        auVar87._0_8_ = local_1840;
        auVar87._16_8_ = uStack_1830;
        auVar87._24_8_ = uStack_1828;
        local_1d40 = vsubps_avx(auVar11,auVar87);
        local_1940 = local_1d40._0_8_;
        uStack_1938 = local_1d40._8_8_;
        uStack_1930 = local_1d40._16_8_;
        uStack_1928 = local_1d40._24_8_;
        local_1920._0_4_ = local_1d40._0_4_;
        local_1920._4_4_ = local_1d40._4_4_;
        uStack_1918._0_4_ = local_1d40._8_4_;
        uStack_1918._4_4_ = local_1d40._12_4_;
        uStack_1910._0_4_ = local_1d40._16_4_;
        uStack_1910._4_4_ = local_1d40._20_4_;
        uStack_1908._0_4_ = local_1d40._24_4_;
        uStack_1908._4_4_ = local_1d40._28_4_;
        fStack_1de4 = uStack_1908._4_4_;
        local_1e00 = (float)local_1920 * (float)local_1920;
        fStack_1dfc = local_1920._4_4_ * local_1920._4_4_;
        fStack_1df8 = (float)uStack_1918 * (float)uStack_1918;
        fStack_1df4 = uStack_1918._4_4_ * uStack_1918._4_4_;
        fStack_1df0 = (float)uStack_1910 * (float)uStack_1910;
        fStack_1dec = uStack_1910._4_4_ * uStack_1910._4_4_;
        fStack_1de8 = (float)uStack_1908 * (float)uStack_1908;
        local_1960 = 0x3950696739506967;
        uStack_1958 = 0x3950696739506967;
        uStack_1950 = 0x3950696739506967;
        uStack_1948 = 0x3950696739506967;
        local_1980 = local_1d40._0_8_;
        uStack_1978 = local_1d40._8_8_;
        uStack_1970 = local_1d40._16_8_;
        uStack_1968 = local_1d40._24_8_;
        local_1e20 = CONCAT44(local_1920._4_4_ * 0.00019875691,(float)local_1920 * 0.00019875691);
        uStack_1e18 = CONCAT44(uStack_1918._4_4_ * 0.00019875691,(float)uStack_1918 * 0.00019875691)
        ;
        uStack_1e10 = CONCAT44(uStack_1910._4_4_ * 0.00019875691,(float)uStack_1910 * 0.00019875691)
        ;
        uStack_1e08 = CONCAT44(0x39506967,(float)uStack_1908 * 0.00019875691);
        local_1b60 = local_1e20;
        uStack_1b58 = uStack_1e18;
        uStack_1b50 = uStack_1e10;
        uStack_1b48 = uStack_1e08;
        local_1b80 = 0x3ab743ce3ab743ce;
        uStack_1b78 = 0x3ab743ce3ab743ce;
        uStack_1b70 = 0x3ab743ce3ab743ce;
        uStack_1b68 = 0x3ab743ce3ab743ce;
        local_3680 = (float)local_1920 * 0.00019875691 + 0.0013981999;
        fStack_367c = local_1920._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_3678 = (float)uStack_1918 * 0.00019875691 + 0.0013981999;
        fStack_3674 = uStack_1918._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_3670 = (float)uStack_1910 * 0.00019875691 + 0.0013981999;
        fStack_366c = uStack_1910._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_3668 = (float)uStack_1908 * 0.00019875691 + 0.0013981999;
        local_1e20 = CONCAT44(fStack_367c,local_3680);
        uStack_1e18 = CONCAT44(fStack_3674,fStack_3678);
        uStack_1e10 = CONCAT44(fStack_366c,fStack_3670);
        uStack_1e08 = CONCAT44(0x3ad150fb,fStack_3668);
        local_19a0 = local_1e20;
        uStack_1998 = uStack_1e18;
        uStack_1990 = uStack_1e10;
        uStack_1988 = uStack_1e08;
        local_19c0 = local_1d40._0_8_;
        uStack_19b8 = local_1d40._8_8_;
        uStack_19b0 = local_1d40._16_8_;
        uStack_19a8 = local_1d40._24_8_;
        local_3680 = local_3680 * (float)local_1920;
        fStack_367c = fStack_367c * local_1920._4_4_;
        fStack_3678 = fStack_3678 * (float)uStack_1918;
        fStack_3674 = fStack_3674 * uStack_1918._4_4_;
        fStack_3670 = fStack_3670 * (float)uStack_1910;
        fStack_366c = fStack_366c * uStack_1910._4_4_;
        fStack_3668 = fStack_3668 * (float)uStack_1908;
        local_1e20 = CONCAT44(fStack_367c,local_3680);
        uStack_1e18 = CONCAT44(fStack_3674,fStack_3678);
        uStack_1e10 = CONCAT44(fStack_366c,fStack_3670);
        uStack_1e08 = CONCAT44(0x3ad150fb,fStack_3668);
        local_1ba0 = local_1e20;
        uStack_1b98 = uStack_1e18;
        uStack_1b90 = uStack_1e10;
        uStack_1b88 = uStack_1e08;
        local_1bc0 = 0x3c0889083c088908;
        uStack_1bb8 = 0x3c0889083c088908;
        uStack_1bb0 = 0x3c0889083c088908;
        uStack_1ba8 = 0x3c0889083c088908;
        local_3680 = local_3680 + 0.008333452;
        fStack_367c = fStack_367c + 0.008333452;
        fStack_3678 = fStack_3678 + 0.008333452;
        fStack_3674 = fStack_3674 + 0.008333452;
        fStack_3670 = fStack_3670 + 0.008333452;
        fStack_366c = fStack_366c + 0.008333452;
        fStack_3668 = fStack_3668 + 0.008333452;
        local_1e20 = CONCAT44(fStack_367c,local_3680);
        uStack_1e18 = CONCAT44(fStack_3674,fStack_3678);
        uStack_1e10 = CONCAT44(fStack_366c,fStack_3670);
        uStack_1e08 = CONCAT44(0x3c22b327,fStack_3668);
        local_19e0 = local_1e20;
        uStack_19d8 = uStack_1e18;
        uStack_19d0 = uStack_1e10;
        uStack_19c8 = uStack_1e08;
        local_1a00 = local_1d40._0_8_;
        uStack_19f8 = local_1d40._8_8_;
        uStack_19f0 = local_1d40._16_8_;
        uStack_19e8 = local_1d40._24_8_;
        local_3680 = local_3680 * (float)local_1920;
        fStack_367c = fStack_367c * local_1920._4_4_;
        fStack_3678 = fStack_3678 * (float)uStack_1918;
        fStack_3674 = fStack_3674 * uStack_1918._4_4_;
        fStack_3670 = fStack_3670 * (float)uStack_1910;
        fStack_366c = fStack_366c * uStack_1910._4_4_;
        fStack_3668 = fStack_3668 * (float)uStack_1908;
        local_1e20 = CONCAT44(fStack_367c,local_3680);
        uStack_1e18 = CONCAT44(fStack_3674,fStack_3678);
        uStack_1e10 = CONCAT44(fStack_366c,fStack_3670);
        uStack_1e08 = CONCAT44(0x3c22b327,fStack_3668);
        local_1be0 = local_1e20;
        uStack_1bd8 = uStack_1e18;
        uStack_1bd0 = uStack_1e10;
        uStack_1bc8 = uStack_1e08;
        local_1c00 = 0x3d2aa9c13d2aa9c1;
        uStack_1bf8 = 0x3d2aa9c13d2aa9c1;
        uStack_1bf0 = 0x3d2aa9c13d2aa9c1;
        uStack_1be8 = 0x3d2aa9c13d2aa9c1;
        local_3680 = local_3680 + 0.041665796;
        fStack_367c = fStack_367c + 0.041665796;
        fStack_3678 = fStack_3678 + 0.041665796;
        fStack_3674 = fStack_3674 + 0.041665796;
        fStack_3670 = fStack_3670 + 0.041665796;
        fStack_366c = fStack_366c + 0.041665796;
        fStack_3668 = fStack_3668 + 0.041665796;
        local_1e20 = CONCAT44(fStack_367c,local_3680);
        uStack_1e18 = CONCAT44(fStack_3674,fStack_3678);
        uStack_1e10 = CONCAT44(fStack_366c,fStack_3670);
        uStack_1e08 = CONCAT44(0x3d53568b,fStack_3668);
        local_1a20 = local_1e20;
        uStack_1a18 = uStack_1e18;
        uStack_1a10 = uStack_1e10;
        uStack_1a08 = uStack_1e08;
        local_1a40 = local_1d40._0_8_;
        uStack_1a38 = local_1d40._8_8_;
        uStack_1a30 = local_1d40._16_8_;
        uStack_1a28 = local_1d40._24_8_;
        local_3680 = local_3680 * (float)local_1920;
        fStack_367c = fStack_367c * local_1920._4_4_;
        fStack_3678 = fStack_3678 * (float)uStack_1918;
        fStack_3674 = fStack_3674 * uStack_1918._4_4_;
        fStack_3670 = fStack_3670 * (float)uStack_1910;
        fStack_366c = fStack_366c * uStack_1910._4_4_;
        fStack_3668 = fStack_3668 * (float)uStack_1908;
        local_1e20 = CONCAT44(fStack_367c,local_3680);
        uStack_1e18 = CONCAT44(fStack_3674,fStack_3678);
        uStack_1e10 = CONCAT44(fStack_366c,fStack_3670);
        uStack_1e08 = CONCAT44(0x3d53568b,fStack_3668);
        local_1c20 = local_1e20;
        uStack_1c18 = uStack_1e18;
        uStack_1c10 = uStack_1e10;
        uStack_1c08 = uStack_1e08;
        local_1c40 = 0x3e2aaaaa3e2aaaaa;
        uStack_1c38 = 0x3e2aaaaa3e2aaaaa;
        uStack_1c30 = 0x3e2aaaaa3e2aaaaa;
        uStack_1c28 = 0x3e2aaaaa3e2aaaaa;
        local_3680 = local_3680 + 0.16666666;
        fStack_367c = fStack_367c + 0.16666666;
        fStack_3678 = fStack_3678 + 0.16666666;
        fStack_3674 = fStack_3674 + 0.16666666;
        fStack_3670 = fStack_3670 + 0.16666666;
        fStack_366c = fStack_366c + 0.16666666;
        fStack_3668 = fStack_3668 + 0.16666666;
        local_1e20 = CONCAT44(fStack_367c,local_3680);
        uStack_1e18 = CONCAT44(fStack_3674,fStack_3678);
        uStack_1e10 = CONCAT44(fStack_366c,fStack_3670);
        uStack_1e08 = CONCAT44(0x3e5f804d,fStack_3668);
        local_1a60 = local_1e20;
        uStack_1a58 = uStack_1e18;
        uStack_1a50 = uStack_1e10;
        uStack_1a48 = uStack_1e08;
        local_1a80 = local_1d40._0_8_;
        uStack_1a78 = local_1d40._8_8_;
        uStack_1a70 = local_1d40._16_8_;
        uStack_1a68 = local_1d40._24_8_;
        local_3680 = local_3680 * (float)local_1920;
        fStack_367c = fStack_367c * local_1920._4_4_;
        fStack_3678 = fStack_3678 * (float)uStack_1918;
        fStack_3674 = fStack_3674 * uStack_1918._4_4_;
        fStack_3670 = fStack_3670 * (float)uStack_1910;
        fStack_366c = fStack_366c * uStack_1910._4_4_;
        fStack_3668 = fStack_3668 * (float)uStack_1908;
        local_1e20 = CONCAT44(fStack_367c,local_3680);
        uStack_1e18 = CONCAT44(fStack_3674,fStack_3678);
        uStack_1e10 = CONCAT44(fStack_366c,fStack_3670);
        uStack_1e08 = CONCAT44(0x3e5f804d,fStack_3668);
        local_1c60 = local_1e20;
        uStack_1c58 = uStack_1e18;
        uStack_1c50 = uStack_1e10;
        uStack_1c48 = uStack_1e08;
        local_3680 = local_3680 + 0.5;
        fStack_367c = fStack_367c + 0.5;
        fStack_3678 = fStack_3678 + 0.5;
        fStack_3674 = fStack_3674 + 0.5;
        fStack_3670 = fStack_3670 + 0.5;
        fStack_366c = fStack_366c + 0.5;
        fStack_3668 = fStack_3668 + 0.5;
        local_1e20 = CONCAT44(fStack_367c,local_3680);
        uStack_1e18 = CONCAT44(fStack_3674,fStack_3678);
        uStack_1e10 = CONCAT44(fStack_366c,fStack_3670);
        uStack_1e08 = CONCAT44(0x3f37e013,fStack_3668);
        local_1aa0 = local_1e20;
        uStack_1a98 = uStack_1e18;
        uStack_1a90 = uStack_1e10;
        uStack_1a88 = uStack_1e08;
        local_1ac0 = CONCAT44(fStack_1dfc,local_1e00);
        uStack_1ab8 = CONCAT44(fStack_1df4,fStack_1df8);
        uStack_1ab0 = CONCAT44(fStack_1dec,fStack_1df0);
        uStack_1aa8 = CONCAT44(uStack_1908._4_4_,fStack_1de8);
        local_3680 = local_3680 * local_1e00;
        fStack_367c = fStack_367c * fStack_1dfc;
        fStack_3678 = fStack_3678 * fStack_1df8;
        fStack_3674 = fStack_3674 * fStack_1df4;
        fStack_3670 = fStack_3670 * fStack_1df0;
        fStack_366c = fStack_366c * fStack_1dec;
        fStack_3668 = fStack_3668 * fStack_1de8;
        local_1e20 = CONCAT44(fStack_367c,local_3680);
        uStack_1e18 = CONCAT44(fStack_3674,fStack_3678);
        uStack_1e10 = CONCAT44(fStack_366c,fStack_3670);
        uStack_1e08 = CONCAT44(0x3f37e013,fStack_3668);
        local_1ca0 = local_1e20;
        uStack_1c98 = uStack_1e18;
        uStack_1c90 = uStack_1e10;
        uStack_1c88 = uStack_1e08;
        local_1cc0 = local_1d40._0_8_;
        uStack_1cb8 = local_1d40._8_8_;
        uStack_1cb0 = local_1d40._16_8_;
        uStack_1ca8 = local_1d40._24_8_;
        local_3680 = local_3680 + (float)local_1920;
        fStack_367c = fStack_367c + local_1920._4_4_;
        fStack_3678 = fStack_3678 + (float)uStack_1918;
        fStack_3674 = fStack_3674 + uStack_1918._4_4_;
        fStack_3670 = fStack_3670 + (float)uStack_1910;
        fStack_366c = fStack_366c + uStack_1910._4_4_;
        fStack_3668 = fStack_3668 + (float)uStack_1908;
        local_1e20 = CONCAT44(fStack_367c,local_3680);
        uStack_1e18 = CONCAT44(fStack_3674,fStack_3678);
        uStack_1e10 = CONCAT44(fStack_366c,fStack_3670);
        uStack_1e08 = CONCAT44(uStack_1908._4_4_ + 0.71826285,fStack_3668);
        local_1ce0 = local_1e20;
        uStack_1cd8 = uStack_1e18;
        uStack_1cd0 = uStack_1e10;
        uStack_1cc8 = uStack_1e08;
        local_1d00 = 0x3f8000003f800000;
        uStack_1cf8 = 0x3f8000003f800000;
        uStack_1cf0 = 0x3f8000003f800000;
        uStack_1ce8 = 0x3f8000003f800000;
        local_3680 = local_3680 + 1.0;
        fStack_367c = fStack_367c + 1.0;
        fStack_3678 = fStack_3678 + 1.0;
        fStack_3674 = fStack_3674 + 1.0;
        fStack_3670 = fStack_3670 + 1.0;
        fStack_366c = fStack_366c + 1.0;
        fStack_3668 = fStack_3668 + 1.0;
        fStack_3664 = uStack_1908._4_4_ + 0.71826285 + 1.0;
        local_1e20 = CONCAT44(fStack_367c,local_3680);
        uStack_1e18 = CONCAT44(fStack_3674,fStack_3678);
        uStack_1e10 = CONCAT44(fStack_366c,fStack_3670);
        uStack_1e08 = CONCAT44(fStack_3664,fStack_3668);
        local_cc0 = local_1d80;
        uStack_cb8 = uStack_1d78;
        uStack_cb0 = uStack_1d70;
        uStack_ca8 = uStack_1d68;
        local_1da0 = CONCAT44((int)local_18a0._4_4_,(int)(float)local_18a0);
        uStack_1d98 = CONCAT44((int)uStack_1898._4_4_,(int)(float)uStack_1898);
        uStack_1d90 = CONCAT44((int)uStack_1890._4_4_,(int)(float)uStack_1890);
        uStack_1d88 = CONCAT44((int)uStack_1888._4_4_,(int)(float)uStack_1888);
        local_b40 = local_1da0;
        uStack_b38 = uStack_1d98;
        uStack_b30 = uStack_1d90;
        uStack_b28 = uStack_1d88;
        local_b60 = 0x7f0000007f;
        uStack_b58 = 0x7f0000007f;
        uStack_b50 = 0x7f0000007f;
        uStack_b48 = 0x7f0000007f;
        local_be0 = local_1da0;
        uStack_bd8 = uStack_1d98;
        uStack_bd0 = uStack_1d90;
        uStack_bc8 = uStack_1d88;
        local_c00 = 0x7f0000007f;
        uStack_bf8 = 0x7f0000007f;
        uStack_bf0 = 0x7f0000007f;
        uStack_be8 = 0x7f0000007f;
        local_b90 = 0x7f0000007f;
        uStack_b88 = 0x7f0000007f;
        local_ba0 = 0x7f0000007f;
        uStack_b98 = 0x7f0000007f;
        local_180 = local_1da0;
        uStack_178 = uStack_1d98;
        local_190 = 0x7f0000007f;
        uStack_188 = 0x7f0000007f;
        auVar136._8_8_ = uStack_1d98;
        auVar136._0_8_ = local_1da0;
        auVar135._8_8_ = 0x7f0000007f;
        auVar135._0_8_ = 0x7f0000007f;
        local_b70 = vpaddd_avx(auVar136,auVar135);
        local_1a0 = uStack_1d90;
        uStack_198 = uStack_1d88;
        local_1b0 = 0x7f0000007f;
        uStack_1a8 = 0x7f0000007f;
        auVar134._8_8_ = uStack_1d88;
        auVar134._0_8_ = uStack_1d90;
        auVar133._8_8_ = 0x7f0000007f;
        auVar133._0_8_ = 0x7f0000007f;
        local_b80 = vpaddd_avx(auVar134,auVar133);
        local_c20 = local_b70._0_8_;
        uStack_c18 = local_b70._8_8_;
        uStack_c10 = local_b80._0_8_;
        uStack_c08 = local_b80._8_8_;
        local_bc0 = local_b70._0_8_;
        uStack_bb8 = local_b70._8_8_;
        uStack_bb0 = local_b80._0_8_;
        uStack_ba8 = local_b80._8_8_;
        local_680 = local_b70._0_8_;
        uStack_678 = local_b70._8_8_;
        uStack_670 = local_b80._0_8_;
        uStack_668 = local_b80._8_8_;
        local_684 = 0x17;
        local_700 = local_b70._0_8_;
        uStack_6f8 = local_b70._8_8_;
        uStack_6f0 = local_b80._0_8_;
        uStack_6e8 = local_b80._8_8_;
        local_40 = local_b70._0_8_;
        uStack_38 = local_b70._8_8_;
        local_44 = 0x17;
        local_6a0 = vpslld_avx(local_b70,ZEXT416(0x17));
        local_60 = local_b80._0_8_;
        uStack_58 = local_b80._8_8_;
        local_64 = 0x17;
        local_6b0 = vpslld_avx(local_b80,ZEXT416(0x17));
        local_720 = local_6a0._0_8_;
        uStack_718 = local_6a0._8_8_;
        uStack_710 = local_6b0._0_8_;
        uStack_708 = local_6b0._8_8_;
        local_6e0 = local_6a0._0_8_;
        uStack_6d8 = local_6a0._8_8_;
        uStack_6d0 = local_6b0._0_8_;
        uStack_6c8 = local_6b0._8_8_;
        local_1da0 = local_6a0._0_8_;
        uStack_1d98 = local_6a0._8_8_;
        uStack_1d90 = local_6b0._0_8_;
        uStack_1d88 = local_6b0._8_8_;
        local_360 = local_6a0._0_8_;
        uStack_358 = local_6a0._8_8_;
        uStack_350 = local_6b0._0_8_;
        uStack_348 = local_6b0._8_8_;
        local_1e40 = local_6a0._0_8_;
        uStack_1e38 = local_6a0._8_8_;
        uStack_1e30 = local_6b0._0_8_;
        uStack_1e28 = local_6b0._8_8_;
        local_1ae0 = local_1e20;
        uStack_1ad8 = uStack_1e18;
        uStack_1ad0 = uStack_1e10;
        uStack_1ac8 = uStack_1e08;
        local_1b00._0_4_ = local_6a0._0_4_;
        local_1b00._4_4_ = local_6a0._4_4_;
        uStack_1af8._0_4_ = local_6a0._8_4_;
        uStack_1af8._4_4_ = local_6a0._12_4_;
        uStack_1af0._0_4_ = local_6b0._0_4_;
        uStack_1af0._4_4_ = local_6b0._4_4_;
        uStack_1ae8._0_4_ = local_6b0._8_4_;
        local_3680 = local_3680 * (float)local_1b00;
        fStack_367c = fStack_367c * local_1b00._4_4_;
        fStack_3678 = fStack_3678 * (float)uStack_1af8;
        fStack_3674 = fStack_3674 * uStack_1af8._4_4_;
        fStack_3670 = fStack_3670 * (float)uStack_1af0;
        fStack_366c = fStack_366c * uStack_1af0._4_4_;
        fStack_3668 = fStack_3668 * (float)uStack_1ae8;
        local_1e20 = CONCAT44(fStack_367c,local_3680);
        uStack_1e18 = CONCAT44(fStack_3674,fStack_3678);
        uStack_1e10 = CONCAT44(fStack_366c,fStack_3670);
        uStack_1e08 = CONCAT44(fStack_3664,fStack_3668);
        local_3660 = local_12c0._0_8_;
        uStack_3658 = local_12c0._8_8_;
        uStack_3650 = local_12c0._16_8_;
        uStack_3648 = local_12c0._24_8_;
        local_48c0 = local_1e20;
        uStack_48b8 = uStack_1e18;
        uStack_48b0 = uStack_1e10;
        uStack_48a8 = uStack_1e08;
        local_48a0._0_4_ = auVar5._0_4_;
        local_48a0._4_4_ = auVar5._4_4_;
        uStack_4898._0_4_ = auVar5._8_4_;
        uStack_4898._4_4_ = auVar5._12_4_;
        uStack_4890._0_4_ = auVar4._0_4_;
        uStack_4890._4_4_ = auVar4._4_4_;
        uStack_4888._0_4_ = auVar4._8_4_;
        uStack_4888._4_4_ = auVar4._12_4_;
        local_3680 = (float)local_48a0 + local_3680;
        fStack_367c = local_48a0._4_4_ + fStack_367c;
        fStack_3678 = (float)uStack_4898 + fStack_3678;
        fStack_3674 = uStack_4898._4_4_ + fStack_3674;
        fStack_3670 = (float)uStack_4890 + fStack_3670;
        fStack_366c = uStack_4890._4_4_ + fStack_366c;
        fStack_3668 = (float)uStack_4888 + fStack_3668;
        fStack_3664 = uStack_4888._4_4_ + fStack_3664;
        auVar86._16_8_ = local_12c0._16_8_;
        auVar86._0_16_ = auVar5;
        auVar86._24_8_ = local_12c0._24_8_;
        auVar85._4_4_ = fStack_367c;
        auVar85._0_4_ = local_3680;
        auVar85._8_4_ = fStack_3678;
        auVar85._12_4_ = fStack_3674;
        auVar85._16_4_ = fStack_3670;
        auVar85._20_4_ = fStack_366c;
        auVar85._24_4_ = fStack_3668;
        auVar85._28_4_ = fStack_3664;
        _local_3ae0 = vdivps_avx(auVar86,auVar85);
        local_5940 = local_5ff0;
        local_4a40 = *(undefined8 *)local_5ff0;
        uStack_4a38 = *(undefined8 *)(local_5ff0 + 2);
        uStack_4a30 = *(undefined8 *)(local_5ff0 + 4);
        uStack_4a28 = *(undefined8 *)(local_5ff0 + 6);
        local_379c = 0x3f800000;
        local_1120 = 0x3f800000;
        auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
        auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
        auVar153._16_16_ = auVar4;
        auVar153._0_16_ = auVar5;
        local_1140._0_8_ = auVar5._0_8_;
        local_1140._8_8_ = auVar5._8_8_;
        local_1140._16_8_ = auVar4._0_8_;
        local_1140._24_8_ = auVar4._8_8_;
        local_4a60 = local_1140._0_8_;
        uStack_4a58 = local_1140._8_8_;
        uStack_4a50 = local_1140._16_8_;
        uStack_4a48 = local_1140._24_8_;
        local_37a0 = 0x40000000;
        local_10e0 = 0x40000000;
        auVar4 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0x40000000),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0x40000000),0x30);
        auVar6 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x40000000),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x40000000),0x30);
        auVar154._16_16_ = auVar4;
        auVar154._0_16_ = auVar6;
        local_1100._0_8_ = auVar6._0_8_;
        local_1100._8_8_ = auVar6._8_8_;
        local_1100._16_8_ = auVar4._0_8_;
        local_1100._24_8_ = auVar4._8_8_;
        local_4a80 = local_1100._0_8_;
        uStack_4a78 = local_1100._8_8_;
        uStack_4a70 = local_1100._16_8_;
        uStack_4a68 = local_1100._24_8_;
        local_41a0._0_4_ = (float)local_4a40;
        local_41a0._4_4_ = (float)((ulong)local_4a40 >> 0x20);
        uStack_4198._0_4_ = (float)uStack_4a38;
        uStack_4198._4_4_ = (float)((ulong)uStack_4a38 >> 0x20);
        uStack_4190._0_4_ = (float)uStack_4a30;
        uStack_4190._4_4_ = (float)((ulong)uStack_4a30 >> 0x20);
        uStack_4188._0_4_ = (float)uStack_4a28;
        uStack_4188._4_4_ = (undefined4)((ulong)uStack_4a28 >> 0x20);
        uStack_49e4 = uStack_4188._4_4_;
        local_41c0._0_4_ = auVar6._0_4_;
        local_41c0._4_4_ = auVar6._4_4_;
        uStack_41b8._0_4_ = auVar6._8_4_;
        uStack_41b8._4_4_ = auVar6._12_4_;
        uStack_41b0._0_4_ = auVar4._0_4_;
        uStack_41b0._4_4_ = auVar4._4_4_;
        uStack_41a8._0_4_ = auVar4._8_4_;
        local_4a00 = (float)local_41a0 * (float)local_41c0;
        fStack_49fc = local_41a0._4_4_ * local_41c0._4_4_;
        fStack_49f8 = (float)uStack_4198 * (float)uStack_41b8;
        fStack_49f4 = uStack_4198._4_4_ * uStack_41b8._4_4_;
        fStack_49f0 = (float)uStack_4190 * (float)uStack_41b0;
        fStack_49ec = uStack_4190._4_4_ * uStack_41b0._4_4_;
        fStack_49e8 = (float)uStack_4188 * (float)uStack_41a8;
        local_37a4 = 0x3f800000;
        local_10a0 = 0x3f800000;
        auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
        auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
        auVar155._16_16_ = auVar4;
        auVar155._0_16_ = auVar6;
        local_10c0._0_8_ = auVar6._0_8_;
        local_10c0._8_8_ = auVar6._8_8_;
        local_10c0._16_8_ = auVar4._0_8_;
        local_10c0._24_8_ = auVar4._8_8_;
        local_4a20 = local_10c0._0_8_;
        uStack_4a18 = local_10c0._8_8_;
        uStack_4a10 = local_10c0._16_8_;
        uStack_4a08 = local_10c0._24_8_;
        local_3520 = ZEXT832(0) << 0x20;
        local_1420 = 0;
        local_49e0._8_8_ = SUB328(ZEXT832(0),4);
        uStack_1418 = local_49e0._8_8_;
        uStack_1410 = 0;
        uStack_1408 = 0;
        local_1440 = CONCAT44(fStack_49fc,local_4a00);
        uStack_1438 = CONCAT44(fStack_49f4,fStack_49f8);
        uStack_1430 = CONCAT44(fStack_49ec,fStack_49f0);
        uStack_1428 = CONCAT44(uStack_4188._4_4_,fStack_49e8);
        auVar99._8_8_ = uStack_1438;
        auVar99._0_8_ = local_1440;
        auVar99._16_8_ = uStack_1430;
        auVar99._24_8_ = uStack_1428;
        auVar11 = vsubps_avx(ZEXT832((ulong)local_49e0._8_8_) << 0x40,auVar99);
        local_35c0 = 0x3f8000003f800000;
        uStack_35b8 = 0x3f8000003f800000;
        uStack_35b0 = 0x3f8000003f800000;
        uStack_35a8 = 0x3f8000003f800000;
        local_3540._0_8_ = auVar11._0_8_;
        local_f60 = local_3540._0_8_;
        local_3540._8_8_ = auVar11._8_8_;
        uStack_f58 = local_3540._8_8_;
        local_3540._16_8_ = auVar11._16_8_;
        uStack_f50 = local_3540._16_8_;
        local_3540._24_8_ = auVar11._24_8_;
        uStack_f48 = local_3540._24_8_;
        local_f80 = 0x42b0c0a542b0c0a5;
        uStack_f78 = 0x42b0c0a542b0c0a5;
        uStack_f70 = 0x42b0c0a542b0c0a5;
        uStack_f68 = 0x42b0c0a542b0c0a5;
        auVar107._8_8_ = 0x42b0c0a542b0c0a5;
        auVar107._0_8_ = 0x42b0c0a542b0c0a5;
        auVar107._16_8_ = 0x42b0c0a542b0c0a5;
        auVar107._24_8_ = 0x42b0c0a542b0c0a5;
        auVar11 = vminps_avx(auVar11,auVar107);
        local_3540._0_8_ = auVar11._0_8_;
        local_e20 = local_3540._0_8_;
        local_3540._8_8_ = auVar11._8_8_;
        uStack_e18 = local_3540._8_8_;
        local_3540._16_8_ = auVar11._16_8_;
        uStack_e10 = local_3540._16_8_;
        local_3540._24_8_ = auVar11._24_8_;
        uStack_e08 = local_3540._24_8_;
        local_e40 = 0xc2b0c0a5c2b0c0a5;
        uStack_e38 = 0xc2b0c0a5c2b0c0a5;
        uStack_e30 = 0xc2b0c0a5c2b0c0a5;
        uStack_e28 = 0xc2b0c0a5c2b0c0a5;
        auVar112._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar112._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar112._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar112._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar9 = vmaxps_avx(auVar11,auVar112);
        local_3540._0_8_ = auVar9._0_8_;
        uVar24 = local_3540._0_8_;
        local_3540._8_8_ = auVar9._8_8_;
        uVar25 = local_3540._8_8_;
        local_3540._16_8_ = auVar9._16_8_;
        uVar26 = local_3540._16_8_;
        local_3540._24_8_ = auVar9._24_8_;
        uVar27 = local_3540._24_8_;
        local_3080 = 0x3fb8aa3b3fb8aa3b;
        uStack_3078 = 0x3fb8aa3b3fb8aa3b;
        uStack_3070 = 0x3fb8aa3b3fb8aa3b;
        uStack_3068 = 0x3fb8aa3b3fb8aa3b;
        local_3060._0_4_ = auVar9._0_4_;
        local_3060._4_4_ = auVar9._4_4_;
        uStack_3058._0_4_ = auVar9._8_4_;
        uStack_3058._4_4_ = auVar9._12_4_;
        uStack_3050._0_4_ = auVar9._16_4_;
        uStack_3050._4_4_ = auVar9._20_4_;
        uStack_3048._0_4_ = auVar9._24_4_;
        uStack_3048._4_4_ = auVar9._28_4_;
        local_3580._4_4_ = local_3060._4_4_ * 1.442695;
        local_3580._0_4_ = (float)local_3060 * 1.442695;
        uStack_3578._0_4_ = (float)uStack_3058 * 1.442695;
        uStack_3578._4_4_ = uStack_3058._4_4_ * 1.442695;
        uStack_3570._0_4_ = (float)uStack_3050 * 1.442695;
        uStack_3570._4_4_ = uStack_3050._4_4_ * 1.442695;
        auVar144 = _local_3580;
        uStack_3568._0_4_ = (float)uStack_3048 * 1.442695;
        uStack_3568._4_4_ = uStack_3048._4_4_;
        auVar11 = _local_3580;
        local_3320 = local_3580;
        uStack_3318 = uStack_3578;
        uStack_3570 = auVar144._16_8_;
        uStack_3310 = uStack_3570;
        uStack_3568 = auVar11._24_8_;
        uStack_3308 = uStack_3568;
        local_3480 = 0x3f0000003f000000;
        uStack_3478 = 0x3f0000003f000000;
        uStack_3470 = 0x3f0000003f000000;
        uStack_3468 = 0x3f0000003f000000;
        local_3580._4_4_ = local_3060._4_4_ * 1.442695 + 0.5;
        local_3580._0_4_ = (float)local_3060 * 1.442695 + 0.5;
        uStack_3578._0_4_ = (float)uStack_3058 * 1.442695 + 0.5;
        uStack_3578._4_4_ = uStack_3058._4_4_ * 1.442695 + 0.5;
        uStack_3570._0_4_ = (float)uStack_3050 * 1.442695 + 0.5;
        uStack_3570._4_4_ = uStack_3050._4_4_ * 1.442695 + 0.5;
        uStack_3568._0_4_ = (float)uStack_3048 * 1.442695 + 0.5;
        uStack_3568._4_4_ = uStack_3048._4_4_ + 0.5;
        auVar10 = vroundps_avx(_local_3580,1);
        auVar11 = vcmpps_avx(_local_3580,auVar10,1);
        local_35e0._0_8_ = auVar11._0_8_;
        local_ce0 = local_35e0._0_8_;
        local_35e0._8_8_ = auVar11._8_8_;
        uStack_cd8 = local_35e0._8_8_;
        local_35e0._16_8_ = auVar11._16_8_;
        uStack_cd0 = local_35e0._16_8_;
        local_35e0._24_8_ = auVar11._24_8_;
        uStack_cc8 = local_35e0._24_8_;
        local_d00 = 0x3f8000003f800000;
        uStack_cf8 = 0x3f8000003f800000;
        uStack_cf0 = 0x3f8000003f800000;
        uStack_ce8 = 0x3f8000003f800000;
        auVar117._8_8_ = 0x3f8000003f800000;
        auVar117._0_8_ = 0x3f8000003f800000;
        auVar117._16_8_ = 0x3f8000003f800000;
        auVar117._24_8_ = 0x3f8000003f800000;
        local_35e0 = vandps_avx(auVar11,auVar117);
        local_3560 = auVar10._0_8_;
        local_14a0 = local_3560;
        uStack_3558 = auVar10._8_8_;
        uStack_1498 = uStack_3558;
        uStack_3550 = auVar10._16_8_;
        uStack_1490 = uStack_3550;
        uStack_3548 = auVar10._24_8_;
        uStack_1488 = uStack_3548;
        local_14c0 = local_35e0._0_8_;
        uStack_14b8 = local_35e0._8_8_;
        uStack_14b0 = local_35e0._16_8_;
        uStack_14a8 = local_35e0._24_8_;
        _local_3580 = vsubps_avx(auVar10,local_35e0);
        local_30c0 = 0x3f3180003f318000;
        uStack_30b8 = 0x3f3180003f318000;
        uStack_30b0 = 0x3f3180003f318000;
        uStack_30a8 = 0x3f3180003f318000;
        local_30a0._0_4_ = local_3580._0_4_;
        local_30a0._4_4_ = local_3580._4_4_;
        uStack_3098._0_4_ = local_3580._8_4_;
        uStack_3098._4_4_ = local_3580._12_4_;
        uStack_3090._0_4_ = local_3580._16_4_;
        uStack_3090._4_4_ = local_3580._20_4_;
        uStack_3088._0_4_ = local_3580._24_4_;
        uStack_3088._4_4_ = local_3580._28_4_;
        local_3560._4_4_ = local_30a0._4_4_ * 0.6933594;
        local_3560._0_4_ = (float)local_30a0 * 0.6933594;
        uStack_3558._0_4_ = (float)uStack_3098 * 0.6933594;
        uStack_3558._4_4_ = uStack_3098._4_4_ * 0.6933594;
        uStack_3550._0_4_ = (float)uStack_3090 * 0.6933594;
        uStack_3550._4_4_ = uStack_3090._4_4_ * 0.6933594;
        auVar144 = _local_3560;
        uStack_3548._0_4_ = (float)uStack_3088 * 0.6933594;
        uStack_3548._4_4_ = uStack_3088._4_4_;
        auVar10 = _local_3560;
        local_30e0 = local_3580;
        uStack_30d8 = uStack_3578;
        uStack_30d0 = uStack_3570;
        uStack_30c8 = uStack_3568;
        local_3100 = 0xb95e8083b95e8083;
        uStack_30f8 = 0xb95e8083b95e8083;
        uStack_30f0 = 0xb95e8083b95e8083;
        uStack_30e8 = 0xb95e8083b95e8083;
        local_14e0 = local_3540._0_8_;
        uStack_14d8 = local_3540._8_8_;
        uStack_14d0 = local_3540._16_8_;
        uStack_14c8 = local_3540._24_8_;
        local_1500 = local_3560;
        uStack_14f8 = uStack_3558;
        uStack_3550 = auVar144._16_8_;
        uStack_14f0 = uStack_3550;
        uStack_3548 = auVar10._24_8_;
        uStack_14e8 = uStack_3548;
        auVar96._16_8_ = uStack_3550;
        auVar96._0_16_ = _local_3560;
        auVar96._24_8_ = uStack_3548;
        auVar11 = vsubps_avx(auVar9,auVar96);
        local_3540._0_8_ = auVar11._0_8_;
        local_1520 = local_3540._0_8_;
        local_3540._8_8_ = auVar11._8_8_;
        uStack_1518 = local_3540._8_8_;
        local_3540._16_8_ = auVar11._16_8_;
        uStack_1510 = local_3540._16_8_;
        local_3540._24_8_ = auVar11._24_8_;
        uStack_1508 = local_3540._24_8_;
        local_1540 = CONCAT44(local_30a0._4_4_ * -0.00021219444,(float)local_30a0 * -0.00021219444);
        uStack_1538 = CONCAT44(uStack_3098._4_4_ * -0.00021219444,
                               (float)uStack_3098 * -0.00021219444);
        uStack_1530 = CONCAT44(uStack_3090._4_4_ * -0.00021219444,
                               (float)uStack_3090 * -0.00021219444);
        uStack_1528 = CONCAT44(uStack_3088._4_4_,(float)uStack_3088 * -0.00021219444);
        auVar95._8_8_ = uStack_1538;
        auVar95._0_8_ = local_1540;
        auVar95._16_8_ = uStack_1530;
        auVar95._24_8_ = uStack_1528;
        local_3540 = vsubps_avx(auVar11,auVar95);
        local_3140 = local_3540._0_8_;
        uStack_3138 = local_3540._8_8_;
        uStack_3130 = local_3540._16_8_;
        uStack_3128 = local_3540._24_8_;
        local_3120._0_4_ = local_3540._0_4_;
        local_3120._4_4_ = local_3540._4_4_;
        uStack_3118._0_4_ = local_3540._8_4_;
        uStack_3118._4_4_ = local_3540._12_4_;
        uStack_3110._0_4_ = local_3540._16_4_;
        uStack_3110._4_4_ = local_3540._20_4_;
        uStack_3108._0_4_ = local_3540._24_4_;
        uStack_3108._4_4_ = local_3540._28_4_;
        fStack_35e4 = uStack_3108._4_4_;
        local_3600 = (float)local_3120 * (float)local_3120;
        fStack_35fc = local_3120._4_4_ * local_3120._4_4_;
        fStack_35f8 = (float)uStack_3118 * (float)uStack_3118;
        fStack_35f4 = uStack_3118._4_4_ * uStack_3118._4_4_;
        fStack_35f0 = (float)uStack_3110 * (float)uStack_3110;
        fStack_35ec = uStack_3110._4_4_ * uStack_3110._4_4_;
        fStack_35e8 = (float)uStack_3108 * (float)uStack_3108;
        local_3160 = 0x3950696739506967;
        uStack_3158 = 0x3950696739506967;
        uStack_3150 = 0x3950696739506967;
        uStack_3148 = 0x3950696739506967;
        local_3180 = local_3540._0_8_;
        uStack_3178 = local_3540._8_8_;
        uStack_3170 = local_3540._16_8_;
        uStack_3168 = local_3540._24_8_;
        local_3620 = CONCAT44(local_3120._4_4_ * 0.00019875691,(float)local_3120 * 0.00019875691);
        uStack_3618 = CONCAT44(uStack_3118._4_4_ * 0.00019875691,(float)uStack_3118 * 0.00019875691)
        ;
        uStack_3610 = CONCAT44(uStack_3110._4_4_ * 0.00019875691,(float)uStack_3110 * 0.00019875691)
        ;
        uStack_3608 = CONCAT44(0x39506967,(float)uStack_3108 * 0.00019875691);
        local_3360 = local_3620;
        uStack_3358 = uStack_3618;
        uStack_3350 = uStack_3610;
        uStack_3348 = uStack_3608;
        local_3380 = 0x3ab743ce3ab743ce;
        uStack_3378 = 0x3ab743ce3ab743ce;
        uStack_3370 = 0x3ab743ce3ab743ce;
        uStack_3368 = 0x3ab743ce3ab743ce;
        local_3780 = (float)local_3120 * 0.00019875691 + 0.0013981999;
        fStack_377c = local_3120._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_3778 = (float)uStack_3118 * 0.00019875691 + 0.0013981999;
        fStack_3774 = uStack_3118._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_3770 = (float)uStack_3110 * 0.00019875691 + 0.0013981999;
        fStack_376c = uStack_3110._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_3768 = (float)uStack_3108 * 0.00019875691 + 0.0013981999;
        local_3620 = CONCAT44(fStack_377c,local_3780);
        uStack_3618 = CONCAT44(fStack_3774,fStack_3778);
        uStack_3610 = CONCAT44(fStack_376c,fStack_3770);
        uStack_3608 = CONCAT44(0x3ad150fb,fStack_3768);
        local_31a0 = local_3620;
        uStack_3198 = uStack_3618;
        uStack_3190 = uStack_3610;
        uStack_3188 = uStack_3608;
        local_31c0 = local_3540._0_8_;
        uStack_31b8 = local_3540._8_8_;
        uStack_31b0 = local_3540._16_8_;
        uStack_31a8 = local_3540._24_8_;
        local_3780 = local_3780 * (float)local_3120;
        fStack_377c = fStack_377c * local_3120._4_4_;
        fStack_3778 = fStack_3778 * (float)uStack_3118;
        fStack_3774 = fStack_3774 * uStack_3118._4_4_;
        fStack_3770 = fStack_3770 * (float)uStack_3110;
        fStack_376c = fStack_376c * uStack_3110._4_4_;
        fStack_3768 = fStack_3768 * (float)uStack_3108;
        local_3620 = CONCAT44(fStack_377c,local_3780);
        uStack_3618 = CONCAT44(fStack_3774,fStack_3778);
        uStack_3610 = CONCAT44(fStack_376c,fStack_3770);
        uStack_3608 = CONCAT44(0x3ad150fb,fStack_3768);
        local_33a0 = local_3620;
        uStack_3398 = uStack_3618;
        uStack_3390 = uStack_3610;
        uStack_3388 = uStack_3608;
        local_33c0 = 0x3c0889083c088908;
        uStack_33b8 = 0x3c0889083c088908;
        uStack_33b0 = 0x3c0889083c088908;
        uStack_33a8 = 0x3c0889083c088908;
        local_3780 = local_3780 + 0.008333452;
        fStack_377c = fStack_377c + 0.008333452;
        fStack_3778 = fStack_3778 + 0.008333452;
        fStack_3774 = fStack_3774 + 0.008333452;
        fStack_3770 = fStack_3770 + 0.008333452;
        fStack_376c = fStack_376c + 0.008333452;
        fStack_3768 = fStack_3768 + 0.008333452;
        local_3620 = CONCAT44(fStack_377c,local_3780);
        uStack_3618 = CONCAT44(fStack_3774,fStack_3778);
        uStack_3610 = CONCAT44(fStack_376c,fStack_3770);
        uStack_3608 = CONCAT44(0x3c22b327,fStack_3768);
        local_31e0 = local_3620;
        uStack_31d8 = uStack_3618;
        uStack_31d0 = uStack_3610;
        uStack_31c8 = uStack_3608;
        local_3200 = local_3540._0_8_;
        uStack_31f8 = local_3540._8_8_;
        uStack_31f0 = local_3540._16_8_;
        uStack_31e8 = local_3540._24_8_;
        local_3780 = local_3780 * (float)local_3120;
        fStack_377c = fStack_377c * local_3120._4_4_;
        fStack_3778 = fStack_3778 * (float)uStack_3118;
        fStack_3774 = fStack_3774 * uStack_3118._4_4_;
        fStack_3770 = fStack_3770 * (float)uStack_3110;
        fStack_376c = fStack_376c * uStack_3110._4_4_;
        fStack_3768 = fStack_3768 * (float)uStack_3108;
        local_3620 = CONCAT44(fStack_377c,local_3780);
        uStack_3618 = CONCAT44(fStack_3774,fStack_3778);
        uStack_3610 = CONCAT44(fStack_376c,fStack_3770);
        uStack_3608 = CONCAT44(0x3c22b327,fStack_3768);
        local_33e0 = local_3620;
        uStack_33d8 = uStack_3618;
        uStack_33d0 = uStack_3610;
        uStack_33c8 = uStack_3608;
        local_3400 = 0x3d2aa9c13d2aa9c1;
        uStack_33f8 = 0x3d2aa9c13d2aa9c1;
        uStack_33f0 = 0x3d2aa9c13d2aa9c1;
        uStack_33e8 = 0x3d2aa9c13d2aa9c1;
        local_3780 = local_3780 + 0.041665796;
        fStack_377c = fStack_377c + 0.041665796;
        fStack_3778 = fStack_3778 + 0.041665796;
        fStack_3774 = fStack_3774 + 0.041665796;
        fStack_3770 = fStack_3770 + 0.041665796;
        fStack_376c = fStack_376c + 0.041665796;
        fStack_3768 = fStack_3768 + 0.041665796;
        local_3620 = CONCAT44(fStack_377c,local_3780);
        uStack_3618 = CONCAT44(fStack_3774,fStack_3778);
        uStack_3610 = CONCAT44(fStack_376c,fStack_3770);
        uStack_3608 = CONCAT44(0x3d53568b,fStack_3768);
        local_3220 = local_3620;
        uStack_3218 = uStack_3618;
        uStack_3210 = uStack_3610;
        uStack_3208 = uStack_3608;
        local_3240 = local_3540._0_8_;
        uStack_3238 = local_3540._8_8_;
        uStack_3230 = local_3540._16_8_;
        uStack_3228 = local_3540._24_8_;
        local_3780 = local_3780 * (float)local_3120;
        fStack_377c = fStack_377c * local_3120._4_4_;
        fStack_3778 = fStack_3778 * (float)uStack_3118;
        fStack_3774 = fStack_3774 * uStack_3118._4_4_;
        fStack_3770 = fStack_3770 * (float)uStack_3110;
        fStack_376c = fStack_376c * uStack_3110._4_4_;
        fStack_3768 = fStack_3768 * (float)uStack_3108;
        local_3620 = CONCAT44(fStack_377c,local_3780);
        uStack_3618 = CONCAT44(fStack_3774,fStack_3778);
        uStack_3610 = CONCAT44(fStack_376c,fStack_3770);
        uStack_3608 = CONCAT44(0x3d53568b,fStack_3768);
        local_3420 = local_3620;
        uStack_3418 = uStack_3618;
        uStack_3410 = uStack_3610;
        uStack_3408 = uStack_3608;
        local_3440 = 0x3e2aaaaa3e2aaaaa;
        uStack_3438 = 0x3e2aaaaa3e2aaaaa;
        uStack_3430 = 0x3e2aaaaa3e2aaaaa;
        uStack_3428 = 0x3e2aaaaa3e2aaaaa;
        local_3780 = local_3780 + 0.16666666;
        fStack_377c = fStack_377c + 0.16666666;
        fStack_3778 = fStack_3778 + 0.16666666;
        fStack_3774 = fStack_3774 + 0.16666666;
        fStack_3770 = fStack_3770 + 0.16666666;
        fStack_376c = fStack_376c + 0.16666666;
        fStack_3768 = fStack_3768 + 0.16666666;
        local_3620 = CONCAT44(fStack_377c,local_3780);
        uStack_3618 = CONCAT44(fStack_3774,fStack_3778);
        uStack_3610 = CONCAT44(fStack_376c,fStack_3770);
        uStack_3608 = CONCAT44(0x3e5f804d,fStack_3768);
        local_3260 = local_3620;
        uStack_3258 = uStack_3618;
        uStack_3250 = uStack_3610;
        uStack_3248 = uStack_3608;
        local_3280 = local_3540._0_8_;
        uStack_3278 = local_3540._8_8_;
        uStack_3270 = local_3540._16_8_;
        uStack_3268 = local_3540._24_8_;
        local_3780 = local_3780 * (float)local_3120;
        fStack_377c = fStack_377c * local_3120._4_4_;
        fStack_3778 = fStack_3778 * (float)uStack_3118;
        fStack_3774 = fStack_3774 * uStack_3118._4_4_;
        fStack_3770 = fStack_3770 * (float)uStack_3110;
        fStack_376c = fStack_376c * uStack_3110._4_4_;
        fStack_3768 = fStack_3768 * (float)uStack_3108;
        local_3620 = CONCAT44(fStack_377c,local_3780);
        uStack_3618 = CONCAT44(fStack_3774,fStack_3778);
        uStack_3610 = CONCAT44(fStack_376c,fStack_3770);
        uStack_3608 = CONCAT44(0x3e5f804d,fStack_3768);
        local_3460 = local_3620;
        uStack_3458 = uStack_3618;
        uStack_3450 = uStack_3610;
        uStack_3448 = uStack_3608;
        local_3780 = local_3780 + 0.5;
        fStack_377c = fStack_377c + 0.5;
        fStack_3778 = fStack_3778 + 0.5;
        fStack_3774 = fStack_3774 + 0.5;
        fStack_3770 = fStack_3770 + 0.5;
        fStack_376c = fStack_376c + 0.5;
        fStack_3768 = fStack_3768 + 0.5;
        local_3620 = CONCAT44(fStack_377c,local_3780);
        uStack_3618 = CONCAT44(fStack_3774,fStack_3778);
        uStack_3610 = CONCAT44(fStack_376c,fStack_3770);
        uStack_3608 = CONCAT44(0x3f37e013,fStack_3768);
        local_32a0 = local_3620;
        uStack_3298 = uStack_3618;
        uStack_3290 = uStack_3610;
        uStack_3288 = uStack_3608;
        local_32c0 = CONCAT44(fStack_35fc,local_3600);
        uStack_32b8 = CONCAT44(fStack_35f4,fStack_35f8);
        uStack_32b0 = CONCAT44(fStack_35ec,fStack_35f0);
        uStack_32a8 = CONCAT44(uStack_3108._4_4_,fStack_35e8);
        local_3780 = local_3780 * local_3600;
        fStack_377c = fStack_377c * fStack_35fc;
        fStack_3778 = fStack_3778 * fStack_35f8;
        fStack_3774 = fStack_3774 * fStack_35f4;
        fStack_3770 = fStack_3770 * fStack_35f0;
        fStack_376c = fStack_376c * fStack_35ec;
        fStack_3768 = fStack_3768 * fStack_35e8;
        local_3620 = CONCAT44(fStack_377c,local_3780);
        uStack_3618 = CONCAT44(fStack_3774,fStack_3778);
        uStack_3610 = CONCAT44(fStack_376c,fStack_3770);
        uStack_3608 = CONCAT44(0x3f37e013,fStack_3768);
        local_34a0 = local_3620;
        uStack_3498 = uStack_3618;
        uStack_3490 = uStack_3610;
        uStack_3488 = uStack_3608;
        local_34c0 = local_3540._0_8_;
        uStack_34b8 = local_3540._8_8_;
        uStack_34b0 = local_3540._16_8_;
        uStack_34a8 = local_3540._24_8_;
        local_3780 = local_3780 + (float)local_3120;
        fStack_377c = fStack_377c + local_3120._4_4_;
        fStack_3778 = fStack_3778 + (float)uStack_3118;
        fStack_3774 = fStack_3774 + uStack_3118._4_4_;
        fStack_3770 = fStack_3770 + (float)uStack_3110;
        fStack_376c = fStack_376c + uStack_3110._4_4_;
        fStack_3768 = fStack_3768 + (float)uStack_3108;
        local_3620 = CONCAT44(fStack_377c,local_3780);
        uStack_3618 = CONCAT44(fStack_3774,fStack_3778);
        uStack_3610 = CONCAT44(fStack_376c,fStack_3770);
        uStack_3608 = CONCAT44(uStack_3108._4_4_ + 0.71826285,fStack_3768);
        local_34e0 = local_3620;
        uStack_34d8 = uStack_3618;
        uStack_34d0 = uStack_3610;
        uStack_34c8 = uStack_3608;
        local_3500 = 0x3f8000003f800000;
        uStack_34f8 = 0x3f8000003f800000;
        uStack_34f0 = 0x3f8000003f800000;
        uStack_34e8 = 0x3f8000003f800000;
        local_3780 = local_3780 + 1.0;
        fStack_377c = fStack_377c + 1.0;
        fStack_3778 = fStack_3778 + 1.0;
        fStack_3774 = fStack_3774 + 1.0;
        fStack_3770 = fStack_3770 + 1.0;
        fStack_376c = fStack_376c + 1.0;
        fStack_3768 = fStack_3768 + 1.0;
        fStack_3764 = uStack_3108._4_4_ + 0.71826285 + 1.0;
        local_3620 = CONCAT44(fStack_377c,local_3780);
        uStack_3618 = CONCAT44(fStack_3774,fStack_3778);
        uStack_3610 = CONCAT44(fStack_376c,fStack_3770);
        uStack_3608 = CONCAT44(fStack_3764,fStack_3768);
        local_c40 = local_3580;
        uStack_c38 = uStack_3578;
        uStack_c30 = uStack_3570;
        uStack_c28 = uStack_3568;
        local_35a0 = CONCAT44((int)local_30a0._4_4_,(int)(float)local_30a0);
        uStack_3598 = CONCAT44((int)uStack_3098._4_4_,(int)(float)uStack_3098);
        uStack_3590 = CONCAT44((int)uStack_3090._4_4_,(int)(float)uStack_3090);
        uStack_3588 = CONCAT44((int)uStack_3088._4_4_,(int)(float)uStack_3088);
        local_740 = local_35a0;
        uStack_738 = uStack_3598;
        uStack_730 = uStack_3590;
        uStack_728 = uStack_3588;
        local_760 = 0x7f0000007f;
        uStack_758 = 0x7f0000007f;
        uStack_750 = 0x7f0000007f;
        uStack_748 = 0x7f0000007f;
        local_7e0 = local_35a0;
        uStack_7d8 = uStack_3598;
        uStack_7d0 = uStack_3590;
        uStack_7c8 = uStack_3588;
        local_800 = 0x7f0000007f;
        uStack_7f8 = 0x7f0000007f;
        uStack_7f0 = 0x7f0000007f;
        uStack_7e8 = 0x7f0000007f;
        local_790 = 0x7f0000007f;
        uStack_788 = 0x7f0000007f;
        local_7a0 = 0x7f0000007f;
        uStack_798 = 0x7f0000007f;
        local_280 = local_35a0;
        uStack_278 = uStack_3598;
        local_290 = 0x7f0000007f;
        uStack_288 = 0x7f0000007f;
        auVar121._8_8_ = uStack_3598;
        auVar121._0_8_ = local_35a0;
        auVar120._8_8_ = 0x7f0000007f;
        auVar120._0_8_ = 0x7f0000007f;
        local_770 = vpaddd_avx(auVar121,auVar120);
        local_2a0 = uStack_3590;
        uStack_298 = uStack_3588;
        local_2b0 = 0x7f0000007f;
        uStack_2a8 = 0x7f0000007f;
        auVar119._8_8_ = uStack_3588;
        auVar119._0_8_ = uStack_3590;
        auVar118._8_8_ = 0x7f0000007f;
        auVar118._0_8_ = 0x7f0000007f;
        local_780 = vpaddd_avx(auVar119,auVar118);
        local_820 = local_770._0_8_;
        uStack_818 = local_770._8_8_;
        uStack_810 = local_780._0_8_;
        uStack_808 = local_780._8_8_;
        local_7c0 = local_770._0_8_;
        uStack_7b8 = local_770._8_8_;
        uStack_7b0 = local_780._0_8_;
        uStack_7a8 = local_780._8_8_;
        local_380 = local_770._0_8_;
        uStack_378 = local_770._8_8_;
        uStack_370 = local_780._0_8_;
        uStack_368 = local_780._8_8_;
        local_384 = 0x17;
        local_400 = local_770._0_8_;
        uStack_3f8 = local_770._8_8_;
        uStack_3f0 = local_780._0_8_;
        uStack_3e8 = local_780._8_8_;
        local_140 = local_770._0_8_;
        uStack_138 = local_770._8_8_;
        local_144 = 0x17;
        local_3a0 = vpslld_avx(local_770,ZEXT416(0x17));
        local_160 = local_780._0_8_;
        uStack_158 = local_780._8_8_;
        local_164 = 0x17;
        local_3b0 = vpslld_avx(local_780,ZEXT416(0x17));
        local_420 = local_3a0._0_8_;
        uStack_418 = local_3a0._8_8_;
        uStack_410 = local_3b0._0_8_;
        uStack_408 = local_3b0._8_8_;
        local_3e0 = local_3a0._0_8_;
        uStack_3d8 = local_3a0._8_8_;
        uStack_3d0 = local_3b0._0_8_;
        uStack_3c8 = local_3b0._8_8_;
        local_35a0 = local_3a0._0_8_;
        uStack_3598 = local_3a0._8_8_;
        uStack_3590 = local_3b0._0_8_;
        uStack_3588 = local_3b0._8_8_;
        local_2e0 = local_3a0._0_8_;
        uStack_2d8 = local_3a0._8_8_;
        uStack_2d0 = local_3b0._0_8_;
        uStack_2c8 = local_3b0._8_8_;
        local_3640 = local_3a0._0_8_;
        uStack_3638 = local_3a0._8_8_;
        uStack_3630 = local_3b0._0_8_;
        uStack_3628 = local_3b0._8_8_;
        local_32e0 = local_3620;
        uStack_32d8 = uStack_3618;
        uStack_32d0 = uStack_3610;
        uStack_32c8 = uStack_3608;
        local_3300._0_4_ = local_3a0._0_4_;
        local_3300._4_4_ = local_3a0._4_4_;
        uStack_32f8._0_4_ = local_3a0._8_4_;
        uStack_32f8._4_4_ = local_3a0._12_4_;
        uStack_32f0._0_4_ = local_3b0._0_4_;
        uStack_32f0._4_4_ = local_3b0._4_4_;
        uStack_32e8._0_4_ = local_3b0._8_4_;
        local_3780 = local_3780 * (float)local_3300;
        fStack_377c = fStack_377c * local_3300._4_4_;
        fStack_3778 = fStack_3778 * (float)uStack_32f8;
        fStack_3774 = fStack_3774 * uStack_32f8._4_4_;
        fStack_3770 = fStack_3770 * (float)uStack_32f0;
        fStack_376c = fStack_376c * uStack_32f0._4_4_;
        fStack_3768 = fStack_3768 * (float)uStack_32e8;
        local_3620 = CONCAT44(fStack_377c,local_3780);
        uStack_3618 = CONCAT44(fStack_3774,fStack_3778);
        uStack_3610 = CONCAT44(fStack_376c,fStack_3770);
        uStack_3608 = CONCAT44(fStack_3764,fStack_3768);
        local_3760 = local_10c0._0_8_;
        uStack_3758 = local_10c0._8_8_;
        uStack_3750 = local_10c0._16_8_;
        uStack_3748 = local_10c0._24_8_;
        local_49c0 = local_3620;
        uStack_49b8 = uStack_3618;
        uStack_49b0 = uStack_3610;
        uStack_49a8 = uStack_3608;
        local_49a0._0_4_ = auVar6._0_4_;
        local_49a0._4_4_ = auVar6._4_4_;
        uStack_4998._0_4_ = auVar6._8_4_;
        uStack_4998._4_4_ = auVar6._12_4_;
        uStack_4990._0_4_ = auVar4._0_4_;
        uStack_4990._4_4_ = auVar4._4_4_;
        uStack_4988._0_4_ = auVar4._8_4_;
        uStack_4988._4_4_ = auVar4._12_4_;
        local_3780 = (float)local_49a0 + local_3780;
        fStack_377c = local_49a0._4_4_ + fStack_377c;
        fStack_3778 = (float)uStack_4998 + fStack_3778;
        fStack_3774 = uStack_4998._4_4_ + fStack_3774;
        fStack_3770 = (float)uStack_4990 + fStack_3770;
        fStack_376c = uStack_4990._4_4_ + fStack_376c;
        fStack_3768 = (float)uStack_4988 + fStack_3768;
        fStack_3764 = uStack_4988._4_4_ + fStack_3764;
        auVar78._16_8_ = local_10c0._16_8_;
        auVar78._0_16_ = auVar6;
        auVar78._24_8_ = local_10c0._24_8_;
        auVar77._4_4_ = fStack_377c;
        auVar77._0_4_ = local_3780;
        auVar77._8_4_ = fStack_3778;
        auVar77._12_4_ = fStack_3774;
        auVar77._16_4_ = fStack_3770;
        auVar77._20_4_ = fStack_376c;
        auVar77._24_4_ = fStack_3768;
        auVar77._28_4_ = fStack_3764;
        _local_41e0 = vdivps_avx(auVar78,auVar77);
        local_4200 = local_1100._0_8_;
        uStack_41f8 = local_1100._8_8_;
        uStack_41f0 = local_1100._16_8_;
        uStack_41e8 = local_1100._24_8_;
        local_1460 = (float)local_41e0._0_4_ * (float)local_41c0;
        fStack_145c = (float)local_41e0._4_4_ * local_41c0._4_4_;
        fStack_1458 = fStack_41d8 * (float)uStack_41b8;
        fStack_1454 = fStack_41d4 * uStack_41b8._4_4_;
        fStack_1450 = fStack_41d0 * (float)uStack_41b0;
        fStack_144c = fStack_41cc * uStack_41b0._4_4_;
        uStack_1444 = local_41e0._28_4_;
        fStack_1448 = fStack_41c8 * (float)uStack_41a8;
        local_1480 = local_1140._0_8_;
        uStack_1478 = local_1140._8_8_;
        uStack_1470 = local_1140._16_8_;
        uStack_1468 = local_1140._24_8_;
        auVar98._4_4_ = fStack_145c;
        auVar98._0_4_ = local_1460;
        auVar98._8_4_ = fStack_1458;
        auVar98._12_4_ = fStack_1454;
        auVar98._16_4_ = fStack_1450;
        auVar98._20_4_ = fStack_144c;
        auVar98._24_4_ = fStack_1448;
        auVar98._28_4_ = uStack_1444;
        auVar97._16_8_ = local_1140._16_8_;
        auVar97._0_16_ = auVar5;
        auVar97._24_8_ = local_1140._24_8_;
        auVar11 = vsubps_avx(auVar98,auVar97);
        local_6fe0 = auVar11._0_8_;
        uStack_6fd8 = auVar11._8_8_;
        uStack_6fd0 = auVar11._16_8_;
        uStack_6fc8 = auVar11._24_8_;
        local_5948 = local_5fc8;
        uVar28 = *(undefined8 *)local_5fc8;
        uVar29 = *(undefined8 *)(local_5fc8 + 2);
        uVar30 = *(undefined8 *)(local_5fc8 + 4);
        uStack_3a68 = *(undefined8 *)(local_5fc8 + 6);
        local_3a60._0_4_ = auVar8._0_4_;
        local_3a60._4_4_ = auVar8._4_4_;
        uStack_3a58._0_4_ = auVar8._8_4_;
        uStack_3a58._4_4_ = auVar8._12_4_;
        uStack_3a50._0_4_ = auVar8._16_4_;
        uStack_3a50._4_4_ = auVar8._20_4_;
        uStack_3a48._0_4_ = auVar8._24_4_;
        uStack_3a48._4_4_ = auVar8._28_4_;
        local_3a80._0_4_ = (float)uVar28;
        local_3a80._4_4_ = (float)((ulong)uVar28 >> 0x20);
        uStack_3a78._0_4_ = (float)uVar29;
        uStack_3a78._4_4_ = (float)((ulong)uVar29 >> 0x20);
        uStack_3a70._0_4_ = (float)uVar30;
        uStack_3a70._4_4_ = (float)((ulong)uVar30 >> 0x20);
        local_3aa0._0_4_ = auVar7._0_4_;
        local_3aa0._4_4_ = auVar7._4_4_;
        uStack_3a98._0_4_ = auVar7._8_4_;
        uStack_3a98._4_4_ = auVar7._12_4_;
        uStack_3a90._0_4_ = auVar7._16_4_;
        uStack_3a90._4_4_ = auVar7._20_4_;
        uStack_3a88._0_4_ = auVar7._24_4_;
        uStack_3a88._4_4_ = auVar7._28_4_;
        local_3ac0._0_4_ = auVar11._0_4_;
        local_3ac0._4_4_ = auVar11._4_4_;
        uStack_3ab8._0_4_ = auVar11._8_4_;
        uStack_3ab8._4_4_ = auVar11._12_4_;
        uStack_3ab0._0_4_ = auVar11._16_4_;
        uStack_3ab0._4_4_ = auVar11._20_4_;
        uStack_3aa8._0_4_ = auVar11._24_4_;
        local_4240 = CONCAT44(local_3aa0._4_4_ * local_3ac0._4_4_,
                              (float)local_3aa0 * (float)local_3ac0);
        uStack_4238 = CONCAT44(uStack_3a98._4_4_ * uStack_3ab8._4_4_,
                               (float)uStack_3a98 * (float)uStack_3ab8);
        uStack_4230 = CONCAT44(uStack_3a90._4_4_ * uStack_3ab0._4_4_,
                               (float)uStack_3a90 * (float)uStack_3ab0);
        uStack_4228 = CONCAT44(uStack_3a88._4_4_,(float)uStack_3a88 * (float)uStack_3aa8);
        local_4220 = CONCAT44(local_3a60._4_4_ * local_3a80._4_4_,
                              (float)local_3a60 * (float)local_3a80);
        uStack_4218 = CONCAT44(uStack_3a58._4_4_ * uStack_3a78._4_4_,
                               (float)uStack_3a58 * (float)uStack_3a78);
        uStack_4210 = CONCAT44(uStack_3a50._4_4_ * uStack_3a70._4_4_,
                               (float)uStack_3a50 * (float)uStack_3a70);
        uStack_4208 = CONCAT44(uStack_3a48._4_4_,(float)uStack_3a48 * (float)uStack_3a68);
        local_4ac0 = (float)local_3a60 * (float)local_3a80 + (float)local_3aa0 * (float)local_3ac0;
        fStack_4abc = local_3a60._4_4_ * local_3a80._4_4_ + local_3aa0._4_4_ * local_3ac0._4_4_;
        fStack_4ab8 = (float)uStack_3a58 * (float)uStack_3a78 +
                      (float)uStack_3a98 * (float)uStack_3ab8;
        fStack_4ab4 = uStack_3a58._4_4_ * uStack_3a78._4_4_ + uStack_3a98._4_4_ * uStack_3ab8._4_4_;
        fStack_4ab0 = (float)uStack_3a50 * (float)uStack_3a70 +
                      (float)uStack_3a90 * (float)uStack_3ab0;
        fStack_4aac = uStack_3a50._4_4_ * uStack_3a70._4_4_ + uStack_3a90._4_4_ * uStack_3ab0._4_4_;
        fStack_4aa8 = (float)uStack_3a48 * (float)uStack_3a68 +
                      (float)uStack_3a88 * (float)uStack_3aa8;
        fStack_4aa4 = uStack_3a48._4_4_ + uStack_3a88._4_4_;
        local_4ec0 = CONCAT44(fStack_4abc,local_4ac0);
        uStack_4eb8 = CONCAT44(fStack_4ab4,fStack_4ab8);
        uStack_4eb0 = CONCAT44(fStack_4aac,fStack_4ab0);
        uStack_4ea8 = CONCAT44(fStack_4aa4,fStack_4aa8);
        local_3790 = 0x3f800000;
        local_11e0 = 0x3f800000;
        auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
        auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
        auVar156._16_16_ = auVar4;
        auVar156._0_16_ = auVar5;
        local_1200._0_8_ = auVar5._0_8_;
        local_1200._8_8_ = auVar5._8_8_;
        local_1200._16_8_ = auVar4._0_8_;
        local_1200._24_8_ = auVar4._8_8_;
        local_4b20 = local_1200._0_8_;
        uStack_4b18 = local_1200._8_8_;
        uStack_4b10 = local_1200._16_8_;
        uStack_4b08 = local_1200._24_8_;
        local_3794 = 0x40000000;
        local_11a0 = 0x40000000;
        auVar4 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0x40000000),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0x40000000),0x30);
        auVar6 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x40000000),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x40000000),0x30);
        auVar157._16_16_ = auVar4;
        auVar157._0_16_ = auVar6;
        local_11c0._0_8_ = auVar6._0_8_;
        local_11c0._8_8_ = auVar6._8_8_;
        local_11c0._16_8_ = auVar4._0_8_;
        local_11c0._24_8_ = auVar4._8_8_;
        local_4b40 = local_11c0._0_8_;
        uStack_4b38 = local_11c0._8_8_;
        uStack_4b30 = local_11c0._16_8_;
        uStack_4b28 = local_11c0._24_8_;
        local_4140._0_4_ = auVar6._0_4_;
        local_4140._4_4_ = auVar6._4_4_;
        uStack_4138._0_4_ = auVar6._8_4_;
        uStack_4138._4_4_ = auVar6._12_4_;
        uStack_4130._0_4_ = auVar4._0_4_;
        uStack_4130._4_4_ = auVar4._4_4_;
        uStack_4128._0_4_ = auVar4._8_4_;
        local_4ac0 = local_4ac0 * (float)local_4140;
        fStack_4abc = fStack_4abc * local_4140._4_4_;
        fStack_4ab8 = fStack_4ab8 * (float)uStack_4138;
        fStack_4ab4 = fStack_4ab4 * uStack_4138._4_4_;
        fStack_4ab0 = fStack_4ab0 * (float)uStack_4130;
        fStack_4aac = fStack_4aac * uStack_4130._4_4_;
        fStack_4aa8 = fStack_4aa8 * (float)uStack_4128;
        local_3798 = 0x3f800000;
        local_1160 = 0x3f800000;
        auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
        auVar6 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(0x3f800000),0x30);
        auVar158._16_16_ = auVar4;
        auVar158._0_16_ = auVar6;
        local_1180._0_8_ = auVar6._0_8_;
        local_1180._8_8_ = auVar6._8_8_;
        local_1180._16_8_ = auVar4._0_8_;
        local_1180._24_8_ = auVar4._8_8_;
        local_4ae0 = local_1180._0_8_;
        uStack_4ad8 = local_1180._8_8_;
        uStack_4ad0 = local_1180._16_8_;
        uStack_4ac8 = local_1180._24_8_;
        local_2f20 = ZEXT832(0) << 0x20;
        local_13a0 = 0;
        local_4aa0._8_8_ = SUB328(ZEXT832(0),4);
        uStack_1398 = local_4aa0._8_8_;
        uStack_1390 = 0;
        uStack_1388 = 0;
        local_13c0 = CONCAT44(fStack_4abc,local_4ac0);
        uStack_13b8 = CONCAT44(fStack_4ab4,fStack_4ab8);
        uStack_13b0 = CONCAT44(fStack_4aac,fStack_4ab0);
        uStack_13a8 = CONCAT44(fStack_4aa4,fStack_4aa8);
        auVar102._8_8_ = uStack_13b8;
        auVar102._0_8_ = local_13c0;
        auVar102._16_8_ = uStack_13b0;
        auVar102._24_8_ = uStack_13a8;
        auVar11 = vsubps_avx(ZEXT832((ulong)local_4aa0._8_8_) << 0x40,auVar102);
        local_2fc0 = 0x3f8000003f800000;
        uStack_2fb8 = 0x3f8000003f800000;
        uStack_2fb0 = 0x3f8000003f800000;
        uStack_2fa8 = 0x3f8000003f800000;
        local_2f40._0_8_ = auVar11._0_8_;
        local_fa0 = local_2f40._0_8_;
        local_2f40._8_8_ = auVar11._8_8_;
        uStack_f98 = local_2f40._8_8_;
        local_2f40._16_8_ = auVar11._16_8_;
        uStack_f90 = local_2f40._16_8_;
        local_2f40._24_8_ = auVar11._24_8_;
        uStack_f88 = local_2f40._24_8_;
        local_fc0 = 0x42b0c0a542b0c0a5;
        uStack_fb8 = 0x42b0c0a542b0c0a5;
        uStack_fb0 = 0x42b0c0a542b0c0a5;
        uStack_fa8 = 0x42b0c0a542b0c0a5;
        auVar106._8_8_ = 0x42b0c0a542b0c0a5;
        auVar106._0_8_ = 0x42b0c0a542b0c0a5;
        auVar106._16_8_ = 0x42b0c0a542b0c0a5;
        auVar106._24_8_ = 0x42b0c0a542b0c0a5;
        auVar11 = vminps_avx(auVar11,auVar106);
        local_2f40._0_8_ = auVar11._0_8_;
        local_e60 = local_2f40._0_8_;
        local_2f40._8_8_ = auVar11._8_8_;
        uStack_e58 = local_2f40._8_8_;
        local_2f40._16_8_ = auVar11._16_8_;
        uStack_e50 = local_2f40._16_8_;
        local_2f40._24_8_ = auVar11._24_8_;
        uStack_e48 = local_2f40._24_8_;
        local_e80 = 0xc2b0c0a5c2b0c0a5;
        uStack_e78 = 0xc2b0c0a5c2b0c0a5;
        uStack_e70 = 0xc2b0c0a5c2b0c0a5;
        uStack_e68 = 0xc2b0c0a5c2b0c0a5;
        auVar111._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar111._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar111._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar111._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar7 = vmaxps_avx(auVar11,auVar111);
        local_2f40._0_8_ = auVar7._0_8_;
        uVar31 = local_2f40._0_8_;
        local_2f40._8_8_ = auVar7._8_8_;
        uVar32 = local_2f40._8_8_;
        local_2f40._16_8_ = auVar7._16_8_;
        uVar33 = local_2f40._16_8_;
        local_2f40._24_8_ = auVar7._24_8_;
        uVar34 = local_2f40._24_8_;
        local_2a80 = 0x3fb8aa3b3fb8aa3b;
        uStack_2a78 = 0x3fb8aa3b3fb8aa3b;
        uStack_2a70 = 0x3fb8aa3b3fb8aa3b;
        uStack_2a68 = 0x3fb8aa3b3fb8aa3b;
        local_2a60._0_4_ = auVar7._0_4_;
        local_2a60._4_4_ = auVar7._4_4_;
        uStack_2a58._0_4_ = auVar7._8_4_;
        uStack_2a58._4_4_ = auVar7._12_4_;
        uStack_2a50._0_4_ = auVar7._16_4_;
        uStack_2a50._4_4_ = auVar7._20_4_;
        uStack_2a48._0_4_ = auVar7._24_4_;
        uStack_2a48._4_4_ = auVar7._28_4_;
        local_2f80._4_4_ = local_2a60._4_4_ * 1.442695;
        local_2f80._0_4_ = (float)local_2a60 * 1.442695;
        uStack_2f78._0_4_ = (float)uStack_2a58 * 1.442695;
        uStack_2f78._4_4_ = uStack_2a58._4_4_ * 1.442695;
        uStack_2f70._0_4_ = (float)uStack_2a50 * 1.442695;
        uStack_2f70._4_4_ = uStack_2a50._4_4_ * 1.442695;
        auVar144 = _local_2f80;
        uStack_2f68._0_4_ = (float)uStack_2a48 * 1.442695;
        uStack_2f68._4_4_ = uStack_2a48._4_4_;
        auVar11 = _local_2f80;
        local_2d20 = local_2f80;
        uStack_2d18 = uStack_2f78;
        uStack_2f70 = auVar144._16_8_;
        uStack_2d10 = uStack_2f70;
        uStack_2f68 = auVar11._24_8_;
        uStack_2d08 = uStack_2f68;
        local_2e80 = 0x3f0000003f000000;
        uStack_2e78 = 0x3f0000003f000000;
        uStack_2e70 = 0x3f0000003f000000;
        uStack_2e68 = 0x3f0000003f000000;
        local_2f80._4_4_ = local_2a60._4_4_ * 1.442695 + 0.5;
        local_2f80._0_4_ = (float)local_2a60 * 1.442695 + 0.5;
        uStack_2f78._0_4_ = (float)uStack_2a58 * 1.442695 + 0.5;
        uStack_2f78._4_4_ = uStack_2a58._4_4_ * 1.442695 + 0.5;
        uStack_2f70._0_4_ = (float)uStack_2a50 * 1.442695 + 0.5;
        uStack_2f70._4_4_ = uStack_2a50._4_4_ * 1.442695 + 0.5;
        uStack_2f68._0_4_ = (float)uStack_2a48 * 1.442695 + 0.5;
        uStack_2f68._4_4_ = uStack_2a48._4_4_ + 0.5;
        auVar8 = vroundps_avx(_local_2f80,1);
        auVar11 = vcmpps_avx(_local_2f80,auVar8,1);
        local_2fe0._0_8_ = auVar11._0_8_;
        local_d20 = local_2fe0._0_8_;
        local_2fe0._8_8_ = auVar11._8_8_;
        uStack_d18 = local_2fe0._8_8_;
        local_2fe0._16_8_ = auVar11._16_8_;
        uStack_d10 = local_2fe0._16_8_;
        local_2fe0._24_8_ = auVar11._24_8_;
        uStack_d08 = local_2fe0._24_8_;
        local_d40 = 0x3f8000003f800000;
        uStack_d38 = 0x3f8000003f800000;
        uStack_d30 = 0x3f8000003f800000;
        uStack_d28 = 0x3f8000003f800000;
        auVar116._8_8_ = 0x3f8000003f800000;
        auVar116._0_8_ = 0x3f8000003f800000;
        auVar116._16_8_ = 0x3f8000003f800000;
        auVar116._24_8_ = 0x3f8000003f800000;
        local_2fe0 = vandps_avx(auVar11,auVar116);
        local_2f60 = auVar8._0_8_;
        local_1560 = local_2f60;
        uStack_2f58 = auVar8._8_8_;
        uStack_1558 = uStack_2f58;
        uStack_2f50 = auVar8._16_8_;
        uStack_1550 = uStack_2f50;
        uStack_2f48 = auVar8._24_8_;
        uStack_1548 = uStack_2f48;
        local_1580 = local_2fe0._0_8_;
        uStack_1578 = local_2fe0._8_8_;
        uStack_1570 = local_2fe0._16_8_;
        uStack_1568 = local_2fe0._24_8_;
        _local_2f80 = vsubps_avx(auVar8,local_2fe0);
        local_2ac0 = 0x3f3180003f318000;
        uStack_2ab8 = 0x3f3180003f318000;
        uStack_2ab0 = 0x3f3180003f318000;
        uStack_2aa8 = 0x3f3180003f318000;
        local_2aa0._0_4_ = local_2f80._0_4_;
        local_2aa0._4_4_ = local_2f80._4_4_;
        uStack_2a98._0_4_ = local_2f80._8_4_;
        uStack_2a98._4_4_ = local_2f80._12_4_;
        uStack_2a90._0_4_ = local_2f80._16_4_;
        uStack_2a90._4_4_ = local_2f80._20_4_;
        uStack_2a88._0_4_ = local_2f80._24_4_;
        uStack_2a88._4_4_ = local_2f80._28_4_;
        local_2f60._4_4_ = local_2aa0._4_4_ * 0.6933594;
        local_2f60._0_4_ = (float)local_2aa0 * 0.6933594;
        uStack_2f58._0_4_ = (float)uStack_2a98 * 0.6933594;
        uStack_2f58._4_4_ = uStack_2a98._4_4_ * 0.6933594;
        uStack_2f50._0_4_ = (float)uStack_2a90 * 0.6933594;
        uStack_2f50._4_4_ = uStack_2a90._4_4_ * 0.6933594;
        auVar144 = _local_2f60;
        uStack_2f48._0_4_ = (float)uStack_2a88 * 0.6933594;
        uStack_2f48._4_4_ = uStack_2a88._4_4_;
        auVar8 = _local_2f60;
        local_2ae0 = local_2f80;
        uStack_2ad8 = uStack_2f78;
        uStack_2ad0 = uStack_2f70;
        uStack_2ac8 = uStack_2f68;
        local_2b00 = 0xb95e8083b95e8083;
        uStack_2af8 = 0xb95e8083b95e8083;
        uStack_2af0 = 0xb95e8083b95e8083;
        uStack_2ae8 = 0xb95e8083b95e8083;
        local_15a0 = local_2f40._0_8_;
        uStack_1598 = local_2f40._8_8_;
        uStack_1590 = local_2f40._16_8_;
        uStack_1588 = local_2f40._24_8_;
        local_15c0 = local_2f60;
        uStack_15b8 = uStack_2f58;
        uStack_2f50 = auVar144._16_8_;
        uStack_15b0 = uStack_2f50;
        uStack_2f48 = auVar8._24_8_;
        uStack_15a8 = uStack_2f48;
        auVar94._16_8_ = uStack_2f50;
        auVar94._0_16_ = _local_2f60;
        auVar94._24_8_ = uStack_2f48;
        auVar11 = vsubps_avx(auVar7,auVar94);
        local_2f40._0_8_ = auVar11._0_8_;
        local_15e0 = local_2f40._0_8_;
        local_2f40._8_8_ = auVar11._8_8_;
        uStack_15d8 = local_2f40._8_8_;
        local_2f40._16_8_ = auVar11._16_8_;
        uStack_15d0 = local_2f40._16_8_;
        local_2f40._24_8_ = auVar11._24_8_;
        uStack_15c8 = local_2f40._24_8_;
        local_1600 = CONCAT44(local_2aa0._4_4_ * -0.00021219444,(float)local_2aa0 * -0.00021219444);
        uStack_15f8 = CONCAT44(uStack_2a98._4_4_ * -0.00021219444,
                               (float)uStack_2a98 * -0.00021219444);
        uStack_15f0 = CONCAT44(uStack_2a90._4_4_ * -0.00021219444,
                               (float)uStack_2a90 * -0.00021219444);
        uStack_15e8 = CONCAT44(uStack_2a88._4_4_,(float)uStack_2a88 * -0.00021219444);
        auVar93._8_8_ = uStack_15f8;
        auVar93._0_8_ = local_1600;
        auVar93._16_8_ = uStack_15f0;
        auVar93._24_8_ = uStack_15e8;
        local_2f40 = vsubps_avx(auVar11,auVar93);
        local_2b40 = local_2f40._0_8_;
        uStack_2b38 = local_2f40._8_8_;
        uStack_2b30 = local_2f40._16_8_;
        uStack_2b28 = local_2f40._24_8_;
        local_2b20._0_4_ = local_2f40._0_4_;
        local_2b20._4_4_ = local_2f40._4_4_;
        uStack_2b18._0_4_ = local_2f40._8_4_;
        uStack_2b18._4_4_ = local_2f40._12_4_;
        uStack_2b10._0_4_ = local_2f40._16_4_;
        uStack_2b10._4_4_ = local_2f40._20_4_;
        uStack_2b08._0_4_ = local_2f40._24_4_;
        uStack_2b08._4_4_ = local_2f40._28_4_;
        fStack_2fe4 = uStack_2b08._4_4_;
        local_3000 = (float)local_2b20 * (float)local_2b20;
        fStack_2ffc = local_2b20._4_4_ * local_2b20._4_4_;
        fStack_2ff8 = (float)uStack_2b18 * (float)uStack_2b18;
        fStack_2ff4 = uStack_2b18._4_4_ * uStack_2b18._4_4_;
        fStack_2ff0 = (float)uStack_2b10 * (float)uStack_2b10;
        fStack_2fec = uStack_2b10._4_4_ * uStack_2b10._4_4_;
        fStack_2fe8 = (float)uStack_2b08 * (float)uStack_2b08;
        local_2b60 = 0x3950696739506967;
        uStack_2b58 = 0x3950696739506967;
        uStack_2b50 = 0x3950696739506967;
        uStack_2b48 = 0x3950696739506967;
        local_2b80 = local_2f40._0_8_;
        uStack_2b78 = local_2f40._8_8_;
        uStack_2b70 = local_2f40._16_8_;
        uStack_2b68 = local_2f40._24_8_;
        local_3020 = CONCAT44(local_2b20._4_4_ * 0.00019875691,(float)local_2b20 * 0.00019875691);
        uStack_3018 = CONCAT44(uStack_2b18._4_4_ * 0.00019875691,(float)uStack_2b18 * 0.00019875691)
        ;
        uStack_3010 = CONCAT44(uStack_2b10._4_4_ * 0.00019875691,(float)uStack_2b10 * 0.00019875691)
        ;
        uStack_3008 = CONCAT44(0x39506967,(float)uStack_2b08 * 0.00019875691);
        local_2d60 = local_3020;
        uStack_2d58 = uStack_3018;
        uStack_2d50 = uStack_3010;
        uStack_2d48 = uStack_3008;
        local_2d80 = 0x3ab743ce3ab743ce;
        uStack_2d78 = 0x3ab743ce3ab743ce;
        uStack_2d70 = 0x3ab743ce3ab743ce;
        uStack_2d68 = 0x3ab743ce3ab743ce;
        local_3740 = (float)local_2b20 * 0.00019875691 + 0.0013981999;
        fStack_373c = local_2b20._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_3738 = (float)uStack_2b18 * 0.00019875691 + 0.0013981999;
        fStack_3734 = uStack_2b18._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_3730 = (float)uStack_2b10 * 0.00019875691 + 0.0013981999;
        fStack_372c = uStack_2b10._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_3728 = (float)uStack_2b08 * 0.00019875691 + 0.0013981999;
        local_3020 = CONCAT44(fStack_373c,local_3740);
        uStack_3018 = CONCAT44(fStack_3734,fStack_3738);
        uStack_3010 = CONCAT44(fStack_372c,fStack_3730);
        uStack_3008 = CONCAT44(0x3ad150fb,fStack_3728);
        local_2ba0 = local_3020;
        uStack_2b98 = uStack_3018;
        uStack_2b90 = uStack_3010;
        uStack_2b88 = uStack_3008;
        local_2bc0 = local_2f40._0_8_;
        uStack_2bb8 = local_2f40._8_8_;
        uStack_2bb0 = local_2f40._16_8_;
        uStack_2ba8 = local_2f40._24_8_;
        local_3740 = local_3740 * (float)local_2b20;
        fStack_373c = fStack_373c * local_2b20._4_4_;
        fStack_3738 = fStack_3738 * (float)uStack_2b18;
        fStack_3734 = fStack_3734 * uStack_2b18._4_4_;
        fStack_3730 = fStack_3730 * (float)uStack_2b10;
        fStack_372c = fStack_372c * uStack_2b10._4_4_;
        fStack_3728 = fStack_3728 * (float)uStack_2b08;
        local_3020 = CONCAT44(fStack_373c,local_3740);
        uStack_3018 = CONCAT44(fStack_3734,fStack_3738);
        uStack_3010 = CONCAT44(fStack_372c,fStack_3730);
        uStack_3008 = CONCAT44(0x3ad150fb,fStack_3728);
        local_2da0 = local_3020;
        uStack_2d98 = uStack_3018;
        uStack_2d90 = uStack_3010;
        uStack_2d88 = uStack_3008;
        local_2dc0 = 0x3c0889083c088908;
        uStack_2db8 = 0x3c0889083c088908;
        uStack_2db0 = 0x3c0889083c088908;
        uStack_2da8 = 0x3c0889083c088908;
        local_3740 = local_3740 + 0.008333452;
        fStack_373c = fStack_373c + 0.008333452;
        fStack_3738 = fStack_3738 + 0.008333452;
        fStack_3734 = fStack_3734 + 0.008333452;
        fStack_3730 = fStack_3730 + 0.008333452;
        fStack_372c = fStack_372c + 0.008333452;
        fStack_3728 = fStack_3728 + 0.008333452;
        local_3020 = CONCAT44(fStack_373c,local_3740);
        uStack_3018 = CONCAT44(fStack_3734,fStack_3738);
        uStack_3010 = CONCAT44(fStack_372c,fStack_3730);
        uStack_3008 = CONCAT44(0x3c22b327,fStack_3728);
        local_2be0 = local_3020;
        uStack_2bd8 = uStack_3018;
        uStack_2bd0 = uStack_3010;
        uStack_2bc8 = uStack_3008;
        local_2c00 = local_2f40._0_8_;
        uStack_2bf8 = local_2f40._8_8_;
        uStack_2bf0 = local_2f40._16_8_;
        uStack_2be8 = local_2f40._24_8_;
        local_3740 = local_3740 * (float)local_2b20;
        fStack_373c = fStack_373c * local_2b20._4_4_;
        fStack_3738 = fStack_3738 * (float)uStack_2b18;
        fStack_3734 = fStack_3734 * uStack_2b18._4_4_;
        fStack_3730 = fStack_3730 * (float)uStack_2b10;
        fStack_372c = fStack_372c * uStack_2b10._4_4_;
        fStack_3728 = fStack_3728 * (float)uStack_2b08;
        local_3020 = CONCAT44(fStack_373c,local_3740);
        uStack_3018 = CONCAT44(fStack_3734,fStack_3738);
        uStack_3010 = CONCAT44(fStack_372c,fStack_3730);
        uStack_3008 = CONCAT44(0x3c22b327,fStack_3728);
        local_2de0 = local_3020;
        uStack_2dd8 = uStack_3018;
        uStack_2dd0 = uStack_3010;
        uStack_2dc8 = uStack_3008;
        local_2e00 = 0x3d2aa9c13d2aa9c1;
        uStack_2df8 = 0x3d2aa9c13d2aa9c1;
        uStack_2df0 = 0x3d2aa9c13d2aa9c1;
        uStack_2de8 = 0x3d2aa9c13d2aa9c1;
        local_3740 = local_3740 + 0.041665796;
        fStack_373c = fStack_373c + 0.041665796;
        fStack_3738 = fStack_3738 + 0.041665796;
        fStack_3734 = fStack_3734 + 0.041665796;
        fStack_3730 = fStack_3730 + 0.041665796;
        fStack_372c = fStack_372c + 0.041665796;
        fStack_3728 = fStack_3728 + 0.041665796;
        local_3020 = CONCAT44(fStack_373c,local_3740);
        uStack_3018 = CONCAT44(fStack_3734,fStack_3738);
        uStack_3010 = CONCAT44(fStack_372c,fStack_3730);
        uStack_3008 = CONCAT44(0x3d53568b,fStack_3728);
        local_2c20 = local_3020;
        uStack_2c18 = uStack_3018;
        uStack_2c10 = uStack_3010;
        uStack_2c08 = uStack_3008;
        local_2c40 = local_2f40._0_8_;
        uStack_2c38 = local_2f40._8_8_;
        uStack_2c30 = local_2f40._16_8_;
        uStack_2c28 = local_2f40._24_8_;
        local_3740 = local_3740 * (float)local_2b20;
        fStack_373c = fStack_373c * local_2b20._4_4_;
        fStack_3738 = fStack_3738 * (float)uStack_2b18;
        fStack_3734 = fStack_3734 * uStack_2b18._4_4_;
        fStack_3730 = fStack_3730 * (float)uStack_2b10;
        fStack_372c = fStack_372c * uStack_2b10._4_4_;
        fStack_3728 = fStack_3728 * (float)uStack_2b08;
        local_3020 = CONCAT44(fStack_373c,local_3740);
        uStack_3018 = CONCAT44(fStack_3734,fStack_3738);
        uStack_3010 = CONCAT44(fStack_372c,fStack_3730);
        uStack_3008 = CONCAT44(0x3d53568b,fStack_3728);
        local_2e20 = local_3020;
        uStack_2e18 = uStack_3018;
        uStack_2e10 = uStack_3010;
        uStack_2e08 = uStack_3008;
        local_2e40 = 0x3e2aaaaa3e2aaaaa;
        uStack_2e38 = 0x3e2aaaaa3e2aaaaa;
        uStack_2e30 = 0x3e2aaaaa3e2aaaaa;
        uStack_2e28 = 0x3e2aaaaa3e2aaaaa;
        local_3740 = local_3740 + 0.16666666;
        fStack_373c = fStack_373c + 0.16666666;
        fStack_3738 = fStack_3738 + 0.16666666;
        fStack_3734 = fStack_3734 + 0.16666666;
        fStack_3730 = fStack_3730 + 0.16666666;
        fStack_372c = fStack_372c + 0.16666666;
        fStack_3728 = fStack_3728 + 0.16666666;
        local_3020 = CONCAT44(fStack_373c,local_3740);
        uStack_3018 = CONCAT44(fStack_3734,fStack_3738);
        uStack_3010 = CONCAT44(fStack_372c,fStack_3730);
        uStack_3008 = CONCAT44(0x3e5f804d,fStack_3728);
        local_2c60 = local_3020;
        uStack_2c58 = uStack_3018;
        uStack_2c50 = uStack_3010;
        uStack_2c48 = uStack_3008;
        local_2c80 = local_2f40._0_8_;
        uStack_2c78 = local_2f40._8_8_;
        uStack_2c70 = local_2f40._16_8_;
        uStack_2c68 = local_2f40._24_8_;
        local_3740 = local_3740 * (float)local_2b20;
        fStack_373c = fStack_373c * local_2b20._4_4_;
        fStack_3738 = fStack_3738 * (float)uStack_2b18;
        fStack_3734 = fStack_3734 * uStack_2b18._4_4_;
        fStack_3730 = fStack_3730 * (float)uStack_2b10;
        fStack_372c = fStack_372c * uStack_2b10._4_4_;
        fStack_3728 = fStack_3728 * (float)uStack_2b08;
        local_3020 = CONCAT44(fStack_373c,local_3740);
        uStack_3018 = CONCAT44(fStack_3734,fStack_3738);
        uStack_3010 = CONCAT44(fStack_372c,fStack_3730);
        uStack_3008 = CONCAT44(0x3e5f804d,fStack_3728);
        local_2e60 = local_3020;
        uStack_2e58 = uStack_3018;
        uStack_2e50 = uStack_3010;
        uStack_2e48 = uStack_3008;
        local_3740 = local_3740 + 0.5;
        fStack_373c = fStack_373c + 0.5;
        fStack_3738 = fStack_3738 + 0.5;
        fStack_3734 = fStack_3734 + 0.5;
        fStack_3730 = fStack_3730 + 0.5;
        fStack_372c = fStack_372c + 0.5;
        fStack_3728 = fStack_3728 + 0.5;
        local_3020 = CONCAT44(fStack_373c,local_3740);
        uStack_3018 = CONCAT44(fStack_3734,fStack_3738);
        uStack_3010 = CONCAT44(fStack_372c,fStack_3730);
        uStack_3008 = CONCAT44(0x3f37e013,fStack_3728);
        local_2ca0 = local_3020;
        uStack_2c98 = uStack_3018;
        uStack_2c90 = uStack_3010;
        uStack_2c88 = uStack_3008;
        local_2cc0 = CONCAT44(fStack_2ffc,local_3000);
        uStack_2cb8 = CONCAT44(fStack_2ff4,fStack_2ff8);
        uStack_2cb0 = CONCAT44(fStack_2fec,fStack_2ff0);
        uStack_2ca8 = CONCAT44(uStack_2b08._4_4_,fStack_2fe8);
        local_3740 = local_3740 * local_3000;
        fStack_373c = fStack_373c * fStack_2ffc;
        fStack_3738 = fStack_3738 * fStack_2ff8;
        fStack_3734 = fStack_3734 * fStack_2ff4;
        fStack_3730 = fStack_3730 * fStack_2ff0;
        fStack_372c = fStack_372c * fStack_2fec;
        fStack_3728 = fStack_3728 * fStack_2fe8;
        local_3020 = CONCAT44(fStack_373c,local_3740);
        uStack_3018 = CONCAT44(fStack_3734,fStack_3738);
        uStack_3010 = CONCAT44(fStack_372c,fStack_3730);
        uStack_3008 = CONCAT44(0x3f37e013,fStack_3728);
        local_2ea0 = local_3020;
        uStack_2e98 = uStack_3018;
        uStack_2e90 = uStack_3010;
        uStack_2e88 = uStack_3008;
        local_2ec0 = local_2f40._0_8_;
        uStack_2eb8 = local_2f40._8_8_;
        uStack_2eb0 = local_2f40._16_8_;
        uStack_2ea8 = local_2f40._24_8_;
        local_3740 = local_3740 + (float)local_2b20;
        fStack_373c = fStack_373c + local_2b20._4_4_;
        fStack_3738 = fStack_3738 + (float)uStack_2b18;
        fStack_3734 = fStack_3734 + uStack_2b18._4_4_;
        fStack_3730 = fStack_3730 + (float)uStack_2b10;
        fStack_372c = fStack_372c + uStack_2b10._4_4_;
        fStack_3728 = fStack_3728 + (float)uStack_2b08;
        local_3020 = CONCAT44(fStack_373c,local_3740);
        uStack_3018 = CONCAT44(fStack_3734,fStack_3738);
        uStack_3010 = CONCAT44(fStack_372c,fStack_3730);
        uStack_3008 = CONCAT44(uStack_2b08._4_4_ + 0.71826285,fStack_3728);
        local_2ee0 = local_3020;
        uStack_2ed8 = uStack_3018;
        uStack_2ed0 = uStack_3010;
        uStack_2ec8 = uStack_3008;
        local_2f00 = 0x3f8000003f800000;
        uStack_2ef8 = 0x3f8000003f800000;
        uStack_2ef0 = 0x3f8000003f800000;
        uStack_2ee8 = 0x3f8000003f800000;
        local_3740 = local_3740 + 1.0;
        fStack_373c = fStack_373c + 1.0;
        fStack_3738 = fStack_3738 + 1.0;
        fStack_3734 = fStack_3734 + 1.0;
        fStack_3730 = fStack_3730 + 1.0;
        fStack_372c = fStack_372c + 1.0;
        fStack_3728 = fStack_3728 + 1.0;
        fStack_3724 = uStack_2b08._4_4_ + 0.71826285 + 1.0;
        local_3020 = CONCAT44(fStack_373c,local_3740);
        uStack_3018 = CONCAT44(fStack_3734,fStack_3738);
        uStack_3010 = CONCAT44(fStack_372c,fStack_3730);
        uStack_3008 = CONCAT44(fStack_3724,fStack_3728);
        local_c60 = local_2f80;
        uStack_c58 = uStack_2f78;
        uStack_c50 = uStack_2f70;
        uStack_c48 = uStack_2f68;
        local_2fa0 = CONCAT44((int)local_2aa0._4_4_,(int)(float)local_2aa0);
        uStack_2f98 = CONCAT44((int)uStack_2a98._4_4_,(int)(float)uStack_2a98);
        uStack_2f90 = CONCAT44((int)uStack_2a90._4_4_,(int)(float)uStack_2a90);
        uStack_2f88 = CONCAT44((int)uStack_2a88._4_4_,(int)(float)uStack_2a88);
        local_840 = local_2fa0;
        uStack_838 = uStack_2f98;
        uStack_830 = uStack_2f90;
        uStack_828 = uStack_2f88;
        local_860 = 0x7f0000007f;
        uStack_858 = 0x7f0000007f;
        uStack_850 = 0x7f0000007f;
        uStack_848 = 0x7f0000007f;
        local_8e0 = local_2fa0;
        uStack_8d8 = uStack_2f98;
        uStack_8d0 = uStack_2f90;
        uStack_8c8 = uStack_2f88;
        local_900 = 0x7f0000007f;
        uStack_8f8 = 0x7f0000007f;
        uStack_8f0 = 0x7f0000007f;
        uStack_8e8 = 0x7f0000007f;
        local_890 = 0x7f0000007f;
        uStack_888 = 0x7f0000007f;
        local_8a0 = 0x7f0000007f;
        uStack_898 = 0x7f0000007f;
        local_240 = local_2fa0;
        uStack_238 = uStack_2f98;
        local_250 = 0x7f0000007f;
        uStack_248 = 0x7f0000007f;
        auVar125._8_8_ = uStack_2f98;
        auVar125._0_8_ = local_2fa0;
        auVar124._8_8_ = 0x7f0000007f;
        auVar124._0_8_ = 0x7f0000007f;
        local_870 = vpaddd_avx(auVar125,auVar124);
        local_260 = uStack_2f90;
        uStack_258 = uStack_2f88;
        local_270 = 0x7f0000007f;
        uStack_268 = 0x7f0000007f;
        auVar123._8_8_ = uStack_2f88;
        auVar123._0_8_ = uStack_2f90;
        auVar122._8_8_ = 0x7f0000007f;
        auVar122._0_8_ = 0x7f0000007f;
        local_880 = vpaddd_avx(auVar123,auVar122);
        local_920 = local_870._0_8_;
        uStack_918 = local_870._8_8_;
        uStack_910 = local_880._0_8_;
        uStack_908 = local_880._8_8_;
        local_8c0 = local_870._0_8_;
        uStack_8b8 = local_870._8_8_;
        uStack_8b0 = local_880._0_8_;
        uStack_8a8 = local_880._8_8_;
        local_440 = local_870._0_8_;
        uStack_438 = local_870._8_8_;
        uStack_430 = local_880._0_8_;
        uStack_428 = local_880._8_8_;
        local_444 = 0x17;
        local_4c0 = local_870._0_8_;
        uStack_4b8 = local_870._8_8_;
        uStack_4b0 = local_880._0_8_;
        uStack_4a8 = local_880._8_8_;
        local_100 = local_870._0_8_;
        uStack_f8 = local_870._8_8_;
        local_104 = 0x17;
        local_460 = vpslld_avx(local_870,ZEXT416(0x17));
        local_120 = local_880._0_8_;
        uStack_118 = local_880._8_8_;
        local_124 = 0x17;
        local_470 = vpslld_avx(local_880,ZEXT416(0x17));
        local_4e0 = local_460._0_8_;
        uStack_4d8 = local_460._8_8_;
        uStack_4d0 = local_470._0_8_;
        uStack_4c8 = local_470._8_8_;
        local_4a0 = local_460._0_8_;
        uStack_498 = local_460._8_8_;
        uStack_490 = local_470._0_8_;
        uStack_488 = local_470._8_8_;
        local_2fa0 = local_460._0_8_;
        uStack_2f98 = local_460._8_8_;
        uStack_2f90 = local_470._0_8_;
        uStack_2f88 = local_470._8_8_;
        local_300 = local_460._0_8_;
        uStack_2f8 = local_460._8_8_;
        uStack_2f0 = local_470._0_8_;
        uStack_2e8 = local_470._8_8_;
        local_3040 = local_460._0_8_;
        uStack_3038 = local_460._8_8_;
        uStack_3030 = local_470._0_8_;
        uStack_3028 = local_470._8_8_;
        local_2ce0 = local_3020;
        uStack_2cd8 = uStack_3018;
        uStack_2cd0 = uStack_3010;
        uStack_2cc8 = uStack_3008;
        local_2d00._0_4_ = local_460._0_4_;
        local_2d00._4_4_ = local_460._4_4_;
        uStack_2cf8._0_4_ = local_460._8_4_;
        uStack_2cf8._4_4_ = local_460._12_4_;
        uStack_2cf0._0_4_ = local_470._0_4_;
        uStack_2cf0._4_4_ = local_470._4_4_;
        uStack_2ce8._0_4_ = local_470._8_4_;
        local_3740 = local_3740 * (float)local_2d00;
        fStack_373c = fStack_373c * local_2d00._4_4_;
        fStack_3738 = fStack_3738 * (float)uStack_2cf8;
        fStack_3734 = fStack_3734 * uStack_2cf8._4_4_;
        fStack_3730 = fStack_3730 * (float)uStack_2cf0;
        fStack_372c = fStack_372c * uStack_2cf0._4_4_;
        fStack_3728 = fStack_3728 * (float)uStack_2ce8;
        local_3020 = CONCAT44(fStack_373c,local_3740);
        uStack_3018 = CONCAT44(fStack_3734,fStack_3738);
        uStack_3010 = CONCAT44(fStack_372c,fStack_3730);
        uStack_3008 = CONCAT44(fStack_3724,fStack_3728);
        local_3720 = local_1180._0_8_;
        uStack_3718 = local_1180._8_8_;
        uStack_3710 = local_1180._16_8_;
        uStack_3708 = local_1180._24_8_;
        local_4980 = local_3020;
        uStack_4978 = uStack_3018;
        uStack_4970 = uStack_3010;
        uStack_4968 = uStack_3008;
        local_4960._0_4_ = auVar6._0_4_;
        local_4960._4_4_ = auVar6._4_4_;
        uStack_4958._0_4_ = auVar6._8_4_;
        uStack_4958._4_4_ = auVar6._12_4_;
        uStack_4950._0_4_ = auVar4._0_4_;
        uStack_4950._4_4_ = auVar4._4_4_;
        uStack_4948._0_4_ = auVar4._8_4_;
        uStack_4948._4_4_ = auVar4._12_4_;
        local_3740 = (float)local_4960 + local_3740;
        fStack_373c = local_4960._4_4_ + fStack_373c;
        fStack_3738 = (float)uStack_4958 + fStack_3738;
        fStack_3734 = uStack_4958._4_4_ + fStack_3734;
        fStack_3730 = (float)uStack_4950 + fStack_3730;
        fStack_372c = uStack_4950._4_4_ + fStack_372c;
        fStack_3728 = (float)uStack_4948 + fStack_3728;
        fStack_3724 = uStack_4948._4_4_ + fStack_3724;
        auVar80._16_8_ = local_1180._16_8_;
        auVar80._0_16_ = auVar6;
        auVar80._24_8_ = local_1180._24_8_;
        auVar79._4_4_ = fStack_373c;
        auVar79._0_4_ = local_3740;
        auVar79._8_4_ = fStack_3738;
        auVar79._12_4_ = fStack_3734;
        auVar79._16_4_ = fStack_3730;
        auVar79._20_4_ = fStack_372c;
        auVar79._24_4_ = fStack_3728;
        auVar79._28_4_ = fStack_3724;
        _local_4160 = vdivps_avx(auVar80,auVar79);
        local_4180 = local_11c0._0_8_;
        uStack_4178 = local_11c0._8_8_;
        uStack_4170 = local_11c0._16_8_;
        uStack_4168 = local_11c0._24_8_;
        local_13e0 = (float)local_4160._0_4_ * (float)local_4140;
        fStack_13dc = (float)local_4160._4_4_ * local_4140._4_4_;
        fStack_13d8 = fStack_4158 * (float)uStack_4138;
        fStack_13d4 = fStack_4154 * uStack_4138._4_4_;
        fStack_13d0 = fStack_4150 * (float)uStack_4130;
        fStack_13cc = fStack_414c * uStack_4130._4_4_;
        uStack_13c4 = local_4160._28_4_;
        fStack_13c8 = fStack_4148 * (float)uStack_4128;
        local_1400 = local_1200._0_8_;
        uStack_13f8 = local_1200._8_8_;
        uStack_13f0 = local_1200._16_8_;
        uStack_13e8 = local_1200._24_8_;
        auVar101._4_4_ = fStack_13dc;
        auVar101._0_4_ = local_13e0;
        auVar101._8_4_ = fStack_13d8;
        auVar101._12_4_ = fStack_13d4;
        auVar101._16_4_ = fStack_13d0;
        auVar101._20_4_ = fStack_13cc;
        auVar101._24_4_ = fStack_13c8;
        auVar101._28_4_ = uStack_13c4;
        auVar100._16_8_ = local_1200._16_8_;
        auVar100._0_16_ = auVar5;
        auVar100._24_8_ = local_1200._24_8_;
        auVar11 = vsubps_avx(auVar101,auVar100);
        local_7220 = auVar11._0_8_;
        uStack_7218 = auVar11._8_8_;
        uStack_7210 = auVar11._16_8_;
        uStack_7208 = auVar11._24_8_;
        local_3b00._0_4_ = auVar11._0_4_;
        local_3b00._4_4_ = auVar11._4_4_;
        uStack_3af8._0_4_ = auVar11._8_4_;
        uStack_3af8._4_4_ = auVar11._12_4_;
        uStack_3af0._0_4_ = auVar11._16_4_;
        uStack_3af0._4_4_ = auVar11._20_4_;
        uStack_3ae8._0_4_ = auVar11._24_4_;
        local_4f40 = CONCAT44((float)local_3ae0._4_4_ * local_3b00._4_4_,
                              (float)local_3ae0._0_4_ * (float)local_3b00);
        uStack_4f38 = CONCAT44(fStack_3ad4 * uStack_3af8._4_4_,fStack_3ad8 * (float)uStack_3af8);
        uStack_4f30 = CONCAT44(fStack_3acc * uStack_3af0._4_4_,fStack_3ad0 * (float)uStack_3af0);
        uStack_4f28 = CONCAT44(uStack_3ac4,fStack_3ac8 * (float)uStack_3ae8);
        local_4e88 = local_5fc8;
        *(undefined8 *)local_5fc8 = local_4ec0;
        *(undefined8 *)(local_5fc8 + 2) = uStack_4eb8;
        *(undefined8 *)(local_5fc8 + 4) = uStack_4eb0;
        *(undefined8 *)(local_5fc8 + 6) = uStack_4ea8;
        local_4ec8 = local_5fd0;
        *(undefined8 *)local_5fd0 = local_4f40;
        *(undefined8 *)(local_5fd0 + 2) = uStack_4f38;
        *(undefined8 *)(local_5fd0 + 4) = uStack_4f30;
        *(undefined8 *)(local_5fd0 + 6) = uStack_4f28;
        local_4f08 = local_5fc0;
        auVar76._8_8_ = uStack_4f38;
        auVar76._0_8_ = local_4f40;
        auVar76._16_8_ = uStack_4f30;
        auVar76._24_8_ = uStack_4f28;
        *local_5fc0 = auVar76;
        local_5fc8 = local_5fc8 + 8;
        local_5fc0 = local_5fc0 + 1;
        local_5fd0 = local_5fd0 + 8;
        local_5fd8 = local_5fd8 + 1;
        local_5fe0 = local_5fe0 + 1;
        local_5fe8 = local_5fe8 + 1;
        local_5ff0 = local_5ff0 + 8;
        local_4f00 = local_4f40;
        uStack_4ef8 = uStack_4f38;
        uStack_4ef0 = uStack_4f30;
        uStack_4ee8 = uStack_4f28;
        local_4c20 = local_1d20;
        local_4bc0 = local_2320;
        local_4b60 = local_2920;
        local_4b00 = local_4ec0;
        uStack_4af8 = uStack_4eb8;
        uStack_4af0 = uStack_4eb0;
        uStack_4ae8 = uStack_4ea8;
        local_4aa0 = local_2f20;
        local_49e0 = local_3520;
        local_49a0 = local_10c0._0_8_;
        uStack_4998 = local_10c0._8_8_;
        uStack_4990 = local_10c0._16_8_;
        uStack_4988 = local_10c0._24_8_;
        local_4960 = local_1180._0_8_;
        uStack_4958 = local_1180._8_8_;
        uStack_4950 = local_1180._16_8_;
        uStack_4948 = local_1180._24_8_;
        local_4920 = local_1240._0_8_;
        uStack_4918 = local_1240._8_8_;
        uStack_4910 = local_1240._16_8_;
        uStack_4908 = local_1240._24_8_;
        local_48e0 = local_1280._0_8_;
        uStack_48d8 = local_1280._8_8_;
        uStack_48d0 = local_1280._16_8_;
        uStack_48c8 = local_1280._24_8_;
        local_48a0 = local_12c0._0_8_;
        uStack_4898 = local_12c0._8_8_;
        uStack_4890 = local_12c0._16_8_;
        uStack_4888 = local_12c0._24_8_;
        local_41c0 = local_1100._0_8_;
        uStack_41b8 = local_1100._8_8_;
        uStack_41b0 = local_1100._16_8_;
        uStack_41a8 = local_1100._24_8_;
        local_41a0 = local_4a40;
        uStack_4198 = uStack_4a38;
        uStack_4190 = uStack_4a30;
        uStack_4188 = uStack_4a28;
        local_4140 = local_11c0._0_8_;
        uStack_4138 = local_11c0._8_8_;
        uStack_4130 = local_11c0._16_8_;
        uStack_4128 = local_11c0._24_8_;
        local_4120 = local_4ec0;
        uStack_4118 = uStack_4eb8;
        uStack_4110 = uStack_4eb0;
        uStack_4108 = uStack_4ea8;
        local_3b00 = local_7220;
        uStack_3af8 = uStack_7218;
        uStack_3af0 = uStack_7210;
        uStack_3ae8 = uStack_7208;
        local_3ac0 = local_6fe0;
        uStack_3ab8 = uStack_6fd8;
        uStack_3ab0 = uStack_6fd0;
        uStack_3aa8 = uStack_6fc8;
        local_3aa0 = local_6c00;
        uStack_3a98 = uStack_6bf8;
        uStack_3a90 = uStack_6bf0;
        uStack_3a88 = uStack_6be8;
        local_3a80 = uVar28;
        uStack_3a78 = uVar29;
        uStack_3a70 = uVar30;
        local_3a60 = local_6d20;
        uStack_3a58 = uStack_6d18;
        uStack_3a50 = uStack_6d10;
        uStack_3a48 = uStack_6d08;
        _local_3560 = auVar10;
        local_3340 = local_3480;
        uStack_3338 = uStack_3478;
        uStack_3330 = uStack_3470;
        uStack_3328 = uStack_3468;
        local_3300 = local_3a0._0_8_;
        uStack_32f8 = local_3a0._8_8_;
        uStack_32f0 = local_3b0._0_8_;
        uStack_32e8 = local_3b0._8_8_;
        local_3120 = local_3140;
        uStack_3118 = uStack_3138;
        uStack_3110 = uStack_3130;
        uStack_3108 = uStack_3128;
        local_30a0 = local_3580;
        uStack_3098 = uStack_3578;
        uStack_3090 = uStack_3570;
        uStack_3088 = uStack_3568;
        local_3060 = uVar24;
        uStack_3058 = uVar25;
        uStack_3050 = uVar26;
        uStack_3048 = uVar27;
        _local_2f60 = auVar8;
        local_2d40 = local_2e80;
        uStack_2d38 = uStack_2e78;
        uStack_2d30 = uStack_2e70;
        uStack_2d28 = uStack_2e68;
        local_2d00 = local_460._0_8_;
        uStack_2cf8 = local_460._8_8_;
        uStack_2cf0 = local_470._0_8_;
        uStack_2ce8 = local_470._8_8_;
        local_2b20 = local_2b40;
        uStack_2b18 = uStack_2b38;
        uStack_2b10 = uStack_2b30;
        uStack_2b08 = uStack_2b28;
        local_2aa0 = local_2f80;
        uStack_2a98 = uStack_2f78;
        uStack_2a90 = uStack_2f70;
        uStack_2a88 = uStack_2f68;
        local_2a60 = uVar31;
        uStack_2a58 = uVar32;
        uStack_2a50 = uVar33;
        uStack_2a48 = uVar34;
        _local_2960 = auVar141;
        local_2740 = local_2880;
        uStack_2738 = uStack_2878;
        uStack_2730 = uStack_2870;
        uStack_2728 = uStack_2868;
        local_2700 = local_520._0_8_;
        uStack_26f8 = local_520._8_8_;
        uStack_26f0 = local_530._0_8_;
        uStack_26e8 = local_530._8_8_;
        local_2520 = local_2540;
        uStack_2518 = uStack_2538;
        uStack_2510 = uStack_2530;
        uStack_2508 = uStack_2528;
        local_24a0 = local_2980;
        uStack_2498 = uStack_2978;
        uStack_2490 = uStack_2970;
        uStack_2488 = uStack_2968;
        local_2460 = uVar12;
        uStack_2458 = uVar13;
        uStack_2450 = uVar14;
        uStack_2448 = uVar15;
        _local_2360 = auVar142;
        local_2140 = local_2280;
        uStack_2138 = uStack_2278;
        uStack_2130 = uStack_2270;
        uStack_2128 = uStack_2268;
        local_2100 = local_5e0._0_8_;
        uStack_20f8 = local_5e0._8_8_;
        uStack_20f0 = local_5f0._0_8_;
        uStack_20e8 = local_5f0._8_8_;
        local_1f20 = local_1f40;
        uStack_1f18 = uStack_1f38;
        uStack_1f10 = uStack_1f30;
        uStack_1f08 = uStack_1f28;
        local_1ea0 = local_2380;
        uStack_1e98 = uStack_2378;
        uStack_1e90 = uStack_2370;
        uStack_1e88 = uStack_2368;
        local_1e60 = uVar16;
        uStack_1e58 = uVar17;
        uStack_1e50 = uVar18;
        uStack_1e48 = uVar19;
        _local_1d60 = auVar143;
        local_1b40 = local_1c80;
        uStack_1b38 = uStack_1c78;
        uStack_1b30 = uStack_1c70;
        uStack_1b28 = uStack_1c68;
        local_1b00 = local_6a0._0_8_;
        uStack_1af8 = local_6a0._8_8_;
        uStack_1af0 = local_6b0._0_8_;
        uStack_1ae8 = local_6b0._8_8_;
        local_1920 = local_1940;
        uStack_1918 = uStack_1938;
        uStack_1910 = uStack_1930;
        uStack_1908 = uStack_1928;
        local_18a0 = local_1d80;
        uStack_1898 = uStack_1d78;
        uStack_1890 = uStack_1d70;
        uStack_1888 = uStack_1d68;
        local_1860 = uVar20;
        uStack_1858 = uVar21;
        uStack_1850 = uVar22;
        uStack_1848 = uVar23;
        local_1380 = local_4b80;
        uStack_1378 = uStack_4b78;
        uStack_1370 = uStack_4b70;
        uStack_1368 = uStack_4b68;
        local_1340 = local_4be0;
        uStack_1338 = uStack_4bd8;
        uStack_1330 = uStack_4bd0;
        uStack_1328 = uStack_4bc8;
        local_1300 = local_4c40;
        uStack_12f8 = uStack_4c38;
        uStack_12f0 = uStack_4c30;
        uStack_12e8 = uStack_4c28;
        local_12c0 = auVar152;
        local_129c = local_12a0;
        local_1298 = local_12a0;
        local_1294 = local_12a0;
        local_1290 = local_12a0;
        local_128c = local_12a0;
        local_1288 = local_12a0;
        local_1284 = local_12a0;
        local_1280 = auVar151;
        local_125c = local_1260;
        local_1258 = local_1260;
        local_1254 = local_1260;
        local_1250 = local_1260;
        local_124c = local_1260;
        local_1248 = local_1260;
        local_1244 = local_1260;
        local_1240 = auVar150;
        local_121c = local_1220;
        local_1218 = local_1220;
        local_1214 = local_1220;
        local_1210 = local_1220;
        local_120c = local_1220;
        local_1208 = local_1220;
        local_1204 = local_1220;
        local_1200 = auVar156;
        local_11dc = local_11e0;
        local_11d8 = local_11e0;
        local_11d4 = local_11e0;
        local_11d0 = local_11e0;
        local_11cc = local_11e0;
        local_11c8 = local_11e0;
        local_11c4 = local_11e0;
        local_11c0 = auVar157;
        local_119c = local_11a0;
        local_1198 = local_11a0;
        local_1194 = local_11a0;
        local_1190 = local_11a0;
        local_118c = local_11a0;
        local_1188 = local_11a0;
        local_1184 = local_11a0;
        local_1180 = auVar158;
        local_115c = local_1160;
        local_1158 = local_1160;
        local_1154 = local_1160;
        local_1150 = local_1160;
        local_114c = local_1160;
        local_1148 = local_1160;
        local_1144 = local_1160;
        local_1140 = auVar153;
        local_111c = local_1120;
        local_1118 = local_1120;
        local_1114 = local_1120;
        local_1110 = local_1120;
        local_110c = local_1120;
        local_1108 = local_1120;
        local_1104 = local_1120;
        local_1100 = auVar154;
        local_10dc = local_10e0;
        local_10d8 = local_10e0;
        local_10d4 = local_10e0;
        local_10d0 = local_10e0;
        local_10cc = local_10e0;
        local_10c8 = local_10e0;
        local_10c4 = local_10e0;
        local_10c0 = auVar155;
        local_109c = local_10a0;
        local_1098 = local_10a0;
        local_1094 = local_10a0;
        local_1090 = local_10a0;
        local_108c = local_10a0;
        local_1088 = local_10a0;
        local_1084 = local_10a0;
      }
      for (; 0 < (int)local_5ff8; local_5ff8 = local_5ff8 - 1) {
        uVar2 = *(uint *)*local_5fe0;
        uVar3 = *(uint *)*local_5fe8;
        fVar1 = *local_5ff0;
        dVar147 = std::exp((double)((ulong)*(uint *)*local_5fd8 ^ 0x8000000080000000));
        dVar148 = std::exp((double)((ulong)uVar2 ^ 0x8000000080000000));
        dVar149 = std::exp((double)((ulong)uVar3 ^ 0x8000000080000000));
        fVar146 = 1.0 / (SUB84(dVar149,0) + 1.0);
        dVar149 = std::tanh((double)(ulong)(uint)fVar1);
        fVar1 = (1.0 / (SUB84(dVar148,0) + 1.0)) * *local_5fc8 +
                (1.0 / (SUB84(dVar147,0) + 1.0)) * SUB84(dVar149,0);
        dVar147 = std::tanh((double)(ulong)(uint)fVar1);
        fVar146 = fVar146 * SUB84(dVar147,0);
        *local_5fc8 = fVar1;
        *local_5fd0 = fVar146;
        *(float *)*local_5fc0 = fVar146;
        local_5fc8 = local_5fc8 + 1;
        local_5fc0 = (undefined1 (*) [32])(*local_5fc0 + 4);
        local_5fd0 = local_5fd0 + 1;
        local_5fd8 = (undefined1 (*) [32])(*local_5fd8 + 4);
        local_5fe0 = (undefined1 (*) [32])(*local_5fe0 + 4);
        local_5fe8 = (undefined1 (*) [32])(*local_5fe8 + 4);
        local_5ff0 = local_5ff0 + 1;
      }
    }
    local_5ae4 = 0;
  }
  local_5b80 = 1;
  Mat::~Mat((Mat *)0x53b9a3);
  return local_5ae4;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // 4 x num_output
    Mat gates(num_output, 4, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;
        int remain_output = (num_output >> 1) << 1;
        for (int q = 0; q + 1 < num_output; q += 2)
        {
            const float* x = bottom_blob.row(ti);
            const float* hidden_ptr_r = hidden_state;
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data_I = gates.row(0);
            float* gates_data_F = gates.row(1);
            float* gates_data_O = gates.row(2);
            float* gates_data_G = gates.row(3);
            // gate I F O G
            const float* weight_xc_I_0 = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_F_0 = weight_xc.row(num_output * 1 + q);
            const float* weight_xc_O_0 = weight_xc.row(num_output * 2 + q);
            const float* weight_xc_G_0 = weight_xc.row(num_output * 3 + q);
            const float* weight_xc_I_1 = weight_xc.row(num_output * 0 + (q + 1));
            const float* weight_xc_F_1 = weight_xc.row(num_output * 1 + (q + 1));
            const float* weight_xc_O_1 = weight_xc.row(num_output * 2 + (q + 1));
            const float* weight_xc_G_1 = weight_xc.row(num_output * 3 + (q + 1));

            const float* weight_hc_I_0 = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_F_0 = weight_hc.row(num_output * 1 + q);
            const float* weight_hc_O_0 = weight_hc.row(num_output * 2 + q);
            const float* weight_hc_G_0 = weight_hc.row(num_output * 3 + q);
            const float* weight_hc_I_1 = weight_hc.row(num_output * 0 + (q + 1));
            const float* weight_hc_F_1 = weight_hc.row(num_output * 1 + (q + 1));
            const float* weight_hc_O_1 = weight_hc.row(num_output * 2 + (q + 1));
            const float* weight_hc_G_1 = weight_hc.row(num_output * 3 + (q + 1));

            // float I = bias_c_I[q];
            // float F = bias_c_F[q];
            // float O = bias_c_O[q];
            // float G = bias_c_G[q];
            __m256 _sumI_0 = _mm256_setzero_ps();
            __m256 _sumF_0 = _mm256_setzero_ps();
            __m256 _sumO_0 = _mm256_setzero_ps();
            __m256 _sumG_0 = _mm256_setzero_ps();
            __m256 _sumI_1 = _mm256_setzero_ps();
            __m256 _sumF_1 = _mm256_setzero_ps();
            __m256 _sumO_1 = _mm256_setzero_ps();
            __m256 _sumG_1 = _mm256_setzero_ps();
            int nn_num_size = size >> 3;
            int remain_size = size & 7;
            for (; nn_num_size > 0; nn_num_size--)
            {
                __m256 xi = _mm256_loadu_ps(x);
                _sumI_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_I_0), xi, _sumI_0);
                _sumF_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_F_0), xi, _sumF_0);
                _sumO_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_O_0), xi, _sumO_0);
                _sumG_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_G_0), xi, _sumG_0);
                _sumI_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_I_1), xi, _sumI_1);
                _sumF_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_F_1), xi, _sumF_1);
                _sumO_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_O_1), xi, _sumO_1);
                _sumG_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_G_1), xi, _sumG_1);
                x += 8;
                weight_xc_I_0 += 8;
                weight_xc_F_0 += 8;
                weight_xc_O_0 += 8;
                weight_xc_G_0 += 8;
                weight_xc_I_1 += 8;
                weight_xc_F_1 += 8;
                weight_xc_O_1 += 8;
                weight_xc_G_1 += 8;
            }
            int nn_num_output = num_output >> 3;
            int remain_num_output = num_output & 7;
            for (; nn_num_output > 0; nn_num_output--)
            {
                __m256 h_cont = _mm256_loadu_ps(hidden_ptr_r);

                _sumI_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_I_0), h_cont, _sumI_0);
                _sumF_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_F_0), h_cont, _sumF_0);
                _sumO_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_O_0), h_cont, _sumO_0);
                _sumG_0 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_G_0), h_cont, _sumG_0);
                _sumI_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_I_1), h_cont, _sumI_1);
                _sumF_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_F_1), h_cont, _sumF_1);
                _sumO_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_O_1), h_cont, _sumO_1);
                _sumG_1 = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_G_1), h_cont, _sumG_1);
                hidden_ptr_r += 8;
                weight_hc_I_0 += 8;
                weight_hc_F_0 += 8;
                weight_hc_O_0 += 8;
                weight_hc_G_0 += 8;
                weight_hc_I_1 += 8;
                weight_hc_F_1 += 8;
                weight_hc_O_1 += 8;
                weight_hc_G_1 += 8;
            }
            float sums[8];
            _mm256_storeu_ps(sums, HorizontalSums(_sumI_0, _sumF_0, _sumO_0, _sumG_0, _sumI_1, _sumF_1, _sumO_1, _sumG_1));
            sums[0] += bias_c_I[q];
            sums[1] += bias_c_F[q];
            sums[2] += bias_c_O[q];
            sums[3] += bias_c_G[q];
            sums[4] += bias_c_I[q + 1];
            sums[5] += bias_c_F[q + 1];
            sums[6] += bias_c_O[q + 1];
            sums[7] += bias_c_G[q + 1];

            for (; remain_size > 0; remain_size--)
            {
                float xi = *x;
                sums[0] += *weight_xc_I_0 * xi;
                sums[1] += *weight_xc_F_0 * xi;
                sums[2] += *weight_xc_O_0 * xi;
                sums[3] += *weight_xc_G_0 * xi;
                sums[4] += *weight_xc_I_1 * xi;
                sums[5] += *weight_xc_F_1 * xi;
                sums[6] += *weight_xc_O_1 * xi;
                sums[7] += *weight_xc_G_1 * xi;
                x++;
                weight_xc_I_0++;
                weight_xc_F_0++;
                weight_xc_O_0++;
                weight_xc_G_0++;
                weight_xc_I_1++;
                weight_xc_F_1++;
                weight_xc_O_1++;
                weight_xc_G_1++;
            }

            for (; remain_num_output > 0; remain_num_output--)
            {
                float h_cont = *hidden_ptr_r;
                sums[0] += *weight_hc_I_0 * h_cont;
                sums[1] += *weight_hc_F_0 * h_cont;
                sums[2] += *weight_hc_O_0 * h_cont;
                sums[3] += *weight_hc_G_0 * h_cont;
                sums[4] += *weight_hc_I_1 * h_cont;
                sums[5] += *weight_hc_F_1 * h_cont;
                sums[6] += *weight_hc_O_1 * h_cont;
                sums[7] += *weight_hc_G_1 * h_cont;
                hidden_ptr_r++;
                weight_hc_I_0++;
                weight_hc_F_0++;
                weight_hc_O_0++;
                weight_hc_G_0++;
                weight_hc_I_1++;
                weight_hc_F_1++;
                weight_hc_O_1++;
                weight_hc_G_1++;
            }
            gates_data_I[q] = sums[0];
            gates_data_F[q] = sums[1];
            gates_data_O[q] = sums[2];
            gates_data_G[q] = sums[3];
            gates_data_I[q + 1] = sums[4];
            gates_data_F[q + 1] = sums[5];
            gates_data_O[q + 1] = sums[6];
            gates_data_G[q + 1] = sums[7];
        }

        for (int q = remain_output; q < num_output; q++)
        {
            const float* x = bottom_blob.row(ti);
            const float* hidden_ptr_r = hidden_state;
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data_I = gates.row(0);
            float* gates_data_F = gates.row(1);
            float* gates_data_O = gates.row(2);
            float* gates_data_G = gates.row(3);
            // gate I F O G
            const float* weight_xc_I = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_F = weight_xc.row(num_output * 1 + q);
            const float* weight_xc_O = weight_xc.row(num_output * 2 + q);
            const float* weight_xc_G = weight_xc.row(num_output * 3 + q);

            const float* weight_hc_I = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_F = weight_hc.row(num_output * 1 + q);
            const float* weight_hc_O = weight_hc.row(num_output * 2 + q);
            const float* weight_hc_G = weight_hc.row(num_output * 3 + q);

            // float I = bias_c_I[q];
            // float F = bias_c_F[q];
            // float O = bias_c_O[q];
            // float G = bias_c_G[q];
            __m256 _sumI = _mm256_setzero_ps();
            __m256 _sumF = _mm256_setzero_ps();
            __m256 _sumO = _mm256_setzero_ps();
            __m256 _sumG = _mm256_setzero_ps();
            int nn_num_size = size >> 3;
            int remain_size = size & 7;
            for (; nn_num_size > 0; nn_num_size--)
            {
                __m256 xi = _mm256_loadu_ps(x);
                _sumI = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_I), xi, _sumI);
                _sumF = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_F), xi, _sumF);
                _sumO = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_O), xi, _sumO);
                _sumG = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_xc_G), xi, _sumG);
                x += 8;
                weight_xc_I += 8;
                weight_xc_F += 8;
                weight_xc_O += 8;
                weight_xc_G += 8;
            }
            int nn_num_output = num_output >> 3;
            int remain_num_output = num_output & 7;
            for (; nn_num_output > 0; nn_num_output--)
            {
                __m256 h_cont = _mm256_loadu_ps(hidden_ptr_r);

                _sumI = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_I), h_cont, _sumI);
                _sumF = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_F), h_cont, _sumF);
                _sumO = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_O), h_cont, _sumO);
                _sumG = _mm256_comp_fmadd_ps(_mm256_loadu_ps(weight_hc_G), h_cont, _sumG);
                hidden_ptr_r += 8;
                weight_hc_I += 8;
                weight_hc_F += 8;
                weight_hc_O += 8;
                weight_hc_G += 8;
            }
            float sums[4];
            _mm_storeu_ps(sums, HorizontalSums(_sumI, _sumF, _sumO, _sumG));
            sums[0] += bias_c_I[q];
            sums[1] += bias_c_F[q];
            sums[2] += bias_c_O[q];
            sums[3] += bias_c_G[q];

            for (; remain_size > 0; remain_size--)
            {
                float xi = *x;
                sums[0] += *weight_xc_I * xi;
                sums[1] += *weight_xc_F * xi;
                sums[2] += *weight_xc_O * xi;
                sums[3] += *weight_xc_G * xi;
                x++;
                weight_xc_I++;
                weight_xc_F++;
                weight_xc_O++;
                weight_xc_G++;
            }

            for (; remain_num_output > 0; remain_num_output--)
            {
                float h_cont = *hidden_ptr_r;
                sums[0] += *weight_hc_I * h_cont;
                sums[1] += *weight_hc_F * h_cont;
                sums[2] += *weight_hc_O * h_cont;
                sums[3] += *weight_hc_G * h_cont;
                hidden_ptr_r++;
                weight_hc_I++;
                weight_hc_F++;
                weight_hc_O++;
                weight_hc_G++;
            }
            gates_data_I[q] = sums[0];
            gates_data_F[q] = sums[1];
            gates_data_O[q] = sums[2];
            gates_data_G[q] = sums[3];
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);
        float* cell_ptr = cell_state;
        float* hidden_ptr = hidden_state;
        const float* gates_data_I = gates.row(0);
        const float* gates_data_F = gates.row(1);
        const float* gates_data_O = gates.row(2);
        const float* gates_data_G = gates.row(3);
        int nn_activation = num_output >> 3;
        int remain_activations = num_output & 7;
        for (; nn_activation > 0; nn_activation--)
        {
            __m256 I = sigmoid_avx(_mm256_loadu_ps(gates_data_I));
            __m256 F = sigmoid_avx(_mm256_loadu_ps(gates_data_F));
            __m256 O = sigmoid_avx(_mm256_loadu_ps(gates_data_O));
            __m256 G = tanh_avx(_mm256_loadu_ps(gates_data_G));
            __m256 cell2 = _mm256_add_ps(_mm256_mul_ps(F, _mm256_loadu_ps(cell_ptr)), _mm256_mul_ps(I, G));
            __m256 H = _mm256_mul_ps(O, tanh_avx(cell2));
            _mm256_storeu_ps(cell_ptr, cell2);
            _mm256_storeu_ps(hidden_ptr, H);
            _mm256_storeu_ps(output_data, H);
            cell_ptr += 8;
            output_data += 8;
            hidden_ptr += 8;
            gates_data_I += 8;
            gates_data_F += 8;
            gates_data_O += 8;
            gates_data_G += 8;
        }
        for (; remain_activations > 0; remain_activations--)
        {
            float I = *gates_data_I;
            float F = *gates_data_F;
            float O = *gates_data_O;
            float G = *gates_data_G;

            I = 1.f / (1.f + exp(-I));
            F = 1.f / (1.f + exp(-F));
            O = 1.f / (1.f + exp(-O));
            G = tanh(G);
            float cell2 = F * *cell_ptr + I * G;
            float H = O * tanh(cell2);
            *cell_ptr = cell2;
            *hidden_ptr = H;
            *output_data = H;
            cell_ptr++;
            output_data++;
            hidden_ptr++;
            gates_data_I++;
            gates_data_F++;
            gates_data_O++;
            gates_data_G++;
        }

        // no cell output here
    }

    return 0;
}